

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_vertical_14_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  __m128i b;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined6 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined6 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  undefined6 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  short sVar31;
  undefined4 uVar32;
  undefined6 uVar33;
  undefined8 uVar34;
  undefined4 uVar35;
  undefined6 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined4 uVar42;
  undefined6 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined4 uVar48;
  undefined6 uVar49;
  undefined8 uVar50;
  undefined4 uVar51;
  undefined6 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined4 uVar60;
  undefined6 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined4 uVar67;
  undefined6 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined4 uVar73;
  undefined6 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 uVar101;
  undefined1 uVar102;
  undefined1 uVar103;
  undefined1 uVar104;
  undefined1 uVar105;
  undefined1 uVar106;
  undefined1 uVar107;
  undefined1 uVar108;
  undefined1 uVar109;
  undefined1 uVar110;
  undefined1 uVar111;
  undefined1 uVar112;
  undefined1 uVar113;
  undefined1 uVar114;
  undefined1 uVar115;
  undefined1 uVar116;
  undefined1 uVar117;
  undefined1 uVar118;
  undefined1 uVar119;
  undefined1 uVar120;
  undefined1 uVar121;
  undefined1 uVar122;
  undefined1 uVar123;
  undefined1 uVar124;
  undefined1 uVar125;
  undefined1 uVar126;
  undefined1 uVar127;
  undefined1 uVar128;
  undefined1 uVar129;
  undefined1 uVar130;
  undefined1 uVar131;
  undefined1 uVar132;
  undefined1 uVar133;
  undefined1 uVar134;
  undefined1 uVar135;
  undefined1 uVar136;
  undefined1 uVar137;
  undefined1 uVar138;
  undefined1 uVar139;
  undefined1 uVar140;
  undefined1 uVar141;
  undefined1 uVar142;
  undefined1 uVar143;
  undefined1 uVar144;
  undefined1 uVar145;
  undefined1 uVar146;
  undefined1 uVar147;
  undefined1 uVar148;
  undefined1 uVar149;
  undefined1 uVar150;
  undefined1 uVar151;
  undefined1 uVar152;
  undefined1 uVar153;
  undefined1 uVar154;
  undefined1 uVar155;
  undefined1 uVar156;
  char cVar157;
  char cVar158;
  char cVar159;
  char cVar160;
  char cVar161;
  char cVar162;
  char cVar163;
  char cVar164;
  undefined8 uVar165;
  short sVar166;
  short sVar167;
  short sVar168;
  short sVar169;
  short sVar170;
  short sVar171;
  short sVar172;
  short sVar173;
  short sVar174;
  undefined8 *puVar175;
  undefined8 *in_RCX;
  __m128i *palVar176;
  undefined8 *in_RDX;
  int in_ESI;
  __m128i *x3_00;
  undefined8 *in_RDI;
  __m128i *palVar178;
  undefined8 *in_R8;
  byte bVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  ushort uVar188;
  ushort uVar189;
  short sVar190;
  ushort uVar191;
  short sVar192;
  short sVar206;
  uint uVar193;
  byte bVar198;
  byte bVar208;
  short sVar209;
  short sVar216;
  byte bVar219;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  short sVar199;
  short sVar200;
  short sVar201;
  short sVar202;
  short sVar203;
  ushort uVar204;
  ushort uVar205;
  short sVar210;
  short sVar211;
  short sVar212;
  short sVar213;
  ushort uVar214;
  ushort uVar215;
  short sVar220;
  short sVar221;
  short sVar222;
  short sVar223;
  short sVar224;
  ushort uVar225;
  ushort uVar226;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  short sVar227;
  uint uVar217;
  byte bVar229;
  short sVar230;
  short sVar231;
  short sVar232;
  short sVar233;
  short sVar234;
  short sVar235;
  ushort uVar236;
  ushort uVar237;
  short sVar238;
  short sVar239;
  short sVar240;
  short sVar252;
  short sVar253;
  short sVar254;
  short sVar255;
  uint uVar241;
  byte bVar245;
  byte bVar257;
  short sVar258;
  short sVar264;
  byte bVar267;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar195 [16];
  ulong uVar194;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  byte bVar197;
  byte bVar207;
  byte bVar218;
  byte bVar228;
  ulong uVar242;
  ulong uVar243;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  byte bVar244;
  byte bVar256;
  byte bVar266;
  byte bVar275;
  undefined1 auVar196 [16];
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  short sVar246;
  short sVar247;
  short sVar248;
  short sVar249;
  ushort uVar250;
  ushort uVar251;
  short sVar259;
  short sVar260;
  short sVar261;
  ushort uVar262;
  ushort uVar263;
  short sVar268;
  short sVar269;
  short sVar270;
  short sVar271;
  ushort uVar272;
  ushort uVar273;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  short sVar274;
  uint uVar265;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i alVar276;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i pq3;
  __m128i pq2;
  __m128i pq1;
  __m128i pq0;
  __m128i x3;
  __m128i x4;
  __m128i x5;
  __m128i x6;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i q3p3;
  __m128i q4p4;
  __m128i q5p5;
  __m128i q6p6;
  __m128i q7p7;
  __m128i sum_q;
  __m128i sum_lq;
  __m128i sum_lp;
  __m128i sum_p;
  __m128i sum_p_0;
  __m128i work0_1;
  __m128i work0_0;
  __m128i work0;
  __m128i flat2_q [6];
  __m128i flat2_p [6];
  __m128i flat_q [3];
  __m128i flat_p [3];
  __m128i sum_p3;
  __m128i sum_p6;
  __m128i four;
  __m128i eight;
  __m128i pq_16 [7];
  __m128i q0_16;
  __m128i q1_16;
  __m128i q2_16;
  __m128i q3_16;
  __m128i q4_16;
  __m128i q5_16;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i work;
  __m128i ff;
  __m128i fe;
  __m128i abs_p1p0;
  __m128i ps1ps0;
  __m128i qs1qs0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i qs1ps1;
  __m128i qs0ps0;
  __m128i flat_pq [3];
  __m128i flat2_pq [6];
  __m128i flat2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i one;
  __m128i zero;
  __m128i ff_1;
  __m128i t80;
  __m128i t3t4;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_1;
  __m128i filter2filter1;
  __m128i filter;
  __m128i *x1;
  __m128i *x4_00;
  __m128i *x3_01;
  __m128i *q0p0_00;
  __m128i *x1_00;
  __m128i *x0;
  undefined1 local_2138 [16];
  undefined1 local_2128 [16];
  undefined1 local_2118 [16];
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  undefined8 local_2098;
  undefined8 uStack_2090;
  longlong local_2088 [2];
  longlong local_2078 [2];
  longlong local_2068 [2];
  longlong local_2058 [2];
  longlong local_2048 [2];
  longlong local_2038 [2];
  longlong local_2028 [7];
  int local_1fec;
  undefined8 *local_1fe8;
  undefined8 local_1fc8;
  __m128i *in_stack_ffffffffffffe040;
  undefined8 uVar277;
  __m128i *in_stack_ffffffffffffe048;
  __m128i *in_stack_ffffffffffffe050;
  undefined2 in_stack_ffffffffffffe058;
  undefined2 in_stack_ffffffffffffe05a;
  undefined2 in_stack_ffffffffffffe05c;
  undefined2 in_stack_ffffffffffffe05e;
  undefined2 in_stack_ffffffffffffe060;
  undefined2 in_stack_ffffffffffffe062;
  undefined2 in_stack_ffffffffffffe064;
  undefined2 in_stack_ffffffffffffe066;
  undefined2 in_stack_ffffffffffffe068;
  undefined2 in_stack_ffffffffffffe06a;
  undefined2 in_stack_ffffffffffffe06c;
  undefined2 in_stack_ffffffffffffe06e;
  short in_stack_ffffffffffffe120;
  short in_stack_ffffffffffffe122;
  short in_stack_ffffffffffffe124;
  short in_stack_ffffffffffffe126;
  ushort in_stack_ffffffffffffe128;
  ushort in_stack_ffffffffffffe12a;
  ushort in_stack_ffffffffffffe12c;
  ushort in_stack_ffffffffffffe12e;
  short in_stack_ffffffffffffe130;
  short in_stack_ffffffffffffe132;
  short in_stack_ffffffffffffe134;
  short in_stack_ffffffffffffe136;
  ushort in_stack_ffffffffffffe138;
  ushort in_stack_ffffffffffffe13a;
  ushort in_stack_ffffffffffffe13c;
  ushort in_stack_ffffffffffffe13e;
  short in_stack_ffffffffffffe140;
  short in_stack_ffffffffffffe142;
  short in_stack_ffffffffffffe144;
  short in_stack_ffffffffffffe146;
  ushort in_stack_ffffffffffffe148;
  ushort in_stack_ffffffffffffe14a;
  ushort in_stack_ffffffffffffe14c;
  ushort in_stack_ffffffffffffe14e;
  undefined8 local_1d18;
  undefined8 local_1d08;
  ulong uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined1 local_1ca8 [16];
  undefined1 local_1c98 [16];
  ulong local_1c88;
  ulong uStack_1c80;
  undefined4 local_1c78;
  undefined4 uStack_1c74;
  undefined4 uStack_1c70;
  undefined4 uStack_1c6c;
  ulong local_1c68;
  ulong uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined1 local_1bb8 [16];
  undefined1 local_1ba8 [16];
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined1 local_1b88 [16];
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined1 (*local_1b58) [16];
  undefined1 (*local_1b50) [16];
  undefined1 (*local_1b48) [16];
  __m128i *local_1b40;
  __m128i *local_1b38;
  __m128i *local_1b30;
  __m128i *local_1b28;
  __m128i *local_1b20;
  __m128i *local_1b18;
  __m128i *local_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  ulong local_1af8;
  ulong uStack_1af0;
  undefined8 local_1ae8;
  ulong uStack_1ae0;
  ulong local_1ad8;
  ulong uStack_1ad0;
  undefined8 local_1ac8;
  ulong uStack_1ac0;
  undefined8 local_1ab8;
  ulong uStack_1ab0;
  undefined8 local_1aa8;
  ulong uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  ulong local_1a78;
  ulong uStack_1a70;
  undefined8 local_1a68;
  ulong uStack_1a60;
  undefined8 local_1a58;
  longlong lStack_1a50;
  undefined8 local_1a48;
  longlong lStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  longlong lStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  longlong lStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  longlong lStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  longlong lStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  longlong lStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  longlong lStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  longlong lStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  ulong local_1838;
  undefined8 uStack_1830;
  ulong local_1828;
  undefined8 uStack_1820;
  undefined8 *local_1818;
  undefined8 *local_1810;
  undefined8 *local_1808;
  undefined8 *local_1800;
  undefined1 local_177a;
  undefined1 local_1779;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  ulong uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined1 local_1678 [16];
  undefined1 local_1668 [16];
  undefined8 local_1658;
  undefined8 uStack_1650;
  byte local_1648;
  byte bStack_1647;
  byte bStack_1646;
  byte bStack_1645;
  byte bStack_1644;
  byte bStack_1643;
  byte bStack_1642;
  byte bStack_1641;
  byte bStack_1640;
  byte bStack_163f;
  byte bStack_163e;
  byte bStack_163d;
  byte bStack_163c;
  byte bStack_163b;
  byte bStack_163a;
  byte bStack_1639;
  byte local_1638;
  byte bStack_1637;
  byte bStack_1636;
  byte bStack_1635;
  byte bStack_1634;
  byte bStack_1633;
  byte bStack_1632;
  byte bStack_1631;
  byte bStack_1630;
  byte bStack_162f;
  byte bStack_162e;
  byte bStack_162d;
  byte bStack_162c;
  byte bStack_162b;
  byte bStack_162a;
  byte bStack_1629;
  byte local_1628;
  byte bStack_1627;
  byte bStack_1626;
  byte bStack_1625;
  byte bStack_1624;
  byte bStack_1623;
  byte bStack_1622;
  byte bStack_1621;
  byte bStack_1620;
  byte bStack_161f;
  byte bStack_161e;
  byte bStack_161d;
  byte bStack_161c;
  byte bStack_161b;
  byte bStack_161a;
  byte bStack_1619;
  undefined1 local_1618 [16];
  undefined1 local_1608 [16];
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  byte local_15d8;
  byte bStack_15d7;
  byte bStack_15d6;
  byte bStack_15d5;
  byte bStack_15d4;
  byte bStack_15d3;
  byte bStack_15d2;
  byte bStack_15d1;
  byte bStack_15d0;
  byte bStack_15cf;
  byte bStack_15ce;
  byte bStack_15cd;
  byte bStack_15cc;
  byte bStack_15cb;
  byte bStack_15ca;
  byte bStack_15c9;
  byte local_15c8;
  byte bStack_15c7;
  byte bStack_15c6;
  byte bStack_15c5;
  byte bStack_15c4;
  byte bStack_15c3;
  byte bStack_15c2;
  byte bStack_15c1;
  byte bStack_15c0;
  byte bStack_15bf;
  byte bStack_15be;
  byte bStack_15bd;
  byte bStack_15bc;
  byte bStack_15bb;
  byte bStack_15ba;
  byte bStack_15b9;
  undefined1 local_15b8 [16];
  undefined1 local_15a8 [16];
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  byte local_1578;
  byte bStack_1577;
  byte bStack_1576;
  byte bStack_1575;
  byte bStack_1574;
  byte bStack_1573;
  byte bStack_1572;
  byte bStack_1571;
  byte bStack_1570;
  byte bStack_156f;
  byte bStack_156e;
  byte bStack_156d;
  byte bStack_156c;
  byte bStack_156b;
  byte bStack_156a;
  byte bStack_1569;
  byte local_1568;
  byte bStack_1567;
  byte bStack_1566;
  byte bStack_1565;
  byte bStack_1564;
  byte bStack_1563;
  byte bStack_1562;
  byte bStack_1561;
  byte bStack_1560;
  byte bStack_155f;
  byte bStack_155e;
  byte bStack_155d;
  byte bStack_155c;
  byte bStack_155b;
  byte bStack_155a;
  byte bStack_1559;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1538;
  ulong uStack_1530;
  byte local_1528;
  byte bStack_1527;
  byte bStack_1526;
  byte bStack_1525;
  byte bStack_1524;
  byte bStack_1523;
  byte bStack_1522;
  byte bStack_1521;
  byte bStack_1520;
  byte bStack_151f;
  byte bStack_151e;
  byte bStack_151d;
  byte bStack_151c;
  byte bStack_151b;
  byte bStack_151a;
  byte bStack_1519;
  undefined8 local_1518;
  ulong uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined4 local_14cc;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined4 local_14ac;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined4 local_148c;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined4 local_146c;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined4 local_144c;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined4 local_142c;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined4 local_140c;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined4 local_13ec;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined4 local_13cc;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined4 local_13ac;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  ulong local_1398;
  ulong uStack_1390;
  ulong local_1388;
  ulong uStack_1380;
  ulong local_1378;
  ulong uStack_1370;
  ulong local_1368;
  ulong uStack_1360;
  ulong local_1358;
  ulong uStack_1350;
  ulong local_1348;
  ulong uStack_1340;
  ulong local_1338;
  ulong uStack_1330;
  ulong local_1328;
  ulong uStack_1320;
  ulong local_1318;
  ulong uStack_1310;
  ulong local_1308;
  ulong uStack_1300;
  ulong local_12f8;
  ulong uStack_12f0;
  ulong local_12e8;
  ulong uStack_12e0;
  ulong local_12d8;
  ulong uStack_12d0;
  ulong local_12c8;
  ulong uStack_12c0;
  ulong local_12b8;
  ulong uStack_12b0;
  ulong local_12a8;
  ulong uStack_12a0;
  ulong local_1298;
  ulong uStack_1290;
  ulong local_1288;
  ulong uStack_1280;
  ulong local_1278;
  ulong uStack_1270;
  ulong local_1268;
  ulong uStack_1260;
  ulong local_1258;
  ulong uStack_1250;
  ulong local_1248;
  ulong uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  ulong local_1228;
  ulong uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined1 local_11a8 [16];
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  char local_1168;
  char cStack_1167;
  char cStack_1166;
  char cStack_1165;
  char cStack_1164;
  char cStack_1163;
  char cStack_1162;
  char cStack_1161;
  char cStack_1160;
  char cStack_115f;
  char cStack_115e;
  char cStack_115d;
  char cStack_115c;
  char cStack_115b;
  char cStack_115a;
  char cStack_1159;
  undefined8 local_1158;
  undefined8 uStack_1150;
  char local_1148;
  char cStack_1147;
  char cStack_1146;
  char cStack_1145;
  char cStack_1144;
  char cStack_1143;
  char cStack_1142;
  char cStack_1141;
  char cStack_1140;
  char cStack_113f;
  char cStack_113e;
  char cStack_113d;
  char cStack_113c;
  char cStack_113b;
  char cStack_113a;
  char cStack_1139;
  char local_1138;
  char cStack_1137;
  char cStack_1136;
  char cStack_1135;
  char cStack_1134;
  char cStack_1133;
  char cStack_1132;
  char cStack_1131;
  char cStack_1130;
  char cStack_112f;
  char cStack_112e;
  char cStack_112d;
  char cStack_112c;
  char cStack_112b;
  char cStack_112a;
  byte bStack_1129;
  char local_1128;
  char cStack_1127;
  char cStack_1126;
  char cStack_1125;
  char cStack_1124;
  char cStack_1123;
  char cStack_1122;
  char cStack_1121;
  char cStack_1120;
  char cStack_111f;
  char cStack_111e;
  char cStack_111d;
  char cStack_111c;
  char cStack_111b;
  char cStack_111a;
  byte bStack_1119;
  ulong local_1118;
  ulong uStack_1110;
  ulong local_1108;
  ulong uStack_1100;
  ulong local_10f8;
  ulong uStack_10f0;
  ulong local_10e8;
  ulong uStack_10e0;
  ulong local_10d8;
  ulong uStack_10d0;
  ulong local_10c8;
  ulong uStack_10c0;
  ulong local_10b8;
  ulong uStack_10b0;
  ulong local_10a8;
  ulong uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  ulong local_1068;
  ulong uStack_1060;
  ulong local_1058;
  ulong uStack_1050;
  ulong local_1048;
  ulong uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  ulong local_1028;
  ulong uStack_1020;
  ulong local_1018;
  ulong uStack_1010;
  ulong local_1008;
  ulong uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  ulong local_fd8;
  ulong uStack_fd0;
  ulong local_fc8;
  ulong uStack_fc0;
  ulong local_fb8;
  ulong uStack_fb0;
  ulong local_fa8;
  ulong uStack_fa0;
  ulong local_f98;
  ulong uStack_f90;
  ulong local_f88;
  ulong uStack_f80;
  ulong local_f78;
  ulong uStack_f70;
  ulong local_f68;
  ulong uStack_f60;
  ulong local_f58;
  ulong uStack_f50;
  ulong local_f48;
  ulong uStack_f40;
  ulong local_f38;
  ulong uStack_f30;
  ulong local_f28;
  ulong uStack_f20;
  ulong local_f18;
  ulong uStack_f10;
  ulong local_f08;
  ulong uStack_f00;
  ulong local_ef8;
  ulong uStack_ef0;
  ulong local_ee8;
  ulong uStack_ee0;
  undefined2 local_ecc;
  undefined2 local_eca;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  short local_e88;
  short sStack_e86;
  short sStack_e84;
  short sStack_e82;
  short sStack_e80;
  short sStack_e7e;
  short sStack_e7c;
  short sStack_e7a;
  undefined8 local_e78;
  undefined8 uStack_e70;
  short local_e68;
  short sStack_e66;
  short sStack_e64;
  short sStack_e62;
  short sStack_e60;
  short sStack_e5e;
  short sStack_e5c;
  short sStack_e5a;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  short local_dc8;
  short sStack_dc6;
  short sStack_dc4;
  short sStack_dc2;
  short sStack_dc0;
  short sStack_dbe;
  short sStack_dbc;
  short sStack_dba;
  undefined8 local_db8;
  undefined8 uStack_db0;
  short local_da8;
  short sStack_da6;
  short sStack_da4;
  short sStack_da2;
  short sStack_da0;
  short sStack_d9e;
  short sStack_d9c;
  short sStack_d9a;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  short local_d08;
  short sStack_d06;
  short sStack_d04;
  short sStack_d02;
  short sStack_d00;
  short sStack_cfe;
  short sStack_cfc;
  short sStack_cfa;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  short local_ce8;
  short sStack_ce6;
  short sStack_ce4;
  short sStack_ce2;
  short sStack_ce0;
  short sStack_cde;
  short sStack_cdc;
  short sStack_cda;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  short local_c48;
  short sStack_c46;
  short sStack_c44;
  short sStack_c42;
  short sStack_c40;
  short sStack_c3e;
  short sStack_c3c;
  short sStack_c3a;
  undefined8 local_c38;
  undefined8 uStack_c30;
  short local_c28;
  short sStack_c26;
  short sStack_c24;
  short sStack_c22;
  short sStack_c20;
  short sStack_c1e;
  short sStack_c1c;
  short sStack_c1a;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  short local_b88;
  short sStack_b86;
  short sStack_b84;
  short sStack_b82;
  short sStack_b80;
  short sStack_b7e;
  short sStack_b7c;
  short sStack_b7a;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  short local_b48;
  short sStack_b46;
  short sStack_b44;
  short sStack_b42;
  short sStack_b40;
  short sStack_b3e;
  short sStack_b3c;
  short sStack_b3a;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  short local_a28;
  short sStack_a26;
  short sStack_a24;
  short sStack_a22;
  short sStack_a20;
  short sStack_a1e;
  short sStack_a1c;
  short sStack_a1a;
  undefined8 local_a18;
  undefined8 uStack_a10;
  short local_a08;
  short sStack_a06;
  short sStack_a04;
  short sStack_a02;
  short sStack_a00;
  short sStack_9fe;
  short sStack_9fc;
  short sStack_9fa;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  short local_9b8;
  short sStack_9b6;
  short sStack_9b4;
  short sStack_9b2;
  short sStack_9b0;
  short sStack_9ae;
  short sStack_9ac;
  short sStack_9aa;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  short local_948;
  short sStack_946;
  short sStack_944;
  short sStack_942;
  undefined2 uStack_940;
  undefined2 uStack_93e;
  undefined2 uStack_93c;
  undefined2 uStack_93a;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  short local_8c8;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short sStack_8c0;
  short sStack_8be;
  short sStack_8bc;
  short sStack_8ba;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5e8;
  undefined1 uStack_5e7;
  undefined1 uStack_5e6;
  undefined1 uStack_5e5;
  undefined1 uStack_5e4;
  undefined1 uStack_5e3;
  undefined1 uStack_5e2;
  undefined1 uStack_5e1;
  undefined1 uStack_5e0;
  undefined1 uStack_5df;
  undefined1 uStack_5de;
  undefined1 uStack_5dd;
  undefined1 uStack_5dc;
  undefined1 uStack_5db;
  undefined1 uStack_5da;
  undefined1 uStack_5d9;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  undefined8 uStack_5b0;
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined1 *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  undefined8 *local_540;
  ulong *local_538;
  undefined4 *local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  ulong local_508;
  ulong uStack_500;
  undefined8 local_4f8;
  ulong uStack_4f0;
  ulong local_4e8;
  ulong uStack_4e0;
  undefined8 local_4d8;
  ulong uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined1 local_479;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ulong local_458;
  ulong uStack_450;
  ulong local_448;
  ulong uStack_440;
  ulong local_438;
  ulong uStack_430;
  undefined1 local_428 [16];
  undefined8 local_418;
  undefined8 uStack_410;
  ulong local_408;
  ulong uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  ulong local_3c8;
  ulong uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  undefined8 local_398;
  ulong uStack_390;
  ulong local_388;
  ulong uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  undefined8 uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  ulong local_288;
  ulong uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228;
  undefined1 local_227;
  undefined1 local_226;
  undefined1 local_225;
  undefined1 local_224;
  undefined1 local_223;
  undefined1 local_222;
  undefined1 local_221;
  undefined1 local_220;
  undefined1 local_21f;
  undefined1 local_21e;
  undefined1 local_21d;
  undefined1 local_21c;
  undefined1 local_21b;
  undefined1 local_21a;
  undefined1 local_219;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200;
  undefined1 local_1ff;
  undefined1 local_1fe;
  undefined1 local_1fd;
  undefined1 local_1fc;
  undefined1 local_1fb;
  undefined1 local_1fa;
  undefined1 local_1f9;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  undefined1 local_1e0;
  undefined1 local_1df;
  undefined1 local_1de;
  undefined1 local_1dd;
  undefined1 local_1dc;
  undefined1 local_1db;
  undefined1 local_1da;
  undefined1 local_1d9;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1bc;
  undefined1 local_1bb;
  undefined1 local_1ba;
  undefined1 local_1b9;
  undefined1 local_1b8;
  undefined1 local_1b7;
  undefined1 local_1b6;
  undefined1 local_1b5;
  undefined1 local_1b4;
  undefined1 local_1b3;
  undefined1 local_1b2;
  undefined1 local_1b1;
  undefined1 local_1b0;
  undefined1 local_1af;
  undefined1 local_1ae;
  undefined1 local_1ad;
  undefined4 local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined2 local_28;
  undefined2 local_26;
  undefined2 local_24;
  undefined2 local_22;
  undefined2 local_20;
  undefined2 local_1e;
  undefined2 local_1c;
  undefined2 local_1a;
  ulong uVar177;
  
  local_2118._0_8_ = *in_RDX;
  local_2118._8_8_ = in_RDX[1];
  local_2128._0_8_ = *in_RCX;
  local_2128._8_8_ = in_RCX[1];
  local_2138._0_8_ = *in_R8;
  local_2138._8_8_ = in_R8[1];
  local_1800 = in_RDI + -1;
  local_2098 = *local_1800;
  uStack_2090 = *in_RDI;
  local_1808 = (undefined8 *)((long)in_RDI + (long)in_ESI + -8);
  local_20a8 = *local_1808;
  uStack_20a0 = local_1808[1];
  local_1810 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2) + -8);
  local_20b8 = *local_1810;
  uStack_20b0 = local_1810[1];
  local_1818 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3) + -8);
  local_20c8 = *local_1818;
  uStack_20c0 = local_1818[1];
  x1 = &local_2038;
  palVar178 = &local_2048;
  x3_00 = &local_2058;
  q0p0_00 = &local_2068;
  x0 = &local_2088;
  palVar176 = &local_2078;
  local_1fec = in_ESI;
  local_1fe8 = in_RDI;
  transpose_pq_14_sse2
            ((__m128i *)local_2028,x1,palVar178,x3_00,q0p0_00,(__m128i *)0x3ec483,
             in_stack_ffffffffffffe040,in_stack_ffffffffffffe048,in_stack_ffffffffffffe050,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe05e,
                      CONCAT24(in_stack_ffffffffffffe05c,
                               CONCAT22(in_stack_ffffffffffffe05a,in_stack_ffffffffffffe058))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe066,
                      CONCAT24(in_stack_ffffffffffffe064,
                               CONCAT22(in_stack_ffffffffffffe062,in_stack_ffffffffffffe060))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe06e,
                      CONCAT24(in_stack_ffffffffffffe06c,
                               CONCAT22(in_stack_ffffffffffffe06a,in_stack_ffffffffffffe068))));
  alVar276[1] = (longlong)x3_00;
  alVar276[0] = (longlong)palVar178;
  b[1] = (longlong)palVar176;
  b[0] = (longlong)q0p0_00;
  local_1b48 = &local_2118;
  local_1b50 = &local_2128;
  local_1b58 = &local_2138;
  local_1b08 = 0;
  uStack_1b00 = 0;
  local_1b68 = 0;
  uStack_1b60 = 0;
  local_1779 = 1;
  local_1d9 = 1;
  local_1da = 1;
  local_1db = 1;
  local_1dc = 1;
  local_1dd = 1;
  local_1de = 1;
  local_1df = 1;
  local_1e0 = 1;
  local_1e1 = 1;
  local_1e2 = 1;
  local_1e3 = 1;
  local_1e4 = 1;
  local_1e5 = 1;
  local_1e6 = 1;
  local_1e7 = 1;
  local_1e8 = 1;
  local_1b78 = 0x101010101010101;
  uStack_1b70 = 0x101010101010101;
  lVar1 = (*x0)[0];
  lStack_1a40 = (*x0)[1];
  lVar2 = (*palVar176)[0];
  lStack_1a50 = (*palVar176)[1];
  local_1a48._0_4_ = (undefined4)lVar1;
  local_1a48._4_4_ = (undefined4)((ulong)lVar1 >> 0x20);
  local_1a58._0_4_ = (undefined4)lVar2;
  local_1a58._4_4_ = (undefined4)((ulong)lVar2 >> 0x20);
  local_1c78 = (undefined4)local_1a48;
  uStack_1c74 = (undefined4)local_1a58;
  uStack_1c70 = local_1a48._4_4_;
  uStack_1c6c = local_1a58._4_4_;
  local_1c88 = CONCAT44(local_1a58._4_4_,local_1a48._4_4_);
  uStack_1c80 = 0;
  x4_00 = palVar178;
  x3_01 = x3_00;
  x1_00 = palVar176;
  local_1b40 = x0;
  local_1b38 = palVar176;
  local_1b30 = q0p0_00;
  local_1b28 = x3_00;
  local_1b20 = palVar178;
  local_1b18 = x1;
  local_1b10 = (__m128i *)local_2028;
  local_1a58 = lVar2;
  local_1a48 = lVar1;
  local_1f8 = local_1b78;
  uStack_1f0 = uStack_1b70;
  alVar276 = abs_diff(alVar276,b);
  b_00[0] = alVar276[1];
  auVar195._8_8_ = extraout_XMM0_Qb;
  auVar195._0_8_ = extraout_XMM0_Qa;
  local_177a = 0xfe;
  local_1ad = 0xfe;
  local_1ae = 0xfe;
  local_1af = 0xfe;
  local_1b0 = 0xfe;
  local_1b1 = 0xfe;
  local_1b2 = 0xfe;
  local_1b3 = 0xfe;
  local_1b4 = 0xfe;
  local_1b5 = 0xfe;
  local_1b6 = 0xfe;
  local_1b7 = 0xfe;
  local_1b8 = 0xfe;
  local_1b9 = 0xfe;
  local_1ba = 0xfe;
  local_1bb = 0xfe;
  local_1bc = 0xfe;
  uVar8 = 0xfefefefefefefefe;
  uVar11 = 0xfefefefefefefefe;
  b_00[1] = (longlong)palVar176;
  a[1] = (longlong)x3_00;
  a[0] = (longlong)palVar178;
  local_1698 = uVar8;
  uStack_1690 = uVar11;
  local_1688 = uVar8;
  uStack_1680 = uVar11;
  local_1d8 = uVar8;
  uStack_1d0 = uVar11;
  alVar276 = abs_diff(a,b_00);
  b_01[0] = alVar276[1];
  uStack_1d00 = extraout_XMM0_Qb_00;
  local_1d08 = extraout_XMM0_Qa_00;
  local_1d18 = auVar195._4_8_;
  uStack_1530 = extraout_XMM0_Qb >> 0x20;
  local_1538 = local_1d18;
  local_1528 = (byte)extraout_XMM0_Qa;
  bStack_1527 = (byte)((ulong)extraout_XMM0_Qa >> 8);
  bStack_1526 = (byte)((ulong)extraout_XMM0_Qa >> 0x10);
  bStack_1525 = (byte)((ulong)extraout_XMM0_Qa >> 0x18);
  bStack_1524 = (byte)((ulong)extraout_XMM0_Qa >> 0x20);
  bStack_1523 = (byte)((ulong)extraout_XMM0_Qa >> 0x28);
  bStack_1522 = (byte)((ulong)extraout_XMM0_Qa >> 0x30);
  bStack_1521 = (byte)((ulong)extraout_XMM0_Qa >> 0x38);
  bStack_1520 = (byte)extraout_XMM0_Qb;
  bStack_151f = (byte)(extraout_XMM0_Qb >> 8);
  bStack_151e = (byte)(extraout_XMM0_Qb >> 0x10);
  bStack_151d = (byte)(extraout_XMM0_Qb >> 0x18);
  bStack_151c = (byte)(extraout_XMM0_Qb >> 0x20);
  bStack_151b = (byte)(extraout_XMM0_Qb >> 0x28);
  bStack_151a = (byte)(extraout_XMM0_Qb >> 0x30);
  bStack_1519 = (byte)(extraout_XMM0_Qb >> 0x38);
  local_1ba8[1] =
       (bStack_1527 < bStack_1523) * bStack_1523 | (bStack_1527 >= bStack_1523) * bStack_1527;
  local_1ba8[0] =
       (local_1528 < bStack_1524) * bStack_1524 | (local_1528 >= bStack_1524) * local_1528;
  local_1ba8[2] =
       (bStack_1526 < bStack_1522) * bStack_1522 | (bStack_1526 >= bStack_1522) * bStack_1526;
  local_1ba8[3] =
       (bStack_1525 < bStack_1521) * bStack_1521 | (bStack_1525 >= bStack_1521) * bStack_1525;
  local_1ba8[4] =
       (bStack_1524 < bStack_1520) * bStack_1520 | (bStack_1524 >= bStack_1520) * bStack_1524;
  local_1ba8[5] =
       (bStack_1523 < bStack_151f) * bStack_151f | (bStack_1523 >= bStack_151f) * bStack_1523;
  local_1ba8[6] =
       (bStack_1522 < bStack_151e) * bStack_151e | (bStack_1522 >= bStack_151e) * bStack_1522;
  local_1ba8[7] =
       (bStack_1521 < bStack_151d) * bStack_151d | (bStack_1521 >= bStack_151d) * bStack_1521;
  local_1ba8[8] =
       (bStack_1520 < bStack_151c) * bStack_151c | (bStack_1520 >= bStack_151c) * bStack_1520;
  local_1ba8[9] =
       (bStack_151f < bStack_151b) * bStack_151b | (bStack_151f >= bStack_151b) * bStack_151f;
  local_1ba8[10] =
       (bStack_151e < bStack_151a) * bStack_151a | (bStack_151e >= bStack_151a) * bStack_151e;
  local_1ba8[0xb] =
       (bStack_151d < bStack_1519) * bStack_1519 | (bStack_151d >= bStack_1519) * bStack_151d;
  local_1ba8[0xc] = bStack_151c;
  local_1ba8[0xd] = bStack_151b;
  local_1ba8[0xe] = bStack_151a;
  local_1ba8[0xf] = bStack_1519;
  local_1198 = *(undefined8 *)*local_1b58;
  uStack_1190 = *(undefined8 *)(*local_1b58 + 8);
  local_1188 = local_1ba8._0_8_;
  uStack_1180 = local_1ba8._8_8_;
  auVar87._8_8_ = local_1ba8._8_8_;
  auVar87._0_8_ = local_1ba8._0_8_;
  auVar195 = psubusb(auVar87,*local_1b58);
  local_1b98 = auVar195._0_8_;
  uStack_1b90 = auVar195._8_8_;
  local_16a8 = local_1b98;
  uVar21 = local_16a8;
  uStack_16a0 = uStack_1b90;
  uVar22 = uStack_16a0;
  local_16b8 = local_1b68;
  uVar12 = local_16b8;
  uStack_16b0 = uStack_1b60;
  uVar20 = uStack_16b0;
  local_16a8._0_1_ = auVar195[0];
  local_16a8._1_1_ = auVar195[1];
  local_16a8._2_1_ = auVar195[2];
  local_16a8._3_1_ = auVar195[3];
  local_16a8._4_1_ = auVar195[4];
  local_16a8._5_1_ = auVar195[5];
  local_16a8._6_1_ = auVar195[6];
  local_16a8._7_1_ = auVar195[7];
  uStack_16a0._0_1_ = auVar195[8];
  uStack_16a0._1_1_ = auVar195[9];
  uStack_16a0._2_1_ = auVar195[10];
  uStack_16a0._3_1_ = auVar195[0xb];
  uStack_16a0._4_1_ = auVar195[0xc];
  uStack_16a0._5_1_ = auVar195[0xd];
  uStack_16a0._6_1_ = auVar195[0xe];
  uStack_16a0._7_1_ = auVar195[0xf];
  local_16b8._0_1_ = (char)local_1b68;
  local_16b8._1_1_ = (char)((ulong)local_1b68 >> 8);
  local_16b8._2_1_ = (char)((ulong)local_1b68 >> 0x10);
  local_16b8._3_1_ = (char)((ulong)local_1b68 >> 0x18);
  local_16b8._4_1_ = (char)((ulong)local_1b68 >> 0x20);
  local_16b8._5_1_ = (char)((ulong)local_1b68 >> 0x28);
  local_16b8._6_1_ = (char)((ulong)local_1b68 >> 0x30);
  local_16b8._7_1_ = (char)((ulong)local_1b68 >> 0x38);
  uStack_16b0._0_1_ = (char)uStack_1b60;
  uStack_16b0._1_1_ = (char)((ulong)uStack_1b60 >> 8);
  uStack_16b0._2_1_ = (char)((ulong)uStack_1b60 >> 0x10);
  uStack_16b0._3_1_ = (char)((ulong)uStack_1b60 >> 0x18);
  uStack_16b0._4_1_ = (char)((ulong)uStack_1b60 >> 0x20);
  uStack_16b0._5_1_ = (char)((ulong)uStack_1b60 >> 0x28);
  uStack_16b0._6_1_ = (char)((ulong)uStack_1b60 >> 0x30);
  uStack_16b0._7_1_ = (char)((ulong)uStack_1b60 >> 0x38);
  local_1148 = -((char)local_16a8 == (char)local_16b8);
  cStack_1147 = -(local_16a8._1_1_ == local_16b8._1_1_);
  cStack_1146 = -(local_16a8._2_1_ == local_16b8._2_1_);
  cStack_1145 = -(local_16a8._3_1_ == local_16b8._3_1_);
  cStack_1144 = -(local_16a8._4_1_ == local_16b8._4_1_);
  cStack_1143 = -(local_16a8._5_1_ == local_16b8._5_1_);
  cStack_1142 = -(local_16a8._6_1_ == local_16b8._6_1_);
  cStack_1141 = -(local_16a8._7_1_ == local_16b8._7_1_);
  cStack_1140 = -((char)uStack_16a0 == (char)uStack_16b0);
  cStack_113f = -(uStack_16a0._1_1_ == uStack_16b0._1_1_);
  cStack_113e = -(uStack_16a0._2_1_ == uStack_16b0._2_1_);
  cStack_113d = -(uStack_16a0._3_1_ == uStack_16b0._3_1_);
  cStack_113c = -(uStack_16a0._4_1_ == uStack_16b0._4_1_);
  cStack_113b = -(uStack_16a0._5_1_ == uStack_16b0._5_1_);
  cStack_113a = -(uStack_16a0._6_1_ == uStack_16b0._6_1_);
  cStack_1139 = -(uStack_16a0._7_1_ == uStack_16b0._7_1_);
  local_1158 = 0xffffffffffffffff;
  uStack_1150 = 0xffffffffffffffff;
  local_1a78 = CONCAT17(cStack_1141,
                        CONCAT16(cStack_1142,
                                 CONCAT15(cStack_1143,
                                          CONCAT14(cStack_1144,
                                                   CONCAT13(cStack_1145,
                                                            CONCAT12(cStack_1146,
                                                                     CONCAT11(cStack_1147,local_1148
                                                                             ))))))) ^
               0xffffffffffffffff;
  uStack_1a70 = CONCAT17(cStack_1139,
                         CONCAT16(cStack_113a,
                                  CONCAT15(cStack_113b,
                                           CONCAT14(cStack_113c,
                                                    CONCAT13(cStack_113d,
                                                             CONCAT12(cStack_113e,
                                                                      CONCAT11(cStack_113f,
                                                                               cStack_1140))))))) ^
                0xffffffffffffffff;
  local_1a68._0_4_ = (undefined4)local_1a78;
  local_1a68._4_4_ = (undefined4)(local_1a78 >> 0x20);
  local_1b98._4_4_ = (undefined4)local_1a68;
  local_1b98._0_4_ = (undefined4)local_1a68;
  uStack_1b90._0_4_ = local_1a68._4_4_;
  uStack_1b90._4_4_ = local_1a68._4_4_;
  auVar81._8_8_ = extraout_XMM0_Qb_00;
  auVar81._0_8_ = extraout_XMM0_Qa_00;
  auVar80._8_8_ = extraout_XMM0_Qb_00;
  auVar80._0_8_ = extraout_XMM0_Qa_00;
  auVar195 = paddusb(auVar81,auVar80);
  local_1cf8 = local_1d08._4_8_;
  uStack_1220 = extraout_XMM0_Qb_00 >> 0x20;
  local_1228 = local_1cf8;
  uVar177 = local_1cf8 & 0xfefefefefefefefe;
  uVar242 = uStack_1220 & 0xfefefefe;
  local_13ac = 1;
  local_13a8._0_2_ = (ushort)uVar177;
  local_13a8._2_2_ = (ushort)(uVar177 >> 0x10);
  local_13a8._4_2_ = (ushort)(uVar177 >> 0x20);
  uStack_13a0._0_2_ = (ushort)uVar242;
  uStack_13a0._2_2_ = (ushort)(uVar242 >> 0x10);
  local_1cf8._0_4_ = CONCAT22(local_13a8._2_2_ >> 1,(ushort)local_13a8 >> 1);
  local_1cf8._0_6_ = CONCAT24(local_13a8._4_2_ >> 1,(undefined4)local_1cf8);
  local_1cf8 = CONCAT26((ushort)(uVar177 >> 0x31),(undefined6)local_1cf8);
  uStack_1cf0._0_2_ = (ushort)uStack_13a0 >> 1;
  uStack_1cf0._2_2_ = uStack_13a0._2_2_ >> 1;
  local_1d08 = auVar195._0_8_;
  uStack_1d00 = auVar195._8_8_;
  uVar193 = local_1cf8._8_4_;
  uStack_1cf0 = (ulong)uVar193;
  local_1508 = local_1d08;
  uStack_1500 = uStack_1d00;
  local_1518 = local_1cf8;
  uStack_1510 = uStack_1cf0;
  auVar196._8_4_ = uVar193;
  auVar196._0_8_ = local_1cf8;
  auVar196._12_4_ = 0;
  local_11a8 = paddusb(auVar195,auVar196);
  local_11b8 = *(undefined8 *)*local_1b48;
  uStack_11b0 = *(undefined8 *)(*local_1b48 + 8);
  auVar195 = psubusb(local_11a8,*local_1b48);
  local_1b88._0_8_ = auVar195._0_8_;
  local_1b88._8_8_ = auVar195._8_8_;
  local_1a88 = local_1b88._0_8_;
  uVar13 = local_1a88;
  uStack_1a80 = local_1b88._8_8_;
  local_1a98 = local_1b68;
  uStack_1a90 = uStack_1b60;
  local_1a88._0_4_ = auVar195._0_4_;
  local_1a88._4_4_ = auVar195._4_4_;
  local_1a98._0_4_ = (undefined4)local_1b68;
  local_1a98._4_4_ = (undefined4)((ulong)local_1b68 >> 0x20);
  local_1b88._4_4_ = (undefined4)local_1a98;
  local_1b88._0_4_ = (undefined4)local_1a88;
  local_1b88._8_4_ = local_1a88._4_4_;
  local_1b88._12_4_ = local_1a98._4_4_;
  local_16c8 = local_1b88._0_8_;
  uVar14 = local_16c8;
  uStack_16c0 = local_1b88._8_8_;
  uVar17 = uStack_16c0;
  local_16d8 = local_1b68;
  uStack_16d0 = uStack_1b60;
  local_16c8._0_1_ = auVar195[0];
  local_16c8._1_1_ = auVar195[1];
  local_16c8._2_1_ = auVar195[2];
  local_16c8._3_1_ = auVar195[3];
  uStack_16c0._0_1_ = auVar195[4];
  uStack_16c0._1_1_ = auVar195[5];
  uStack_16c0._2_1_ = auVar195[6];
  uStack_16c0._3_1_ = auVar195[7];
  local_1168 = -((char)local_16c8 == (char)local_16b8);
  cStack_1167 = -(local_16c8._1_1_ == local_16b8._1_1_);
  cStack_1166 = -(local_16c8._2_1_ == local_16b8._2_1_);
  cStack_1165 = -(local_16c8._3_1_ == local_16b8._3_1_);
  cStack_1164 = -((char)local_16b8 == local_16b8._4_1_);
  cStack_1163 = -(local_16b8._1_1_ == local_16b8._5_1_);
  cStack_1162 = -(local_16b8._2_1_ == local_16b8._6_1_);
  cStack_1161 = -(local_16b8._3_1_ == local_16b8._7_1_);
  cStack_1160 = -((char)uStack_16c0 == (char)uStack_16b0);
  cStack_115f = -(uStack_16c0._1_1_ == uStack_16b0._1_1_);
  cStack_115e = -(uStack_16c0._2_1_ == uStack_16b0._2_1_);
  cStack_115d = -(uStack_16c0._3_1_ == uStack_16b0._3_1_);
  cStack_115c = -(local_16b8._4_1_ == uStack_16b0._4_1_);
  cStack_115b = -(local_16b8._5_1_ == uStack_16b0._5_1_);
  cStack_115a = -(local_16b8._6_1_ == uStack_16b0._6_1_);
  cStack_1159 = -(local_16b8._7_1_ == uStack_16b0._7_1_);
  local_1178 = 0xffffffffffffffff;
  uStack_1170 = 0xffffffffffffffff;
  uVar194 = CONCAT17(cStack_1161,
                     CONCAT16(cStack_1162,
                              CONCAT15(cStack_1163,
                                       CONCAT14(cStack_1164,
                                                CONCAT13(cStack_1165,
                                                         CONCAT12(cStack_1166,
                                                                  CONCAT11(cStack_1167,local_1168)))
                                               )))) ^ 0xffffffffffffffff;
  uVar243 = CONCAT17(cStack_1159,
                     CONCAT16(cStack_115a,
                              CONCAT15(cStack_115b,
                                       CONCAT14(cStack_115c,
                                                CONCAT13(cStack_115d,
                                                         CONCAT12(cStack_115e,
                                                                  CONCAT11(cStack_115f,cStack_1160))
                                                        ))))) ^ 0xffffffffffffffff;
  local_1558._0_1_ = (byte)uVar194;
  local_1558._1_1_ = (byte)(uVar194 >> 8);
  local_1558._2_1_ = (byte)(uVar194 >> 0x10);
  local_1558._3_1_ = (byte)(uVar194 >> 0x18);
  local_1558._4_1_ = (byte)(uVar194 >> 0x20);
  local_1558._5_1_ = (byte)(uVar194 >> 0x28);
  local_1558._6_1_ = (byte)(uVar194 >> 0x30);
  local_1558._7_1_ = (byte)(uVar194 >> 0x38);
  uStack_1550._0_1_ = (byte)uVar243;
  uStack_1550._1_1_ = (byte)(uVar243 >> 8);
  uStack_1550._2_1_ = (byte)(uVar243 >> 0x10);
  uStack_1550._3_1_ = (byte)(uVar243 >> 0x18);
  uStack_1550._4_1_ = (byte)(uVar243 >> 0x20);
  uStack_1550._5_1_ = (byte)(uVar243 >> 0x28);
  uStack_1550._6_1_ = (byte)(uVar243 >> 0x30);
  uStack_1550._7_1_ = (byte)(uVar243 >> 0x38);
  local_1b88[1] =
       (bStack_1527 < local_1558._1_1_) * local_1558._1_1_ |
       (bStack_1527 >= local_1558._1_1_) * bStack_1527;
  local_1b88[0] =
       (local_1528 < (byte)local_1558) * (byte)local_1558 |
       (local_1528 >= (byte)local_1558) * local_1528;
  local_1b88[2] =
       (bStack_1526 < local_1558._2_1_) * local_1558._2_1_ |
       (bStack_1526 >= local_1558._2_1_) * bStack_1526;
  local_1b88[3] =
       (bStack_1525 < local_1558._3_1_) * local_1558._3_1_ |
       (bStack_1525 >= local_1558._3_1_) * bStack_1525;
  local_1b88[4] =
       (bStack_1524 < local_1558._4_1_) * local_1558._4_1_ |
       (bStack_1524 >= local_1558._4_1_) * bStack_1524;
  local_1b88[5] =
       (bStack_1523 < local_1558._5_1_) * local_1558._5_1_ |
       (bStack_1523 >= local_1558._5_1_) * bStack_1523;
  local_1b88[6] =
       (bStack_1522 < local_1558._6_1_) * local_1558._6_1_ |
       (bStack_1522 >= local_1558._6_1_) * bStack_1522;
  local_1b88[7] =
       (bStack_1521 < local_1558._7_1_) * local_1558._7_1_ |
       (bStack_1521 >= local_1558._7_1_) * bStack_1521;
  local_1b88[8] =
       (bStack_1520 < (byte)uStack_1550) * (byte)uStack_1550 |
       (bStack_1520 >= (byte)uStack_1550) * bStack_1520;
  local_1b88[9] =
       (bStack_151f < uStack_1550._1_1_) * uStack_1550._1_1_ |
       (bStack_151f >= uStack_1550._1_1_) * bStack_151f;
  local_1b88[10] =
       (bStack_151e < uStack_1550._2_1_) * uStack_1550._2_1_ |
       (bStack_151e >= uStack_1550._2_1_) * bStack_151e;
  local_1b88[0xb] =
       (bStack_151d < uStack_1550._3_1_) * uStack_1550._3_1_ |
       (bStack_151d >= uStack_1550._3_1_) * bStack_151d;
  local_1b88[0xc] =
       (bStack_151c < uStack_1550._4_1_) * uStack_1550._4_1_ |
       (bStack_151c >= uStack_1550._4_1_) * bStack_151c;
  local_1b88[0xd] =
       (bStack_151b < uStack_1550._5_1_) * uStack_1550._5_1_ |
       (bStack_151b >= uStack_1550._5_1_) * bStack_151b;
  local_1b88[0xe] =
       (bStack_151a < uStack_1550._6_1_) * uStack_1550._6_1_ |
       (bStack_151a >= uStack_1550._6_1_) * bStack_151a;
  local_1b88[0xf] =
       (bStack_1519 < uStack_1550._7_1_) * uStack_1550._7_1_ |
       (bStack_1519 >= uStack_1550._7_1_) * bStack_1519;
  b_01[1] = (longlong)palVar176;
  a_00[1] = (longlong)x3_00;
  a_00[0] = (longlong)palVar178;
  local_1a98 = uVar12;
  local_1a88 = uVar13;
  local_1a68 = local_1a78;
  uStack_1a60 = uStack_1a70;
  local_16c8 = uVar14;
  uStack_16c0 = uVar17;
  local_16b8 = uVar12;
  uStack_16b0 = uVar20;
  local_16a8 = uVar21;
  uStack_16a0 = uVar22;
  local_1558 = uVar194;
  uStack_1550 = uVar243;
  local_13a8 = uVar177;
  uStack_13a0 = uVar242;
  local_1238 = uVar8;
  uStack_1230 = uVar11;
  alVar276 = abs_diff(a_00,b_01);
  b_02[0] = alVar276[1];
  b_02[1] = (longlong)palVar176;
  a_01[1] = (longlong)x3_00;
  a_01[0] = (longlong)palVar178;
  alVar276 = abs_diff(a_01,b_02);
  b_03[0] = alVar276[1];
  local_1568 = (byte)extraout_XMM0_Qa_01;
  bStack_1567 = (byte)((ulong)extraout_XMM0_Qa_01 >> 8);
  bStack_1566 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x10);
  bStack_1565 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x18);
  bStack_1564 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  bStack_1563 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x28);
  bStack_1562 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x30);
  bStack_1561 = (byte)((ulong)extraout_XMM0_Qa_01 >> 0x38);
  bStack_1560 = (byte)extraout_XMM0_Qb_01;
  bStack_155f = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_155e = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_155d = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_155c = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_155b = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_155a = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_1559 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_1578 = (byte)extraout_XMM0_Qa_02;
  bStack_1577 = (byte)((ulong)extraout_XMM0_Qa_02 >> 8);
  bStack_1576 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  bStack_1575 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x18);
  bStack_1574 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  bStack_1573 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x28);
  bStack_1572 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  bStack_1571 = (byte)((ulong)extraout_XMM0_Qa_02 >> 0x38);
  bStack_1570 = (byte)extraout_XMM0_Qb_02;
  bStack_156f = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_156e = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_156d = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_156c = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_156b = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_156a = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_1569 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  bVar179 = (local_1568 < local_1578) * local_1578 | (local_1568 >= local_1578) * local_1568;
  bVar197 = (bStack_1567 < bStack_1577) * bStack_1577 | (bStack_1567 >= bStack_1577) * bStack_1567;
  bVar198 = (bStack_1566 < bStack_1576) * bStack_1576 | (bStack_1566 >= bStack_1576) * bStack_1566;
  bVar207 = (bStack_1565 < bStack_1575) * bStack_1575 | (bStack_1565 >= bStack_1575) * bStack_1565;
  bVar208 = (bStack_1564 < bStack_1574) * bStack_1574 | (bStack_1564 >= bStack_1574) * bStack_1564;
  bVar218 = (bStack_1563 < bStack_1573) * bStack_1573 | (bStack_1563 >= bStack_1573) * bStack_1563;
  bVar219 = (bStack_1562 < bStack_1572) * bStack_1572 | (bStack_1562 >= bStack_1572) * bStack_1562;
  bVar228 = (bStack_1561 < bStack_1571) * bStack_1571 | (bStack_1561 >= bStack_1571) * bStack_1561;
  bVar229 = (bStack_1560 < bStack_1570) * bStack_1570 | (bStack_1560 >= bStack_1570) * bStack_1560;
  bVar244 = (bStack_155f < bStack_156f) * bStack_156f | (bStack_155f >= bStack_156f) * bStack_155f;
  bVar245 = (bStack_155e < bStack_156e) * bStack_156e | (bStack_155e >= bStack_156e) * bStack_155e;
  bVar256 = (bStack_155d < bStack_156d) * bStack_156d | (bStack_155d >= bStack_156d) * bStack_155d;
  bVar257 = (bStack_155c < bStack_156c) * bStack_156c | (bStack_155c >= bStack_156c) * bStack_155c;
  bVar266 = (bStack_155b < bStack_156b) * bStack_156b | (bStack_155b >= bStack_156b) * bStack_155b;
  bVar267 = (bStack_155a < bStack_156a) * bStack_156a | (bStack_155a >= bStack_156a) * bStack_155a;
  bVar275 = (bStack_1559 < bStack_1569) * bStack_1569 | (bStack_1559 >= bStack_1569) * bStack_1559;
  local_1ce8 = CONCAT17(bVar228,CONCAT16(bVar219,CONCAT15(bVar218,CONCAT14(bVar208,CONCAT13(bVar207,
                                                  CONCAT12(bVar198,CONCAT11(bVar197,bVar179)))))));
  uStack_1ce0 = CONCAT17(bVar275,CONCAT16(bVar267,CONCAT15(bVar266,CONCAT14(bVar257,CONCAT13(bVar256
                                                  ,CONCAT12(bVar245,CONCAT11(bVar244,bVar229)))))));
  local_1588 = local_1ce8;
  uStack_1580 = uStack_1ce0;
  local_1598 = local_1b88._0_8_;
  uVar14 = local_1598;
  uStack_1590 = local_1b88._8_8_;
  uVar17 = uStack_1590;
  local_1598._0_1_ = local_1b88[0];
  local_1598._1_1_ = local_1b88[1];
  local_1598._2_1_ = local_1b88[2];
  local_1598._3_1_ = local_1b88[3];
  local_1598._4_1_ = local_1b88[4];
  local_1598._5_1_ = local_1b88[5];
  local_1598._6_1_ = local_1b88[6];
  local_1598._7_1_ = local_1b88[7];
  uStack_1590._0_1_ = local_1b88[8];
  uStack_1590._1_1_ = local_1b88[9];
  uStack_1590._2_1_ = local_1b88[10];
  uStack_1590._3_1_ = local_1b88[0xb];
  uStack_1590._4_1_ = local_1b88[0xc];
  uStack_1590._5_1_ = local_1b88[0xd];
  uStack_1590._6_1_ = local_1b88[0xe];
  uStack_1590._7_1_ = local_1b88[0xf];
  local_1b88[0] =
       (bVar179 < (byte)local_1598) * (byte)local_1598 | (bVar179 >= (byte)local_1598) * bVar179;
  local_1b88[1] =
       (bVar197 < local_1598._1_1_) * local_1598._1_1_ | (bVar197 >= local_1598._1_1_) * bVar197;
  local_1b88[2] =
       (bVar198 < local_1598._2_1_) * local_1598._2_1_ | (bVar198 >= local_1598._2_1_) * bVar198;
  local_1b88[3] =
       (bVar207 < local_1598._3_1_) * local_1598._3_1_ | (bVar207 >= local_1598._3_1_) * bVar207;
  local_1b88[4] =
       (bVar208 < local_1598._4_1_) * local_1598._4_1_ | (bVar208 >= local_1598._4_1_) * bVar208;
  local_1b88[5] =
       (bVar218 < local_1598._5_1_) * local_1598._5_1_ | (bVar218 >= local_1598._5_1_) * bVar218;
  local_1b88[6] =
       (bVar219 < local_1598._6_1_) * local_1598._6_1_ | (bVar219 >= local_1598._6_1_) * bVar219;
  local_1b88[7] =
       (bVar228 < local_1598._7_1_) * local_1598._7_1_ | (bVar228 >= local_1598._7_1_) * bVar228;
  local_1b88[8] =
       (bVar229 < (byte)uStack_1590) * (byte)uStack_1590 | (bVar229 >= (byte)uStack_1590) * bVar229;
  local_1b88[9] =
       (bVar244 < uStack_1590._1_1_) * uStack_1590._1_1_ | (bVar244 >= uStack_1590._1_1_) * bVar244;
  local_1b88[10] =
       (bVar245 < uStack_1590._2_1_) * uStack_1590._2_1_ | (bVar245 >= uStack_1590._2_1_) * bVar245;
  local_1b88[0xb] =
       (bVar256 < uStack_1590._3_1_) * uStack_1590._3_1_ | (bVar256 >= uStack_1590._3_1_) * bVar256;
  local_1b88[0xc] =
       (bVar257 < uStack_1590._4_1_) * uStack_1590._4_1_ | (bVar257 >= uStack_1590._4_1_) * bVar257;
  local_1b88[0xd] =
       (bVar266 < uStack_1590._5_1_) * uStack_1590._5_1_ | (bVar266 >= uStack_1590._5_1_) * bVar266;
  local_1b88[0xe] =
       (bVar267 < uStack_1590._6_1_) * uStack_1590._6_1_ | (bVar267 >= uStack_1590._6_1_) * bVar267;
  local_1b88[0xf] =
       (bVar275 < uStack_1590._7_1_) * uStack_1590._7_1_ | (bVar275 >= uStack_1590._7_1_) * bVar275;
  local_15b8 = local_1b88 >> 0x20;
  local_15a8 = local_1b88;
  local_1b88[1] =
       (local_1b88[1] < local_1b88[5]) * local_1b88[5] |
       (local_1b88[1] >= local_1b88[5]) * local_1b88[1];
  local_1b88[0] =
       (local_1b88[0] < local_1b88[4]) * local_1b88[4] |
       (local_1b88[0] >= local_1b88[4]) * local_1b88[0];
  local_1b88[2] =
       (local_1b88[2] < local_1b88[6]) * local_1b88[6] |
       (local_1b88[2] >= local_1b88[6]) * local_1b88[2];
  local_1b88[3] =
       (local_1b88[3] < local_1b88[7]) * local_1b88[7] |
       (local_1b88[3] >= local_1b88[7]) * local_1b88[3];
  local_1b88[4] =
       (local_1b88[4] < local_1b88[8]) * local_1b88[8] |
       (local_1b88[4] >= local_1b88[8]) * local_1b88[4];
  local_1b88[5] =
       (local_1b88[5] < local_1b88[9]) * local_1b88[9] |
       (local_1b88[5] >= local_1b88[9]) * local_1b88[5];
  local_1b88[6] =
       (local_1b88[6] < local_1b88[10]) * local_1b88[10] |
       (local_1b88[6] >= local_1b88[10]) * local_1b88[6];
  local_1b88[7] =
       (local_1b88[7] < local_1b88[0xb]) * local_1b88[0xb] |
       (local_1b88[7] >= local_1b88[0xb]) * local_1b88[7];
  local_1b88[8] =
       (local_1b88[8] < local_1b88[0xc]) * local_1b88[0xc] |
       (local_1b88[8] >= local_1b88[0xc]) * local_1b88[8];
  local_1b88[9] =
       (local_1b88[9] < local_1b88[0xd]) * local_1b88[0xd] |
       (local_1b88[9] >= local_1b88[0xd]) * local_1b88[9];
  local_1b88[10] =
       (local_1b88[10] < local_1b88[0xe]) * local_1b88[0xe] |
       (local_1b88[10] >= local_1b88[0xe]) * local_1b88[10];
  local_1b88[0xb] =
       (local_1b88[0xb] < local_1b88[0xf]) * local_1b88[0xf] |
       (local_1b88[0xb] >= local_1b88[0xf]) * local_1b88[0xb];
  local_11d8 = *(undefined8 *)*local_1b50;
  uStack_11d0 = *(undefined8 *)(*local_1b50 + 8);
  local_11c8 = local_1b88._0_8_;
  uStack_11c0 = local_1b88._8_8_;
  auVar86._8_8_ = local_1b88._8_8_;
  auVar86._0_8_ = local_1b88._0_8_;
  auVar195 = psubusb(auVar86,*local_1b50);
  local_1b88._0_8_ = auVar195._0_8_;
  local_1b88._8_8_ = auVar195._8_8_;
  local_16e8 = local_1b88._0_8_;
  uVar12 = local_16e8;
  uStack_16e0 = local_1b88._8_8_;
  uVar13 = uStack_16e0;
  local_16f8 = local_1b68;
  uVar8 = local_16f8;
  uStack_16f0 = uStack_1b60;
  uVar11 = uStack_16f0;
  local_16e8._0_1_ = auVar195[0];
  local_16e8._1_1_ = auVar195[1];
  local_16e8._2_1_ = auVar195[2];
  local_16e8._3_1_ = auVar195[3];
  local_16e8._4_1_ = auVar195[4];
  local_16e8._5_1_ = auVar195[5];
  local_16e8._6_1_ = auVar195[6];
  local_16e8._7_1_ = auVar195[7];
  uStack_16e0._0_1_ = auVar195[8];
  uStack_16e0._1_1_ = auVar195[9];
  uStack_16e0._2_1_ = auVar195[10];
  uStack_16e0._3_1_ = auVar195[0xb];
  uStack_16e0._4_1_ = auVar195[0xc];
  uStack_16e0._5_1_ = auVar195[0xd];
  uStack_16e0._6_1_ = auVar195[0xe];
  uStack_16e0._7_1_ = auVar195[0xf];
  local_16f8._0_1_ = (char)local_1b68;
  local_16f8._1_1_ = (char)((ulong)local_1b68 >> 8);
  local_16f8._2_1_ = (char)((ulong)local_1b68 >> 0x10);
  local_16f8._3_1_ = (char)((ulong)local_1b68 >> 0x18);
  local_16f8._4_1_ = (char)((ulong)local_1b68 >> 0x20);
  local_16f8._5_1_ = (char)((ulong)local_1b68 >> 0x28);
  local_16f8._6_1_ = (char)((ulong)local_1b68 >> 0x30);
  local_16f8._7_1_ = (char)((ulong)local_1b68 >> 0x38);
  uStack_16f0._0_1_ = (char)uStack_1b60;
  uStack_16f0._1_1_ = (char)((ulong)uStack_1b60 >> 8);
  uStack_16f0._2_1_ = (char)((ulong)uStack_1b60 >> 0x10);
  uStack_16f0._3_1_ = (char)((ulong)uStack_1b60 >> 0x18);
  uStack_16f0._4_1_ = (char)((ulong)uStack_1b60 >> 0x20);
  uStack_16f0._5_1_ = (char)((ulong)uStack_1b60 >> 0x28);
  uStack_16f0._6_1_ = (char)((ulong)uStack_1b60 >> 0x30);
  uStack_16f0._7_1_ = (char)((ulong)uStack_1b60 >> 0x38);
  local_1b88[1] = -(local_16e8._1_1_ == local_16f8._1_1_);
  local_1b88[0] = -((char)local_16e8 == (char)local_16f8);
  local_1b88[2] = -(local_16e8._2_1_ == local_16f8._2_1_);
  local_1b88[3] = -(local_16e8._3_1_ == local_16f8._3_1_);
  local_1b88[4] = -(local_16e8._4_1_ == local_16f8._4_1_);
  local_1b88[5] = -(local_16e8._5_1_ == local_16f8._5_1_);
  local_1b88[6] = -(local_16e8._6_1_ == local_16f8._6_1_);
  local_1b88[7] = -(local_16e8._7_1_ == local_16f8._7_1_);
  local_1b88[8] = -((char)uStack_16e0 == (char)uStack_16f0);
  local_1b88[9] = -(uStack_16e0._1_1_ == uStack_16f0._1_1_);
  local_1b88[10] = -(uStack_16e0._2_1_ == uStack_16f0._2_1_);
  local_1b88[0xb] = -(uStack_16e0._3_1_ == uStack_16f0._3_1_);
  local_1b88[0xc] = -(uStack_16e0._4_1_ == uStack_16f0._4_1_);
  local_1b88[0xd] = -(uStack_16e0._5_1_ == uStack_16f0._5_1_);
  local_1b88[0xe] = -(uStack_16e0._6_1_ == uStack_16f0._6_1_);
  local_1b88[0xf] = -(uStack_16e0._7_1_ == uStack_16f0._7_1_);
  local_530 = &local_1c78;
  local_538 = &local_1c88;
  local_540 = &local_1b98;
  local_548 = local_1b88;
  local_550 = local_1c98;
  local_558 = local_1ca8;
  local_1f9 = 0;
  local_1fa = 0;
  local_1fb = 0;
  local_1fc = 0;
  local_1fd = 0;
  local_1fe = 0;
  local_1ff = 0;
  local_200 = 0;
  local_201 = 3;
  local_202 = 3;
  local_203 = 3;
  local_204 = 3;
  local_205 = 4;
  local_206 = 4;
  local_207 = 4;
  local_208 = 4;
  local_5c8 = 0x303030304040404;
  uStack_5c0 = 0;
  local_479 = 0x80;
  local_219 = 0x80;
  local_21a = 0x80;
  local_21b = 0x80;
  local_21c = 0x80;
  local_21d = 0x80;
  local_21e = 0x80;
  local_21f = 0x80;
  local_220 = 0x80;
  local_221 = 0x80;
  local_222 = 0x80;
  local_223 = 0x80;
  local_224 = 0x80;
  local_225 = 0x80;
  local_226 = 0x80;
  local_227 = 0x80;
  local_228 = 0x80;
  local_5d8 = 0x8080808080808080;
  uStack_5d0 = 0x8080808080808080;
  local_5e8 = 0xff;
  uStack_5e7 = 0xff;
  uStack_5e6 = 0xff;
  uStack_5e5 = 0xff;
  uStack_5e4 = 0xff;
  uStack_5e3 = 0xff;
  uStack_5e2 = 0xff;
  uStack_5e1 = 0xff;
  uStack_5e0 = 0xff;
  uStack_5df = 0xff;
  uStack_5de = 0xff;
  uStack_5dd = 0xff;
  uStack_5dc = 0xff;
  uStack_5db = 0xff;
  uStack_5da = 0xff;
  uStack_5d9 = 0xff;
  local_3a8 = CONCAT44(uStack_1c74,local_1c78);
  uStack_3a0 = CONCAT44(uStack_1c6c,uStack_1c70);
  local_2e8 = local_3a8 ^ 0x8080808080808080;
  uStack_2e0 = uStack_3a0 ^ 0x8080808080808080;
  local_3c8 = local_1c88;
  uStack_3c0 = uStack_1c80;
  local_388 = local_1c88 ^ 0x8080808080808080;
  uStack_380 = uStack_1c80 ^ 0x8080808080808080;
  auVar95._8_8_ = uStack_2e0;
  auVar95._0_8_ = local_2e8;
  auVar94._8_8_ = uStack_380;
  auVar94._0_8_ = local_388;
  local_588 = psubsb(auVar95,auVar94);
  local_438 = local_1b98;
  uStack_430 = uStack_1b90;
  local_428._0_8_ = local_588._4_8_;
  local_428._12_4_ = 0;
  local_428._8_4_ = local_588._12_4_;
  local_308 = local_428._0_8_ & local_1b98;
  uStack_300 = local_428._8_8_ & uStack_1b90;
  local_318 = local_588._0_8_;
  uStack_310 = local_588._8_8_;
  auVar93._8_8_ = uStack_300;
  auVar93._0_8_ = local_308;
  auVar195 = psubsb(auVar93,local_588);
  local_568 = auVar195._0_8_;
  uStack_560 = auVar195._8_8_;
  local_328 = local_568;
  uStack_320 = uStack_560;
  local_338 = local_588._0_8_;
  uStack_330 = local_588._8_8_;
  auVar195 = psubsb(auVar195,local_588);
  local_568 = auVar195._0_8_;
  uStack_560 = auVar195._8_8_;
  local_348 = local_568;
  uStack_340 = uStack_560;
  local_358 = local_588._0_8_;
  uStack_350 = local_588._8_8_;
  auVar195 = psubsb(auVar195,local_588);
  local_568 = auVar195._0_8_;
  uStack_560 = auVar195._8_8_;
  local_458 = local_1b88._0_8_;
  uStack_450 = local_1b88._8_8_;
  local_448 = local_568;
  uStack_440 = uStack_560;
  local_4e8 = local_568 & local_1b88._0_8_;
  uStack_4e0 = uStack_560 & local_1b88._8_8_;
  local_4d8._0_4_ = (undefined4)local_4e8;
  local_4d8._4_4_ = (undefined4)(local_4e8 >> 0x20);
  local_568 = CONCAT44((undefined4)local_4d8,(undefined4)local_4d8);
  uStack_560._0_4_ = local_4d8._4_4_;
  uStack_560._4_4_ = local_4d8._4_4_;
  local_2a8 = local_568;
  uStack_2a0 = uStack_560;
  auVar98._8_8_ = uStack_560;
  auVar98._0_8_ = local_568;
  auVar195 = paddsb(auVar98,ZEXT816(0x303030304040404));
  local_578 = auVar195._0_8_;
  uStack_570 = auVar195._8_8_;
  local_498 = local_578;
  uVar22 = local_498;
  uStack_490 = uStack_570;
  local_4a8 = local_578;
  uStack_4a0 = uStack_570;
  local_498._0_1_ = auVar195[0];
  local_498._1_1_ = auVar195[1];
  local_498._2_1_ = auVar195[2];
  local_498._3_1_ = auVar195[3];
  local_498._4_1_ = auVar195[4];
  local_498._5_1_ = auVar195[5];
  local_498._6_1_ = auVar195[6];
  local_498._7_1_ = auVar195[7];
  local_578._0_2_ = CONCAT11((undefined1)local_498,(undefined1)local_498);
  local_578._0_3_ = CONCAT12(local_498._1_1_,(undefined2)local_578);
  local_578._0_4_ = CONCAT13(local_498._1_1_,(undefined3)local_578);
  local_578._0_5_ = CONCAT14(local_498._2_1_,(undefined4)local_578);
  local_578._0_6_ = CONCAT15(local_498._2_1_,(undefined5)local_578);
  local_578._0_7_ = CONCAT16(local_498._3_1_,(undefined6)local_578);
  local_578 = CONCAT17(local_498._3_1_,(undefined7)local_578);
  uStack_570._0_1_ = local_498._4_1_;
  uStack_570._1_1_ = local_498._4_1_;
  uStack_570._2_1_ = local_498._5_1_;
  uStack_570._3_1_ = local_498._5_1_;
  uStack_570._4_1_ = local_498._6_1_;
  uStack_570._5_1_ = local_498._6_1_;
  uStack_570._6_1_ = local_498._7_1_;
  uStack_570._7_1_ = local_498._7_1_;
  local_188 = local_578;
  uStack_180 = uStack_570;
  local_18c = 0xb;
  auVar100._8_8_ = uStack_570;
  auVar100._0_8_ = local_578;
  auVar195 = psraw(auVar100,ZEXT416(0xb));
  local_578 = auVar195._0_8_;
  uStack_570 = auVar195._8_8_;
  local_248 = local_578;
  uStack_240 = uStack_570;
  local_258 = local_578;
  uStack_250 = uStack_570;
  auVar195 = packsswb(auVar195,auVar195);
  local_578 = auVar195._0_8_;
  uStack_570 = auVar195._8_8_;
  local_378 = 0xffffffffffffffff;
  uStack_370 = 0xffffffffffffffff;
  local_368 = local_578;
  uStack_360 = uStack_570;
  auVar92._8_8_ = 0xffffffffffffffff;
  auVar92._0_8_ = 0xffffffffffffffff;
  auVar196 = psubsb(auVar195,auVar92);
  local_568 = auVar196._0_8_;
  uStack_560 = auVar196._8_8_;
  local_4b8 = local_568;
  uVar21 = local_4b8;
  uStack_4b0 = uStack_560;
  local_4c8 = local_568;
  uStack_4c0 = uStack_560;
  local_4b8._0_1_ = auVar196[0];
  local_4b8._1_1_ = auVar196[1];
  local_4b8._2_1_ = auVar196[2];
  local_4b8._3_1_ = auVar196[3];
  local_4b8._4_1_ = auVar196[4];
  local_4b8._5_1_ = auVar196[5];
  local_4b8._6_1_ = auVar196[6];
  local_4b8._7_1_ = auVar196[7];
  local_568._0_2_ = CONCAT11((undefined1)local_4b8,(undefined1)local_4b8);
  local_568._0_3_ = CONCAT12(local_4b8._1_1_,(undefined2)local_568);
  local_568._0_4_ = CONCAT13(local_4b8._1_1_,(undefined3)local_568);
  local_568._0_5_ = CONCAT14(local_4b8._2_1_,(undefined4)local_568);
  local_568._0_6_ = CONCAT15(local_4b8._2_1_,(undefined5)local_568);
  local_568._0_7_ = CONCAT16(local_4b8._3_1_,(undefined6)local_568);
  local_568 = CONCAT17(local_4b8._3_1_,(undefined7)local_568);
  uStack_560._0_1_ = local_4b8._4_1_;
  uStack_560._1_1_ = local_4b8._4_1_;
  uStack_560._2_1_ = local_4b8._5_1_;
  uStack_560._3_1_ = local_4b8._5_1_;
  uStack_560._4_1_ = local_4b8._6_1_;
  uStack_560._5_1_ = local_4b8._6_1_;
  uStack_560._6_1_ = local_4b8._7_1_;
  uStack_560._7_1_ = local_4b8._7_1_;
  local_1a8 = local_568;
  uStack_1a0 = uStack_560;
  local_1ac = 9;
  auVar99._8_8_ = uStack_560;
  auVar99._0_8_ = local_568;
  auVar196 = psraw(auVar99,ZEXT416(9));
  local_568 = auVar196._0_8_;
  uStack_560 = auVar196._8_8_;
  local_268 = local_568;
  uStack_260 = uStack_560;
  local_278 = local_568;
  uStack_270 = uStack_560;
  auVar196 = packsswb(auVar196,auVar196);
  local_288 = local_1b98;
  uStack_280 = uStack_1b90;
  local_568 = auVar196._0_8_;
  uStack_560 = auVar196._8_8_;
  local_298 = local_568;
  uStack_290 = uStack_560;
  local_508 = ~local_1b98 & local_568;
  uStack_500 = ~uStack_1b90 & uStack_560;
  local_4f8._0_4_ = (undefined4)local_508;
  local_4f8._4_4_ = (undefined4)(local_508 >> 0x20);
  local_568 = CONCAT44((undefined4)local_4f8,(undefined4)local_4f8);
  uStack_560._0_4_ = local_4f8._4_4_;
  uStack_560._4_4_ = local_4f8._4_4_;
  local_518 = local_578;
  uVar20 = local_518;
  uStack_510 = uStack_570;
  local_528 = local_568;
  uStack_520 = uStack_560;
  local_518._0_4_ = auVar195._0_4_;
  local_518._4_4_ = auVar195._4_4_;
  local_578 = CONCAT44((undefined4)local_4f8,(undefined4)local_518);
  uStack_570._0_4_ = local_518._4_4_;
  uStack_570._4_4_ = (undefined4)local_4f8;
  local_5b8 = uStack_570;
  uStack_5b0 = 0;
  local_398 = local_578;
  uStack_390 = uStack_570;
  auVar91._8_8_ = uStack_380;
  auVar91._0_8_ = local_388;
  auVar90._8_8_ = uStack_570;
  auVar90._0_8_ = local_578;
  local_5a8 = psubsb(auVar91,auVar90);
  local_2d8 = uStack_570;
  uStack_2d0 = 0;
  auVar97._8_8_ = uStack_2e0;
  auVar97._0_8_ = local_2e8;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uStack_570;
  local_598 = paddsb(auVar97,auVar96);
  local_3e8 = local_5a8._0_8_;
  uStack_3e0 = local_5a8._8_8_;
  uVar177 = local_5a8._0_8_ ^ 0x8080808080808080;
  uStack_1ab0 = local_5a8._8_8_ ^ 0x8080808080808080;
  local_408 = local_598._0_8_;
  uStack_400 = local_598._8_8_;
  local_418 = 0x8080808080808080;
  uStack_410 = 0x8080808080808080;
  uVar194 = local_598._0_8_ ^ 0x8080808080808080;
  uStack_1aa0 = local_598._8_8_ ^ 0x8080808080808080;
  local_1aa8._0_4_ = (undefined4)uVar194;
  local_1aa8._4_4_ = (undefined4)(uVar194 >> 0x20);
  local_1ab8._0_4_ = (undefined4)uVar177;
  local_1ab8._4_4_ = (undefined4)(uVar177 >> 0x20);
  local_1c58 = CONCAT44((undefined4)local_1ab8,(undefined4)local_1aa8);
  uStack_1c50 = CONCAT44(local_1ab8._4_4_,local_1aa8._4_4_);
  local_1c68 = uStack_1c50;
  uStack_1c60 = 0;
  b_03[1] = (longlong)palVar176;
  a_02[1] = (longlong)x3_00;
  a_02[0] = (longlong)palVar178;
  local_1ab8 = uVar177;
  local_1aa8 = uVar194;
  local_16f8 = uVar8;
  uStack_16f0 = uVar11;
  local_16e8 = uVar12;
  uStack_16e0 = uVar13;
  local_1598 = uVar14;
  uStack_1590 = uVar17;
  local_518 = uVar20;
  local_4f8 = local_508;
  uStack_4f0 = uStack_500;
  local_4d8 = local_4e8;
  uStack_4d0 = uStack_4e0;
  local_4b8 = uVar21;
  local_498 = uVar22;
  local_478 = local_5d8;
  uStack_470 = uStack_5d0;
  local_468 = local_5d8;
  uStack_460 = uStack_5d0;
  local_428 = local_588 >> 0x20;
  local_3f8 = local_5d8;
  uStack_3f0 = uStack_5d0;
  local_3d8 = local_5d8;
  uStack_3d0 = uStack_5d0;
  local_3b8 = local_5d8;
  uStack_3b0 = uStack_5d0;
  local_2f8 = local_388;
  uStack_2f0 = uStack_380;
  local_2c8 = local_2e8;
  uStack_2c0 = uStack_2e0;
  local_2b8 = local_5c8;
  uStack_2b0 = uStack_5c0;
  local_238 = local_5d8;
  uStack_230 = uStack_5d0;
  local_218 = local_5c8;
  uStack_210 = uStack_5c0;
  alVar276 = abs_diff(a_02,b_03);
  b_04[0] = alVar276[1];
  b_04[1] = (longlong)palVar176;
  a_03[1] = (longlong)x3_00;
  a_03[0] = (longlong)palVar178;
  alVar276 = abs_diff(a_03,b_04);
  palVar176 = local_1b40;
  uVar177 = uStack_1c50;
  b_05[0] = alVar276[1];
  local_15c8 = (byte)extraout_XMM0_Qa_03;
  bStack_15c7 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_15c6 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_15c5 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_15c4 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_15c3 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_15c2 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_15c1 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_15c0 = (byte)extraout_XMM0_Qb_03;
  bStack_15bf = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_15be = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_15bd = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_15bc = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_15bb = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_15ba = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_15b9 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_15d8 = (byte)extraout_XMM0_Qa_04;
  bStack_15d7 = (byte)((ulong)extraout_XMM0_Qa_04 >> 8);
  bStack_15d6 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x10);
  bStack_15d5 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x18);
  bStack_15d4 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  bStack_15d3 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  bStack_15d2 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  bStack_15d1 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  bStack_15d0 = (byte)extraout_XMM0_Qb_04;
  bStack_15cf = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_15ce = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_15cd = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_15cc = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_15cb = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_15ca = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_15c9 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  local_1ba8[0] = (local_15c8 < local_15d8) * local_15d8 | (local_15c8 >= local_15d8) * local_15c8;
  local_1ba8[1] =
       (bStack_15c7 < bStack_15d7) * bStack_15d7 | (bStack_15c7 >= bStack_15d7) * bStack_15c7;
  local_1ba8[2] =
       (bStack_15c6 < bStack_15d6) * bStack_15d6 | (bStack_15c6 >= bStack_15d6) * bStack_15c6;
  local_1ba8[3] =
       (bStack_15c5 < bStack_15d5) * bStack_15d5 | (bStack_15c5 >= bStack_15d5) * bStack_15c5;
  local_1ba8[4] =
       (bStack_15c4 < bStack_15d4) * bStack_15d4 | (bStack_15c4 >= bStack_15d4) * bStack_15c4;
  local_1ba8[5] =
       (bStack_15c3 < bStack_15d3) * bStack_15d3 | (bStack_15c3 >= bStack_15d3) * bStack_15c3;
  local_1ba8[6] =
       (bStack_15c2 < bStack_15d2) * bStack_15d2 | (bStack_15c2 >= bStack_15d2) * bStack_15c2;
  local_1ba8[7] =
       (bStack_15c1 < bStack_15d1) * bStack_15d1 | (bStack_15c1 >= bStack_15d1) * bStack_15c1;
  bVar179 = (bStack_15c0 < bStack_15d0) * bStack_15d0 | (bStack_15c0 >= bStack_15d0) * bStack_15c0;
  bVar197 = (bStack_15bf < bStack_15cf) * bStack_15cf | (bStack_15bf >= bStack_15cf) * bStack_15bf;
  bVar198 = (bStack_15be < bStack_15ce) * bStack_15ce | (bStack_15be >= bStack_15ce) * bStack_15be;
  bVar207 = (bStack_15bd < bStack_15cd) * bStack_15cd | (bStack_15bd >= bStack_15cd) * bStack_15bd;
  bVar208 = (bStack_15bc < bStack_15cc) * bStack_15cc | (bStack_15bc >= bStack_15cc) * bStack_15bc;
  bVar218 = (bStack_15bb < bStack_15cb) * bStack_15cb | (bStack_15bb >= bStack_15cb) * bStack_15bb;
  bVar219 = (bStack_15ba < bStack_15ca) * bStack_15ca | (bStack_15ba >= bStack_15ca) * bStack_15ba;
  bVar228 = (bStack_15b9 < bStack_15c9) * bStack_15c9 | (bStack_15b9 >= bStack_15c9) * bStack_15b9;
  local_1ba8[8] = bVar179;
  local_1ba8[9] = bVar197;
  local_1ba8[10] = bVar198;
  local_1ba8[0xb] = bVar207;
  local_1ba8[0xc] = bVar208;
  local_1ba8[0xd] = bVar218;
  local_1ba8[0xe] = bVar219;
  local_1ba8[0xf] = bVar228;
  local_15f8 = local_1ba8._0_8_;
  uStack_15f0 = local_1ba8._8_8_;
  local_1ba8[0] =
       (local_1528 < local_1ba8[0]) * local_1ba8[0] | (local_1528 >= local_1ba8[0]) * local_1528;
  local_1ba8[1] =
       (bStack_1527 < local_1ba8[1]) * local_1ba8[1] | (bStack_1527 >= local_1ba8[1]) * bStack_1527;
  local_1ba8[2] =
       (bStack_1526 < local_1ba8[2]) * local_1ba8[2] | (bStack_1526 >= local_1ba8[2]) * bStack_1526;
  local_1ba8[3] =
       (bStack_1525 < local_1ba8[3]) * local_1ba8[3] | (bStack_1525 >= local_1ba8[3]) * bStack_1525;
  local_1ba8[4] =
       (bStack_1524 < local_1ba8[4]) * local_1ba8[4] | (bStack_1524 >= local_1ba8[4]) * bStack_1524;
  local_1ba8[5] =
       (bStack_1523 < local_1ba8[5]) * local_1ba8[5] | (bStack_1523 >= local_1ba8[5]) * bStack_1523;
  local_1ba8[6] =
       (bStack_1522 < local_1ba8[6]) * local_1ba8[6] | (bStack_1522 >= local_1ba8[6]) * bStack_1522;
  local_1ba8[7] =
       (bStack_1521 < local_1ba8[7]) * local_1ba8[7] | (bStack_1521 >= local_1ba8[7]) * bStack_1521;
  local_1ba8[8] = (bStack_1520 < bVar179) * bVar179 | (bStack_1520 >= bVar179) * bStack_1520;
  local_1ba8[9] = (bStack_151f < bVar197) * bVar197 | (bStack_151f >= bVar197) * bStack_151f;
  local_1ba8[10] = (bStack_151e < bVar198) * bVar198 | (bStack_151e >= bVar198) * bStack_151e;
  local_1ba8[0xb] = (bStack_151d < bVar207) * bVar207 | (bStack_151d >= bVar207) * bStack_151d;
  local_1ba8[0xc] = (bStack_151c < bVar208) * bVar208 | (bStack_151c >= bVar208) * bStack_151c;
  local_1ba8[0xd] = (bStack_151b < bVar218) * bVar218 | (bStack_151b >= bVar218) * bStack_151b;
  local_1ba8[0xe] = (bStack_151a < bVar219) * bVar219 | (bStack_151a >= bVar219) * bStack_151a;
  local_1ba8[0xf] = (bStack_1519 < bVar228) * bVar228 | (bStack_1519 >= bVar228) * bStack_1519;
  local_1618 = local_1ba8 >> 0x20;
  local_1608 = local_1ba8;
  local_1ba8[1] =
       (local_1ba8[1] < local_1ba8[5]) * local_1ba8[5] |
       (local_1ba8[1] >= local_1ba8[5]) * local_1ba8[1];
  local_1ba8[0] =
       (local_1ba8[0] < local_1ba8[4]) * local_1ba8[4] |
       (local_1ba8[0] >= local_1ba8[4]) * local_1ba8[0];
  local_1ba8[2] =
       (local_1ba8[2] < local_1ba8[6]) * local_1ba8[6] |
       (local_1ba8[2] >= local_1ba8[6]) * local_1ba8[2];
  local_1ba8[3] =
       (local_1ba8[3] < local_1ba8[7]) * local_1ba8[7] |
       (local_1ba8[3] >= local_1ba8[7]) * local_1ba8[3];
  local_1ba8[4] =
       (local_1ba8[4] < local_1ba8[8]) * local_1ba8[8] |
       (local_1ba8[4] >= local_1ba8[8]) * local_1ba8[4];
  local_1ba8[5] =
       (local_1ba8[5] < local_1ba8[9]) * local_1ba8[9] |
       (local_1ba8[5] >= local_1ba8[9]) * local_1ba8[5];
  local_1ba8[6] =
       (local_1ba8[6] < local_1ba8[10]) * local_1ba8[10] |
       (local_1ba8[6] >= local_1ba8[10]) * local_1ba8[6];
  local_1ba8[7] =
       (local_1ba8[7] < local_1ba8[0xb]) * local_1ba8[0xb] |
       (local_1ba8[7] >= local_1ba8[0xb]) * local_1ba8[7];
  local_1ba8[8] =
       (local_1ba8[8] < local_1ba8[0xc]) * local_1ba8[0xc] |
       (local_1ba8[8] >= local_1ba8[0xc]) * local_1ba8[8];
  local_1ba8[9] =
       (local_1ba8[9] < local_1ba8[0xd]) * local_1ba8[0xd] |
       (local_1ba8[9] >= local_1ba8[0xd]) * local_1ba8[9];
  local_1ba8[10] =
       (local_1ba8[10] < local_1ba8[0xe]) * local_1ba8[0xe] |
       (local_1ba8[10] >= local_1ba8[0xe]) * local_1ba8[10];
  local_1ba8[0xb] =
       (local_1ba8[0xb] < local_1ba8[0xf]) * local_1ba8[0xf] |
       (local_1ba8[0xb] >= local_1ba8[0xf]) * local_1ba8[0xb];
  local_11e8 = local_1ba8._0_8_;
  uStack_11e0 = local_1ba8._8_8_;
  local_11f8 = local_1b78;
  uStack_11f0 = uStack_1b70;
  auVar85._8_8_ = local_1ba8._8_8_;
  auVar85._0_8_ = local_1ba8._0_8_;
  auVar84._8_8_ = uStack_1b70;
  auVar84._0_8_ = local_1b78;
  auVar195 = psubusb(auVar85,auVar84);
  local_1ba8._0_8_ = auVar195._0_8_;
  local_1ba8._8_8_ = auVar195._8_8_;
  local_1708 = local_1ba8._0_8_;
  uVar12 = local_1708;
  uStack_1700 = local_1ba8._8_8_;
  uVar13 = uStack_1700;
  local_1718 = local_1b68;
  uVar8 = local_1718;
  uStack_1710 = uStack_1b60;
  uVar11 = uStack_1710;
  local_1708._0_1_ = auVar195[0];
  local_1708._1_1_ = auVar195[1];
  local_1708._2_1_ = auVar195[2];
  local_1708._3_1_ = auVar195[3];
  local_1708._4_1_ = auVar195[4];
  local_1708._5_1_ = auVar195[5];
  local_1708._6_1_ = auVar195[6];
  local_1708._7_1_ = auVar195[7];
  uStack_1700._0_1_ = auVar195[8];
  uStack_1700._1_1_ = auVar195[9];
  uStack_1700._2_1_ = auVar195[10];
  uStack_1700._3_1_ = auVar195[0xb];
  uStack_1700._4_1_ = auVar195[0xc];
  uStack_1700._5_1_ = auVar195[0xd];
  uStack_1700._6_1_ = auVar195[0xe];
  uStack_1700._7_1_ = auVar195[0xf];
  local_1718._0_1_ = (char)local_1b68;
  cVar157 = (char)local_1718;
  local_1718._1_1_ = (char)((ulong)local_1b68 >> 8);
  cVar158 = local_1718._1_1_;
  local_1718._2_1_ = (char)((ulong)local_1b68 >> 0x10);
  cVar159 = local_1718._2_1_;
  local_1718._3_1_ = (char)((ulong)local_1b68 >> 0x18);
  cVar160 = local_1718._3_1_;
  local_1718._4_1_ = (char)((ulong)local_1b68 >> 0x20);
  cVar161 = local_1718._4_1_;
  local_1718._5_1_ = (char)((ulong)local_1b68 >> 0x28);
  cVar162 = local_1718._5_1_;
  local_1718._6_1_ = (char)((ulong)local_1b68 >> 0x30);
  cVar163 = local_1718._6_1_;
  local_1718._7_1_ = (char)((ulong)local_1b68 >> 0x38);
  cVar164 = local_1718._7_1_;
  uStack_1710._0_1_ = (char)uStack_1b60;
  uStack_1710._1_1_ = (char)((ulong)uStack_1b60 >> 8);
  uStack_1710._2_1_ = (char)((ulong)uStack_1b60 >> 0x10);
  uStack_1710._3_1_ = (char)((ulong)uStack_1b60 >> 0x18);
  uStack_1710._4_1_ = (char)((ulong)uStack_1b60 >> 0x20);
  uStack_1710._5_1_ = (char)((ulong)uStack_1b60 >> 0x28);
  uStack_1710._6_1_ = (char)((ulong)uStack_1b60 >> 0x30);
  uStack_1710._7_1_ = (char)((ulong)uStack_1b60 >> 0x38);
  local_1ba8[1] = -(local_1708._1_1_ == local_1718._1_1_);
  local_1ba8[0] = -((char)local_1708 == (char)local_1718);
  local_1ba8[2] = -(local_1708._2_1_ == local_1718._2_1_);
  local_1ba8[3] = -(local_1708._3_1_ == local_1718._3_1_);
  local_1ba8[4] = -(local_1708._4_1_ == local_1718._4_1_);
  local_1ba8[5] = -(local_1708._5_1_ == local_1718._5_1_);
  local_1ba8[6] = -(local_1708._6_1_ == local_1718._6_1_);
  local_1ba8[7] = -(local_1708._7_1_ == local_1718._7_1_);
  local_1ba8[8] = -((char)uStack_1700 == (char)uStack_1710);
  local_1ba8[9] = -(uStack_1700._1_1_ == uStack_1710._1_1_);
  local_1ba8[10] = -(uStack_1700._2_1_ == uStack_1710._2_1_);
  local_1ba8[0xb] = -(uStack_1700._3_1_ == uStack_1710._3_1_);
  local_1ba8[0xc] = -(uStack_1700._4_1_ == uStack_1710._4_1_);
  local_1ba8[0xd] = -(uStack_1700._5_1_ == uStack_1710._5_1_);
  local_1ba8[0xe] = -(uStack_1700._6_1_ == uStack_1710._6_1_);
  local_1ba8[0xf] = -(uStack_1700._7_1_ == uStack_1710._7_1_);
  local_1248 = local_1ba8._0_8_;
  uStack_1240 = local_1ba8._8_8_;
  local_1258 = local_1b88._0_8_;
  uStack_1250 = local_1b88._8_8_;
  local_1ad8 = local_1ba8._0_8_ & local_1b88._0_8_;
  uStack_1ad0 = local_1ba8._8_8_ & local_1b88._8_8_;
  local_1ac8._0_4_ = (undefined4)local_1ad8;
  local_1ac8._4_4_ = (undefined4)(local_1ad8 >> 0x20);
  local_1ba8._4_4_ = (undefined4)local_1ac8;
  local_1ba8._0_4_ = (undefined4)local_1ac8;
  local_1ba8._8_4_ = local_1ac8._4_4_;
  local_1ba8._12_4_ = local_1ac8._4_4_;
  local_1828 = local_1ba8._0_8_;
  uStack_1820 = local_1ba8._8_8_;
  local_1838 = local_1ba8._0_8_;
  uStack_1830 = local_1ba8._8_8_;
  local_1ba8._8_8_ = local_1ba8._0_8_;
  local_1728 = local_1ba8._0_8_;
  uVar194 = local_1728;
  uStack_1720 = local_1ba8._0_8_;
  local_1738 = local_1b68;
  uStack_1730 = uStack_1b60;
  local_1728._0_1_ = (char)local_1ad8;
  local_1728._1_1_ = (char)(local_1ad8 >> 8);
  local_1728._2_1_ = (char)(local_1ad8 >> 0x10);
  local_1728._3_1_ = (char)(local_1ad8 >> 0x18);
  local_1128 = -((char)local_1728 == (char)local_1718);
  cStack_1127 = -(local_1728._1_1_ == local_1718._1_1_);
  cStack_1126 = -(local_1728._2_1_ == local_1718._2_1_);
  cStack_1125 = -(local_1728._3_1_ == local_1718._3_1_);
  cStack_1124 = -((char)local_1728 == local_1718._4_1_);
  cStack_1123 = -(local_1728._1_1_ == local_1718._5_1_);
  cStack_1122 = -(local_1728._2_1_ == local_1718._6_1_);
  cStack_1121 = -(local_1728._3_1_ == local_1718._7_1_);
  cStack_1120 = -((char)local_1728 == (char)uStack_1710);
  cStack_111f = -(local_1728._1_1_ == uStack_1710._1_1_);
  cStack_111e = -(local_1728._2_1_ == uStack_1710._2_1_);
  cStack_111d = -(local_1728._3_1_ == uStack_1710._3_1_);
  cStack_111c = -((char)local_1728 == uStack_1710._4_1_);
  cStack_111b = -(local_1728._1_1_ == uStack_1710._5_1_);
  cStack_111a = -(local_1728._2_1_ == uStack_1710._6_1_);
  bStack_1119 = -(local_1728._3_1_ == uStack_1710._7_1_);
  auVar89[1] = cStack_1127;
  auVar89[0] = local_1128;
  auVar89[2] = cStack_1126;
  auVar89[3] = cStack_1125;
  auVar89[4] = cStack_1124;
  auVar89[5] = cStack_1123;
  auVar89[6] = cStack_1122;
  auVar89[7] = cStack_1121;
  auVar89[8] = cStack_1120;
  auVar89[9] = cStack_111f;
  auVar89[10] = cStack_111e;
  auVar89[0xb] = cStack_111d;
  auVar89[0xc] = cStack_111c;
  auVar89[0xd] = cStack_111b;
  auVar89[0xe] = cStack_111a;
  auVar89[0xf] = bStack_1119;
  uVar191 = (ushort)(SUB161(auVar89 >> 7,0) & 1) | (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_1119 >> 7) << 0xf;
  local_1ac8 = local_1ad8;
  uStack_1ac0 = uStack_1ad0;
  local_1728 = uVar194;
  local_1718 = uVar8;
  uStack_1710 = uVar11;
  local_1708 = uVar12;
  uStack_1700 = uVar13;
  if (uVar191 == 0xffff) {
    (*local_1b40)[0] = local_1c58;
    (*palVar176)[1] = uVar177;
    palVar178 = local_1b38;
    uVar177 = uStack_1c60;
    (*local_1b38)[0] = local_1c68;
    (*palVar178)[1] = uVar177;
  }
  else {
    local_eca = 8;
    local_3a = 8;
    local_3c = 8;
    local_3e = 8;
    local_40 = 8;
    local_42 = 8;
    local_44 = 8;
    local_46 = 8;
    local_48 = 8;
    local_878 = 0x8000800080008;
    uStack_870 = 0x8000800080008;
    local_ecc = 4;
    local_1a = 4;
    local_1c = 4;
    local_1e = 4;
    local_20 = 4;
    local_22 = 4;
    local_24 = 4;
    local_26 = 4;
    local_28 = 4;
    local_8b8 = 0x4000400040004;
    uStack_8b0 = 0x4000400040004;
    lVar1 = (*local_1b40)[0];
    lStack_1960 = (*local_1b40)[1];
    local_1978 = local_1b68;
    uStack_1970 = uStack_1b60;
    local_1968._0_1_ = (undefined1)lVar1;
    uVar149 = (undefined1)local_1968;
    local_1968._1_1_ = (undefined1)((ulong)lVar1 >> 8);
    uVar150 = local_1968._1_1_;
    local_1968._2_1_ = (undefined1)((ulong)lVar1 >> 0x10);
    uVar151 = local_1968._2_1_;
    local_1968._3_1_ = (undefined1)((ulong)lVar1 >> 0x18);
    uVar152 = local_1968._3_1_;
    local_1968._4_1_ = (undefined1)((ulong)lVar1 >> 0x20);
    uVar153 = local_1968._4_1_;
    local_1968._5_1_ = (undefined1)((ulong)lVar1 >> 0x28);
    uVar154 = local_1968._5_1_;
    local_1968._6_1_ = (undefined1)((ulong)lVar1 >> 0x30);
    uVar155 = local_1968._6_1_;
    local_1968._7_1_ = (undefined1)((ulong)lVar1 >> 0x38);
    uVar156 = local_1968._7_1_;
    lVar2 = (*local_1b38)[0];
    lStack_1980 = (*local_1b38)[1];
    local_1998 = local_1b68;
    uStack_1990 = uStack_1b60;
    local_1988._0_1_ = (undefined1)lVar2;
    uVar141 = (undefined1)local_1988;
    local_1988._1_1_ = (undefined1)((ulong)lVar2 >> 8);
    uVar142 = local_1988._1_1_;
    local_1988._2_1_ = (undefined1)((ulong)lVar2 >> 0x10);
    uVar143 = local_1988._2_1_;
    local_1988._3_1_ = (undefined1)((ulong)lVar2 >> 0x18);
    uVar144 = local_1988._3_1_;
    local_1988._4_1_ = (undefined1)((ulong)lVar2 >> 0x20);
    uVar145 = local_1988._4_1_;
    local_1988._5_1_ = (undefined1)((ulong)lVar2 >> 0x28);
    uVar146 = local_1988._5_1_;
    local_1988._6_1_ = (undefined1)((ulong)lVar2 >> 0x30);
    uVar147 = local_1988._6_1_;
    local_1988._7_1_ = (undefined1)((ulong)lVar2 >> 0x38);
    uVar148 = local_1988._7_1_;
    lVar3 = (*local_1b30)[0];
    lStack_19a0 = (*local_1b30)[1];
    local_19b8 = local_1b68;
    uStack_19b0 = uStack_1b60;
    local_19a8._0_1_ = (undefined1)lVar3;
    uVar133 = (undefined1)local_19a8;
    local_19a8._1_1_ = (undefined1)((ulong)lVar3 >> 8);
    uVar134 = local_19a8._1_1_;
    local_19a8._2_1_ = (undefined1)((ulong)lVar3 >> 0x10);
    uVar135 = local_19a8._2_1_;
    local_19a8._3_1_ = (undefined1)((ulong)lVar3 >> 0x18);
    uVar136 = local_19a8._3_1_;
    local_19a8._4_1_ = (undefined1)((ulong)lVar3 >> 0x20);
    uVar137 = local_19a8._4_1_;
    local_19a8._5_1_ = (undefined1)((ulong)lVar3 >> 0x28);
    uVar138 = local_19a8._5_1_;
    local_19a8._6_1_ = (undefined1)((ulong)lVar3 >> 0x30);
    uVar139 = local_19a8._6_1_;
    local_19a8._7_1_ = (undefined1)((ulong)lVar3 >> 0x38);
    uVar140 = local_19a8._7_1_;
    lVar4 = (*local_1b28)[0];
    lStack_19c0 = (*local_1b28)[1];
    local_19d8 = local_1b68;
    uStack_19d0 = uStack_1b60;
    local_19c8._0_1_ = (undefined1)lVar4;
    uVar125 = (undefined1)local_19c8;
    local_19c8._1_1_ = (undefined1)((ulong)lVar4 >> 8);
    uVar126 = local_19c8._1_1_;
    local_19c8._2_1_ = (undefined1)((ulong)lVar4 >> 0x10);
    uVar127 = local_19c8._2_1_;
    local_19c8._3_1_ = (undefined1)((ulong)lVar4 >> 0x18);
    uVar128 = local_19c8._3_1_;
    local_19c8._4_1_ = (undefined1)((ulong)lVar4 >> 0x20);
    uVar129 = local_19c8._4_1_;
    local_19c8._5_1_ = (undefined1)((ulong)lVar4 >> 0x28);
    uVar130 = local_19c8._5_1_;
    local_19c8._6_1_ = (undefined1)((ulong)lVar4 >> 0x30);
    uVar131 = local_19c8._6_1_;
    local_19c8._7_1_ = (undefined1)((ulong)lVar4 >> 0x38);
    uVar132 = local_19c8._7_1_;
    lVar5 = (*local_1b20)[0];
    lStack_19e0 = (*local_1b20)[1];
    local_19f8 = local_1b68;
    uStack_19f0 = uStack_1b60;
    local_19e8._0_1_ = (undefined1)lVar5;
    uVar117 = (undefined1)local_19e8;
    local_19e8._1_1_ = (undefined1)((ulong)lVar5 >> 8);
    uVar118 = local_19e8._1_1_;
    local_19e8._2_1_ = (undefined1)((ulong)lVar5 >> 0x10);
    uVar119 = local_19e8._2_1_;
    local_19e8._3_1_ = (undefined1)((ulong)lVar5 >> 0x18);
    uVar120 = local_19e8._3_1_;
    local_19e8._4_1_ = (undefined1)((ulong)lVar5 >> 0x20);
    uVar121 = local_19e8._4_1_;
    local_19e8._5_1_ = (undefined1)((ulong)lVar5 >> 0x28);
    uVar122 = local_19e8._5_1_;
    local_19e8._6_1_ = (undefined1)((ulong)lVar5 >> 0x30);
    uVar123 = local_19e8._6_1_;
    local_19e8._7_1_ = (undefined1)((ulong)lVar5 >> 0x38);
    uVar124 = local_19e8._7_1_;
    lVar6 = (*local_1b18)[0];
    lStack_1a00 = (*local_1b18)[1];
    local_1a18 = local_1b68;
    uStack_1a10 = uStack_1b60;
    local_1a08._0_1_ = (undefined1)lVar6;
    uVar109 = (undefined1)local_1a08;
    local_1a08._1_1_ = (undefined1)((ulong)lVar6 >> 8);
    uVar110 = local_1a08._1_1_;
    local_1a08._2_1_ = (undefined1)((ulong)lVar6 >> 0x10);
    uVar111 = local_1a08._2_1_;
    local_1a08._3_1_ = (undefined1)((ulong)lVar6 >> 0x18);
    uVar112 = local_1a08._3_1_;
    local_1a08._4_1_ = (undefined1)((ulong)lVar6 >> 0x20);
    uVar113 = local_1a08._4_1_;
    local_1a08._5_1_ = (undefined1)((ulong)lVar6 >> 0x28);
    uVar114 = local_1a08._5_1_;
    local_1a08._6_1_ = (undefined1)((ulong)lVar6 >> 0x30);
    uVar115 = local_1a08._6_1_;
    local_1a08._7_1_ = (undefined1)((ulong)lVar6 >> 0x38);
    uVar116 = local_1a08._7_1_;
    lVar7 = (*local_1b10)[0];
    lStack_1a20 = (*local_1b10)[1];
    local_1a38 = local_1b68;
    uStack_1a30 = uStack_1b60;
    local_1a28._0_1_ = (undefined1)lVar7;
    uVar101 = (undefined1)local_1a28;
    local_1a28._1_1_ = (undefined1)((ulong)lVar7 >> 8);
    uVar102 = local_1a28._1_1_;
    local_1a28._2_1_ = (undefined1)((ulong)lVar7 >> 0x10);
    uVar103 = local_1a28._2_1_;
    local_1a28._3_1_ = (undefined1)((ulong)lVar7 >> 0x18);
    uVar104 = local_1a28._3_1_;
    local_1a28._4_1_ = (undefined1)((ulong)lVar7 >> 0x20);
    uVar105 = local_1a28._4_1_;
    local_1a28._5_1_ = (undefined1)((ulong)lVar7 >> 0x28);
    uVar106 = local_1a28._5_1_;
    local_1a28._6_1_ = (undefined1)((ulong)lVar7 >> 0x30);
    uVar107 = local_1a28._6_1_;
    local_1a28._7_1_ = (undefined1)((ulong)lVar7 >> 0x38);
    uVar108 = local_1a28._7_1_;
    sVar240 = CONCAT11(local_1718._4_1_,local_1968._4_1_);
    uVar15 = CONCAT13(local_1718._5_1_,CONCAT12(local_1968._5_1_,sVar240));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_1968._6_1_,uVar15));
    uVar14 = CONCAT17(local_1718._7_1_,CONCAT16(local_1968._7_1_,uVar16));
    sVar31 = CONCAT11(local_1718._4_1_,local_1988._4_1_);
    uVar32 = CONCAT13(local_1718._5_1_,CONCAT12(local_1988._5_1_,sVar31));
    uVar33 = CONCAT15(local_1718._6_1_,CONCAT14(local_1988._6_1_,uVar32));
    uVar30 = CONCAT17(local_1718._7_1_,CONCAT16(local_1988._7_1_,uVar33));
    sVar255 = CONCAT11(local_1718._4_1_,local_19a8._4_1_);
    uVar48 = CONCAT13(local_1718._5_1_,CONCAT12(local_19a8._5_1_,sVar255));
    uVar49 = CONCAT15(local_1718._6_1_,CONCAT14(local_19a8._6_1_,uVar48));
    uVar47 = CONCAT17(local_1718._7_1_,CONCAT16(local_19a8._7_1_,uVar49));
    sVar254 = CONCAT11(local_1718._4_1_,local_19c8._4_1_);
    uVar60 = CONCAT13(local_1718._5_1_,CONCAT12(local_19c8._5_1_,sVar254));
    uVar61 = CONCAT15(local_1718._6_1_,CONCAT14(local_19c8._6_1_,uVar60));
    uVar59 = CONCAT17(local_1718._7_1_,CONCAT16(local_19c8._7_1_,uVar61));
    sVar253 = CONCAT11(local_1718._4_1_,local_19e8._4_1_);
    uVar67 = CONCAT13(local_1718._5_1_,CONCAT12(local_19e8._5_1_,sVar253));
    uVar68 = CONCAT15(local_1718._6_1_,CONCAT14(local_19e8._6_1_,uVar67));
    uVar66 = CONCAT17(local_1718._7_1_,CONCAT16(local_19e8._7_1_,uVar68));
    uVar73 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1a08._5_1_,CONCAT11(local_1718._4_1_,local_1a08._4_1_)));
    uVar74 = CONCAT15(local_1718._6_1_,CONCAT14(local_1a08._6_1_,uVar73));
    uVar72 = CONCAT17(local_1718._7_1_,CONCAT16(local_1a08._7_1_,uVar74));
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_19c8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19c8)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_19c8._2_1_,uVar9));
    uVar56 = CONCAT17(local_1718._3_1_,CONCAT16(local_19c8._3_1_,uVar10));
    uVar18 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19c8._5_1_,CONCAT11(local_1718._4_1_,local_19c8._4_1_)));
    uVar19 = CONCAT15(local_1718._6_1_,CONCAT14(local_19c8._6_1_,uVar18));
    uVar62 = CONCAT17(local_1718._7_1_,CONCAT16(local_19c8._7_1_,uVar19));
    uVar24 = CONCAT13(local_1718._1_1_,
                      CONCAT12(local_19e8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19e8)));
    uVar25 = CONCAT15(local_1718._2_1_,CONCAT14(local_19e8._2_1_,uVar24));
    uVar65 = CONCAT17(local_1718._3_1_,CONCAT16(local_19e8._3_1_,uVar25));
    uVar35 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19e8._5_1_,CONCAT11(local_1718._4_1_,local_19e8._4_1_)));
    uVar36 = CONCAT15(local_1718._6_1_,CONCAT14(local_19e8._6_1_,uVar35));
    uVar69 = CONCAT17(local_1718._7_1_,CONCAT16(local_19e8._7_1_,uVar36));
    uVar42 = CONCAT13(local_1718._1_1_,
                      CONCAT12(local_1a08._1_1_,CONCAT11((char)local_1718,(undefined1)local_1a08)));
    uVar43 = CONCAT15(local_1718._2_1_,CONCAT14(local_1a08._2_1_,uVar42));
    uVar70 = CONCAT17(local_1718._3_1_,CONCAT16(local_1a08._3_1_,uVar43));
    uVar51 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1a08._5_1_,CONCAT11(local_1718._4_1_,local_1a08._4_1_)));
    uVar52 = CONCAT15(local_1718._6_1_,CONCAT14(local_1a08._6_1_,uVar51));
    uVar75 = CONCAT17(local_1718._7_1_,CONCAT16(local_1a08._7_1_,uVar52));
    local_7b8._2_2_ = (short)((uint)uVar24 >> 0x10);
    local_7b8._4_2_ = (short)((uint6)uVar25 >> 0x20);
    local_7b8._6_2_ = (short)((ulong)uVar65 >> 0x30);
    uStack_7b0._2_2_ = (short)((uint)uVar35 >> 0x10);
    uStack_7b0._4_2_ = (short)((uint6)uVar36 >> 0x20);
    uStack_7b0._6_2_ = (short)((ulong)uVar69 >> 0x30);
    local_7c8._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_7c8._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_7c8._6_2_ = (short)((ulong)uVar56 >> 0x30);
    uStack_7c0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_7c0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_7c0._6_2_ = (short)((ulong)uVar62 >> 0x30);
    local_7e8 = CONCAT11((char)local_1718,(undefined1)local_19e8) +
                CONCAT11((char)local_1718,(undefined1)local_19c8);
    sStack_7e6 = local_7b8._2_2_ + local_7c8._2_2_;
    sStack_7e4 = local_7b8._4_2_ + local_7c8._4_2_;
    sStack_7e2 = local_7b8._6_2_ + local_7c8._6_2_;
    sStack_7e0 = CONCAT11(local_1718._4_1_,local_19e8._4_1_) +
                 CONCAT11(local_1718._4_1_,local_19c8._4_1_);
    sStack_7de = uStack_7b0._2_2_ + uStack_7c0._2_2_;
    sStack_7dc = uStack_7b0._4_2_ + uStack_7c0._4_2_;
    sStack_7da = uStack_7b0._6_2_ + uStack_7c0._6_2_;
    local_7d8._2_2_ = (short)((uint)uVar42 >> 0x10);
    local_7d8._4_2_ = (short)((uint6)uVar43 >> 0x20);
    local_7d8._6_2_ = (short)((ulong)uVar70 >> 0x30);
    uStack_7d0._2_2_ = (short)((uint)uVar51 >> 0x10);
    uStack_7d0._4_2_ = (short)((uint6)uVar52 >> 0x20);
    uStack_7d0._6_2_ = (short)((ulong)uVar75 >> 0x30);
    local_888 = CONCAT11((char)local_1718,(undefined1)local_1a08) + local_7e8;
    sStack_880 = CONCAT11(local_1718._4_1_,local_1a08._4_1_) + sStack_7e0;
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1968._1_1_,CONCAT11((char)local_1718,(undefined1)local_1968)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1968._2_1_,uVar9));
    uVar8 = CONCAT17(local_1718._3_1_,CONCAT16(local_1968._3_1_,uVar10));
    uVar18 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1968._5_1_,CONCAT11(local_1718._4_1_,local_1968._4_1_)));
    uVar19 = CONCAT15(local_1718._6_1_,CONCAT14(local_1968._6_1_,uVar18));
    uVar17 = CONCAT17(local_1718._7_1_,CONCAT16(local_1968._7_1_,uVar19));
    uVar24 = CONCAT13(local_1718._1_1_,
                      CONCAT12(local_1988._1_1_,CONCAT11((char)local_1718,(undefined1)local_1988)));
    uVar25 = CONCAT15(local_1718._2_1_,CONCAT14(local_1988._2_1_,uVar24));
    uVar23 = CONCAT17(local_1718._3_1_,CONCAT16(local_1988._3_1_,uVar25));
    uVar35 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1988._5_1_,CONCAT11(local_1718._4_1_,local_1988._4_1_)));
    uVar36 = CONCAT15(local_1718._6_1_,CONCAT14(local_1988._6_1_,uVar35));
    uVar34 = CONCAT17(local_1718._7_1_,CONCAT16(local_1988._7_1_,uVar36));
    uVar42 = CONCAT13(local_1718._1_1_,
                      CONCAT12(local_19a8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19a8)));
    uVar43 = CONCAT15(local_1718._2_1_,CONCAT14(local_19a8._2_1_,uVar42));
    uVar41 = CONCAT17(local_1718._3_1_,CONCAT16(local_19a8._3_1_,uVar43));
    uVar51 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19a8._5_1_,CONCAT11(local_1718._4_1_,local_19a8._4_1_)));
    uVar52 = CONCAT15(local_1718._6_1_,CONCAT14(local_19a8._6_1_,uVar51));
    uVar50 = CONCAT17(local_1718._7_1_,CONCAT16(local_19a8._7_1_,uVar52));
    local_7f8._2_2_ = (short)((uint)uVar42 >> 0x10);
    local_7f8._4_2_ = (short)((uint6)uVar43 >> 0x20);
    local_7f8._6_2_ = (short)((ulong)uVar41 >> 0x30);
    uStack_7f0._2_2_ = (short)((uint)uVar51 >> 0x10);
    uStack_7f0._4_2_ = (short)((uint6)uVar52 >> 0x20);
    uStack_7f0._6_2_ = (short)((ulong)uVar50 >> 0x30);
    local_808._2_2_ = (short)((uint)uVar24 >> 0x10);
    local_808._4_2_ = (short)((uint6)uVar25 >> 0x20);
    local_808._6_2_ = (short)((ulong)uVar23 >> 0x30);
    uStack_800._2_2_ = (short)((uint)uVar35 >> 0x10);
    uStack_800._4_2_ = (short)((uint6)uVar36 >> 0x20);
    uStack_800._6_2_ = (short)((ulong)uVar34 >> 0x30);
    local_828 = CONCAT11((char)local_1718,(undefined1)local_19a8) +
                CONCAT11((char)local_1718,(undefined1)local_1988);
    sStack_826 = local_7f8._2_2_ + local_808._2_2_;
    sStack_824 = local_7f8._4_2_ + local_808._4_2_;
    sStack_822 = local_7f8._6_2_ + local_808._6_2_;
    sStack_820 = CONCAT11(local_1718._4_1_,local_19a8._4_1_) +
                 CONCAT11(local_1718._4_1_,local_1988._4_1_);
    sStack_81e = uStack_7f0._2_2_ + uStack_800._2_2_;
    sStack_81c = uStack_7f0._4_2_ + uStack_800._4_2_;
    sStack_81a = uStack_7f0._6_2_ + uStack_800._6_2_;
    local_818._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_818._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_818._6_2_ = (short)((ulong)uVar8 >> 0x30);
    uStack_810._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_810._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_810._6_2_ = (short)((ulong)uVar17 >> 0x30);
    local_8c8 = CONCAT11((char)local_1718,(undefined1)local_1968) + local_828;
    local_818._2_2_ = local_818._2_2_ + sStack_826;
    local_818._4_2_ = local_818._4_2_ + sStack_824;
    local_818._6_2_ = local_818._6_2_ + sStack_822;
    sStack_8c0 = CONCAT11(local_1718._4_1_,local_1968._4_1_) + sStack_820;
    sStack_8be = uStack_810._2_2_ + sStack_81e;
    sStack_8bc = uStack_810._4_2_ + sStack_81c;
    sStack_8ba = uStack_810._6_2_ + sStack_81a;
    local_838 = CONCAT26(local_7d8._6_2_ + sStack_7e2,
                         CONCAT24(local_7d8._4_2_ + sStack_7e4,
                                  CONCAT22(local_7d8._2_2_ + sStack_7e6,local_888)));
    uStack_830 = CONCAT26(uStack_7d0._6_2_ + sStack_7da,
                          CONCAT24(uStack_7d0._4_2_ + sStack_7dc,
                                   CONCAT22(uStack_7d0._2_2_ + sStack_7de,sStack_880)));
    local_848 = CONCAT26(local_818._6_2_,
                         CONCAT24(local_818._4_2_,CONCAT22(local_818._2_2_,local_8c8)));
    uStack_840 = CONCAT26(sStack_8ba,CONCAT24(sStack_8bc,CONCAT22(sStack_8be,sStack_8c0)));
    local_888 = local_888 + local_8c8;
    sStack_886 = local_7d8._2_2_ + sStack_7e6 + local_818._2_2_;
    sStack_884 = local_7d8._4_2_ + sStack_7e4 + local_818._4_2_;
    sStack_882 = local_7d8._6_2_ + sStack_7e2 + local_818._6_2_;
    sStack_880 = sStack_880 + sStack_8c0;
    sStack_87e = uStack_7d0._2_2_ + sStack_7de + sStack_8be;
    sStack_87c = uStack_7d0._4_2_ + sStack_7dc + sStack_8bc;
    sStack_87a = uStack_7d0._6_2_ + sStack_7da + sStack_8ba;
    local_8a8 = CONCAT26(sStack_8ba,CONCAT24(sStack_8bc,CONCAT22(sStack_8be,sStack_8c0)));
    local_868 = CONCAT26(sStack_87a,CONCAT24(sStack_87c,CONCAT22(sStack_87e,sStack_880)));
    local_858 = CONCAT26(sStack_882,CONCAT24(sStack_884,CONCAT22(sStack_886,local_888)));
    uStack_850 = CONCAT26(sStack_87a,CONCAT24(sStack_87c,CONCAT22(sStack_87e,sStack_880)));
    uStack_860 = 0;
    local_888 = local_888 + sStack_880;
    sStack_886 = sStack_886 + sStack_87e;
    sStack_884 = sStack_884 + sStack_87c;
    sStack_882 = sStack_882 + sStack_87a;
    sVar180 = local_888 + 8;
    sVar199 = sStack_886 + 8;
    sVar209 = sStack_884 + 8;
    sVar220 = sStack_882 + 8;
    sVar230 = sStack_880 + 8;
    sVar246 = sStack_87e + 8;
    sVar258 = sStack_87c + 8;
    sVar268 = sStack_87a + 8;
    local_898 = CONCAT26(local_818._6_2_,
                         CONCAT24(local_818._4_2_,CONCAT22(local_818._2_2_,local_8c8)));
    uStack_890 = CONCAT26(sStack_8ba,CONCAT24(sStack_8bc,CONCAT22(sStack_8be,sStack_8c0)));
    uStack_8a0 = 0;
    local_8c8 = local_8c8 + sStack_8c0;
    sStack_8c6 = local_818._2_2_ + sStack_8be;
    sStack_8c4 = local_818._4_2_ + sStack_8bc;
    sStack_8c2 = local_818._6_2_ + sStack_8ba;
    sVar181 = local_8c8 + 4;
    sVar200 = sStack_8c6 + 4;
    sVar210 = sStack_8c4 + 4;
    sVar221 = sStack_8c2 + 4;
    sVar231 = sStack_8c0 + 4;
    sVar247 = sStack_8be + 4;
    sVar259 = sStack_8bc + 4;
    sVar269 = sStack_8ba + 4;
    local_8f8 = CONCAT26(sVar221,CONCAT24(sVar210,CONCAT22(sVar200,sVar181)));
    uStack_8f0 = CONCAT26(sVar269,CONCAT24(sVar259,CONCAT22(sVar247,sVar231)));
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1968._1_1_,CONCAT11((char)local_1718,(undefined1)local_1968)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1968._2_1_,uVar9));
    uVar11 = CONCAT17(local_1718._3_1_,CONCAT16(local_1968._3_1_,uVar10));
    uVar18 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1968._5_1_,CONCAT11(local_1718._4_1_,local_1968._4_1_)));
    uVar19 = CONCAT15(local_1718._6_1_,CONCAT14(local_1968._6_1_,uVar18));
    uVar20 = CONCAT17(local_1718._7_1_,CONCAT16(local_1968._7_1_,uVar19));
    uVar24 = CONCAT13(local_1718._1_1_,
                      CONCAT12(local_19c8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19c8)));
    uVar25 = CONCAT15(local_1718._2_1_,CONCAT14(local_19c8._2_1_,uVar24));
    uVar57 = CONCAT17(local_1718._3_1_,CONCAT16(local_19c8._3_1_,uVar25));
    uVar35 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19c8._5_1_,CONCAT11(local_1718._4_1_,local_19c8._4_1_)));
    uVar36 = CONCAT15(local_1718._6_1_,CONCAT14(local_19c8._6_1_,uVar35));
    uVar63 = CONCAT17(local_1718._7_1_,CONCAT16(local_19c8._7_1_,uVar36));
    local_8d8._2_2_ = (short)((uint)uVar24 >> 0x10);
    local_8d8._4_2_ = (short)((uint6)uVar25 >> 0x20);
    local_8d8._6_2_ = (short)((ulong)uVar57 >> 0x30);
    uStack_8d0._2_2_ = (short)((uint)uVar35 >> 0x10);
    uStack_8d0._4_2_ = (short)((uint6)uVar36 >> 0x20);
    uStack_8d0._6_2_ = (short)((ulong)uVar63 >> 0x30);
    local_8e8._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_8e8._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_8e8._6_2_ = (short)((ulong)uVar11 >> 0x30);
    uStack_8e0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_8e0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_8e0._6_2_ = (short)((ulong)uVar20 >> 0x30);
    local_908 = CONCAT11((char)local_1718,(undefined1)local_19c8) +
                CONCAT11((char)local_1718,(undefined1)local_1968);
    sStack_906 = local_8d8._2_2_ + local_8e8._2_2_;
    sStack_904 = local_8d8._4_2_ + local_8e8._4_2_;
    sStack_902 = local_8d8._6_2_ + local_8e8._6_2_;
    sStack_900 = CONCAT11(local_1718._4_1_,local_19c8._4_1_) +
                 CONCAT11(local_1718._4_1_,local_1968._4_1_);
    sStack_8fe = uStack_8d0._2_2_ + uStack_8e0._2_2_;
    sStack_8fc = uStack_8d0._4_2_ + uStack_8e0._4_2_;
    sStack_8fa = uStack_8d0._6_2_ + uStack_8e0._6_2_;
    local_938 = CONCAT26(sVar221,CONCAT24(sVar210,CONCAT22(sVar200,sVar181)));
    uStack_930 = CONCAT26(sVar269,CONCAT24(sVar259,CONCAT22(sVar247,sVar231)));
    uStack_910 = 0;
    uStack_920 = 0;
    local_918._2_2_ = (short)((uint)uVar60 >> 0x10);
    sVar169 = local_918._2_2_;
    local_918._4_2_ = (short)((uint6)uVar61 >> 0x20);
    sVar170 = local_918._4_2_;
    local_918._6_2_ = (short)((ulong)uVar59 >> 0x30);
    sVar171 = local_918._6_2_;
    local_928._2_2_ = (short)((uint)uVar15 >> 0x10);
    sVar166 = local_928._2_2_;
    local_928._4_2_ = (short)((uint6)uVar16 >> 0x20);
    sVar167 = local_928._4_2_;
    local_928._6_2_ = (short)((ulong)uVar14 >> 0x30);
    sVar168 = local_928._6_2_;
    local_948 = sVar254 + sVar240;
    sStack_946 = local_918._2_2_ + local_928._2_2_;
    sStack_944 = local_918._4_2_ + local_928._4_2_;
    sStack_942 = local_918._6_2_ + local_928._6_2_;
    uStack_940 = 0;
    uStack_93e = 0;
    uStack_93c = 0;
    uStack_93a = 0;
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1a28._1_1_,CONCAT11((char)local_1718,(undefined1)local_1a28)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1a28._2_1_,uVar9));
    local_968 = CONCAT17(local_1718._3_1_,CONCAT16(local_1a28._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1a28._5_1_,CONCAT11(local_1718._4_1_,local_1a28._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_1a28._6_1_,uVar15));
    uStack_960 = CONCAT17(local_1718._7_1_,CONCAT16(local_1a28._7_1_,uVar16));
    local_958._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_958._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_958._6_2_ = (short)((ulong)local_968 >> 0x30);
    uStack_950._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_950._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_950._6_2_ = (short)((ulong)uStack_960 >> 0x30);
    sVar192 = CONCAT11((char)local_1718,(undefined1)local_1a28) * 2;
    sVar206 = local_958._2_2_ * 2;
    sVar216 = local_958._4_2_ * 2;
    sVar227 = local_958._6_2_ * 2;
    sVar239 = CONCAT11(local_1718._4_1_,local_1a28._4_1_) * 2;
    sVar252 = uStack_950._2_2_ * 2;
    sVar264 = uStack_950._4_2_ * 2;
    sVar274 = uStack_950._6_2_ * 2;
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_19c8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19c8)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_19c8._2_1_,uVar9));
    local_988 = CONCAT17(local_1718._3_1_,CONCAT16(local_19c8._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19c8._5_1_,CONCAT11(local_1718._4_1_,local_19c8._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_19c8._6_1_,uVar15));
    uStack_980 = CONCAT17(local_1718._7_1_,CONCAT16(local_19c8._7_1_,uVar16));
    local_978._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_978._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_978._6_2_ = (short)((ulong)local_988 >> 0x30);
    uStack_970._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_970._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_970._6_2_ = (short)((ulong)uStack_980 >> 0x30);
    sVar190 = CONCAT11((char)local_1718,(undefined1)local_19c8) * 2;
    local_978._2_2_ = local_978._2_2_ * 2;
    local_978._4_2_ = local_978._4_2_ * 2;
    local_978._6_2_ = local_978._6_2_ * 2;
    sVar238 = CONCAT11(local_1718._4_1_,local_19c8._4_1_) * 2;
    uStack_970._2_2_ = uStack_970._2_2_ * 2;
    uStack_970._4_2_ = uStack_970._4_2_ * 2;
    uStack_970._6_2_ = uStack_970._6_2_ * 2;
    local_5f8 = CONCAT26(sVar220,CONCAT24(sVar209,CONCAT22(sVar199,sVar180)));
    uStack_5f0 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1a08._1_1_,CONCAT11((char)local_1718,(undefined1)local_1a08)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1a08._2_1_,uVar9));
    uVar71 = CONCAT17(local_1718._3_1_,CONCAT16(local_1a08._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1a08._5_1_,CONCAT11(local_1718._4_1_,local_1a08._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_1a08._6_1_,uVar15));
    uVar76 = CONCAT17(local_1718._7_1_,CONCAT16(local_1a08._7_1_,uVar16));
    local_608._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_608._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_608._6_2_ = (short)((ulong)uVar71 >> 0x30);
    uStack_600._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_600._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_600._6_2_ = (short)((ulong)uVar76 >> 0x30);
    local_1fc8._0_4_ =
         CONCAT22(sVar199 - local_608._2_2_,
                  sVar180 - CONCAT11((char)local_1718,(undefined1)local_1a08));
    local_1fc8._0_6_ = CONCAT24(sVar209 - local_608._4_2_,(undefined4)local_1fc8);
    local_1fc8 = CONCAT26(sVar220 - local_608._6_2_,(undefined6)local_1fc8);
    uVar277 = CONCAT26(sVar268 - uStack_600._6_2_,
                       CONCAT24(sVar258 - uStack_600._4_2_,
                                CONCAT22(sVar246 - uStack_600._2_2_,
                                         sVar230 - CONCAT11(local_1718._4_1_,local_1a08._4_1_))));
    local_618 = CONCAT26(sVar220,CONCAT24(sVar209,CONCAT22(sVar199,sVar180)));
    uStack_610 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
    uStack_620 = 0;
    local_628._2_2_ = (short)((uint)uVar73 >> 0x10);
    local_628._4_2_ = (short)((uint6)uVar74 >> 0x20);
    local_628._6_2_ = (short)((ulong)uVar72 >> 0x30);
    sVar182 = sVar180 - CONCAT11(local_1718._4_1_,local_1a08._4_1_);
    sVar201 = sVar199 - local_628._2_2_;
    sVar211 = sVar209 - local_628._4_2_;
    sVar222 = sVar220 - local_628._6_2_;
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1968._1_1_,CONCAT11((char)local_1718,(undefined1)local_1968)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1968._2_1_,uVar9));
    uVar12 = CONCAT17(local_1718._3_1_,CONCAT16(local_1968._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1968._5_1_,CONCAT11(local_1718._4_1_,local_1968._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_1968._6_1_,uVar15));
    uVar21 = CONCAT17(local_1718._7_1_,CONCAT16(local_1968._7_1_,uVar16));
    uVar18 = CONCAT13(local_1718._1_1_,
                      CONCAT12(local_1a28._1_1_,CONCAT11((char)local_1718,(undefined1)local_1a28)));
    uVar19 = CONCAT15(local_1718._2_1_,CONCAT14(local_1a28._2_1_,uVar18));
    uVar77 = CONCAT17(local_1718._3_1_,CONCAT16(local_1a28._3_1_,uVar19));
    uVar24 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1a28._5_1_,CONCAT11(local_1718._4_1_,local_1a28._4_1_)));
    uVar25 = CONCAT15(local_1718._6_1_,CONCAT14(local_1a28._6_1_,uVar24));
    uVar78 = CONCAT17(local_1718._7_1_,CONCAT16(local_1a28._7_1_,uVar25));
    local_998._2_2_ = (short)((uint)uVar18 >> 0x10);
    local_998._4_2_ = (short)((uint6)uVar19 >> 0x20);
    local_998._6_2_ = (short)((ulong)uVar77 >> 0x30);
    uStack_990._2_2_ = (short)((uint)uVar24 >> 0x10);
    uStack_990._4_2_ = (short)((uint6)uVar25 >> 0x20);
    uStack_990._6_2_ = (short)((ulong)uVar78 >> 0x30);
    local_9a8._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_9a8._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_9a8._6_2_ = (short)((ulong)uVar12 >> 0x30);
    uStack_9a0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_9a0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_9a0._6_2_ = (short)((ulong)uVar21 >> 0x30);
    local_9b8 = CONCAT11((char)local_1718,(undefined1)local_1a28) +
                CONCAT11((char)local_1718,(undefined1)local_1968);
    sStack_9b6 = local_998._2_2_ + local_9a8._2_2_;
    sStack_9b4 = local_998._4_2_ + local_9a8._4_2_;
    sStack_9b2 = local_998._6_2_ + local_9a8._6_2_;
    sStack_9b0 = CONCAT11(local_1718._4_1_,local_1a28._4_1_) +
                 CONCAT11(local_1718._4_1_,local_1968._4_1_);
    sStack_9ae = uStack_990._2_2_ + uStack_9a0._2_2_;
    sStack_9ac = uStack_990._4_2_ + uStack_9a0._4_2_;
    sStack_9aa = uStack_990._6_2_ + uStack_9a0._6_2_;
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1988._1_1_,CONCAT11((char)local_1718,(undefined1)local_1988)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1988._2_1_,uVar9));
    uVar26 = CONCAT17(local_1718._3_1_,CONCAT16(local_1988._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1988._5_1_,CONCAT11(local_1718._4_1_,local_1988._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_1988._6_1_,uVar15));
    uVar37 = CONCAT17(local_1718._7_1_,CONCAT16(local_1988._7_1_,uVar16));
    local_9c8._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_9c8._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_9c8._6_2_ = (short)((ulong)uVar26 >> 0x30);
    uStack_9c0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_9c0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_9c0._6_2_ = (short)((ulong)uVar37 >> 0x30);
    sVar183 = local_9b8 + CONCAT11((char)local_1718,(undefined1)local_1988);
    sVar202 = sStack_9b6 + local_9c8._2_2_;
    sVar212 = sStack_9b4 + local_9c8._4_2_;
    sVar223 = sStack_9b2 + local_9c8._6_2_;
    sVar232 = sStack_9b0 + CONCAT11(local_1718._4_1_,local_1988._4_1_);
    sVar248 = sStack_9ae + uStack_9c0._2_2_;
    sVar260 = sStack_9ac + uStack_9c0._4_2_;
    sVar270 = sStack_9aa + uStack_9c0._6_2_;
    local_a18 = CONCAT26(sVar227,CONCAT24(sVar216,CONCAT22(sVar206,sVar192)));
    uStack_a10 = CONCAT26(sVar274,CONCAT24(sVar264,CONCAT22(sVar252,sVar239)));
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1968._1_1_,CONCAT11((char)local_1718,(undefined1)local_1968)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1968._2_1_,uVar9));
    uVar13 = CONCAT17(local_1718._3_1_,CONCAT16(local_1968._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1968._5_1_,CONCAT11(local_1718._4_1_,local_1968._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_1968._6_1_,uVar15));
    uVar22 = CONCAT17(local_1718._7_1_,CONCAT16(local_1968._7_1_,uVar16));
    uVar18 = CONCAT13(local_1718._1_1_,
                      CONCAT12(local_1988._1_1_,CONCAT11((char)local_1718,(undefined1)local_1988)));
    uVar19 = CONCAT15(local_1718._2_1_,CONCAT14(local_1988._2_1_,uVar18));
    uVar27 = CONCAT17(local_1718._3_1_,CONCAT16(local_1988._3_1_,uVar19));
    uVar24 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1988._5_1_,CONCAT11(local_1718._4_1_,local_1988._4_1_)));
    uVar25 = CONCAT15(local_1718._6_1_,CONCAT14(local_1988._6_1_,uVar24));
    uVar38 = CONCAT17(local_1718._7_1_,CONCAT16(local_1988._7_1_,uVar25));
    uVar35 = CONCAT13(local_1718._1_1_,
                      CONCAT12(local_19a8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19a8)));
    uVar36 = CONCAT15(local_1718._2_1_,CONCAT14(local_19a8._2_1_,uVar35));
    uVar44 = CONCAT17(local_1718._3_1_,CONCAT16(local_19a8._3_1_,uVar36));
    uVar42 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19a8._5_1_,CONCAT11(local_1718._4_1_,local_19a8._4_1_)));
    uVar43 = CONCAT15(local_1718._6_1_,CONCAT14(local_19a8._6_1_,uVar42));
    uVar53 = CONCAT17(local_1718._7_1_,CONCAT16(local_19a8._7_1_,uVar43));
    local_9d8._2_2_ = (short)((uint)uVar35 >> 0x10);
    local_9d8._4_2_ = (short)((uint6)uVar36 >> 0x20);
    local_9d8._6_2_ = (short)((ulong)uVar44 >> 0x30);
    uStack_9d0._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_9d0._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_9d0._6_2_ = (short)((ulong)uVar53 >> 0x30);
    local_9e8._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_9e8._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_9e8._6_2_ = (short)((ulong)uVar13 >> 0x30);
    uStack_9e0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_9e0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_9e0._6_2_ = (short)((ulong)uVar22 >> 0x30);
    local_a08 = CONCAT11((char)local_1718,(undefined1)local_19a8) +
                CONCAT11((char)local_1718,(undefined1)local_1968);
    sStack_a06 = local_9d8._2_2_ + local_9e8._2_2_;
    sStack_a04 = local_9d8._4_2_ + local_9e8._4_2_;
    sStack_a02 = local_9d8._6_2_ + local_9e8._6_2_;
    sStack_a00 = CONCAT11(local_1718._4_1_,local_19a8._4_1_) +
                 CONCAT11(local_1718._4_1_,local_1968._4_1_);
    sStack_9fe = uStack_9d0._2_2_ + uStack_9e0._2_2_;
    sStack_9fc = uStack_9d0._4_2_ + uStack_9e0._4_2_;
    sStack_9fa = uStack_9d0._6_2_ + uStack_9e0._6_2_;
    local_9f8._2_2_ = (short)((uint)uVar18 >> 0x10);
    local_9f8._4_2_ = (short)((uint6)uVar19 >> 0x20);
    local_9f8._6_2_ = (short)((ulong)uVar27 >> 0x30);
    uStack_9f0._2_2_ = (short)((uint)uVar24 >> 0x10);
    uStack_9f0._4_2_ = (short)((uint6)uVar25 >> 0x20);
    uStack_9f0._6_2_ = (short)((ulong)uVar38 >> 0x30);
    local_a28 = CONCAT11((char)local_1718,(undefined1)local_1988) + local_a08;
    sStack_a26 = local_9f8._2_2_ + sStack_a06;
    sStack_a24 = local_9f8._4_2_ + sStack_a04;
    sStack_a22 = local_9f8._6_2_ + sStack_a02;
    sStack_a20 = CONCAT11(local_1718._4_1_,local_1988._4_1_) + sStack_a00;
    sStack_a1e = uStack_9f0._2_2_ + sStack_9fe;
    sStack_a1c = uStack_9f0._4_2_ + sStack_9fc;
    sStack_a1a = uStack_9f0._6_2_ + sStack_9fa;
    sVar184 = sVar192 + local_a28;
    sVar203 = sVar206 + sStack_a26;
    sVar213 = sVar216 + sStack_a24;
    sVar224 = sVar227 + sStack_a22;
    sVar233 = sVar239 + sStack_a20;
    sVar249 = sVar252 + sStack_a1e;
    sVar261 = sVar264 + sStack_a1c;
    sVar271 = sVar274 + sStack_a1a;
    local_638 = CONCAT26(sVar221,CONCAT24(sVar210,CONCAT22(sVar200,sVar181)));
    uStack_630 = CONCAT26(sVar269,CONCAT24(sVar259,CONCAT22(sVar247,sVar231)));
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_19a8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19a8)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_19a8._2_1_,uVar9));
    uVar45 = CONCAT17(local_1718._3_1_,CONCAT16(local_19a8._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19a8._5_1_,CONCAT11(local_1718._4_1_,local_19a8._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_19a8._6_1_,uVar15));
    uVar54 = CONCAT17(local_1718._7_1_,CONCAT16(local_19a8._7_1_,uVar16));
    local_648._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_648._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_648._6_2_ = (short)((ulong)uVar45 >> 0x30);
    uStack_640._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_640._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_640._6_2_ = (short)((ulong)uVar54 >> 0x30);
    sVar185 = sVar181 - CONCAT11((char)local_1718,(undefined1)local_19a8);
    local_648._2_2_ = sVar200 - local_648._2_2_;
    local_648._4_2_ = sVar210 - local_648._4_2_;
    local_648._6_2_ = sVar221 - local_648._6_2_;
    sVar234 = sVar231 - CONCAT11(local_1718._4_1_,local_19a8._4_1_);
    uStack_640._2_2_ = sVar247 - uStack_640._2_2_;
    uStack_640._4_2_ = sVar259 - uStack_640._4_2_;
    uStack_640._6_2_ = sVar269 - uStack_640._6_2_;
    local_a78 = CONCAT26(local_648._6_2_,CONCAT24(local_648._4_2_,CONCAT22(local_648._2_2_,sVar185))
                        );
    uStack_a70 = CONCAT26(uStack_640._6_2_,
                          CONCAT24(uStack_640._4_2_,CONCAT22(uStack_640._2_2_,sVar234)));
    local_658 = CONCAT26(sVar221,CONCAT24(sVar210,CONCAT22(sVar200,sVar181)));
    uStack_650 = CONCAT26(sVar269,CONCAT24(sVar259,CONCAT22(sVar247,sVar231)));
    uStack_660 = 0;
    local_668._2_2_ = (short)((uint)uVar48 >> 0x10);
    sVar172 = local_668._2_2_;
    local_668._4_2_ = (short)((uint6)uVar49 >> 0x20);
    sVar173 = local_668._4_2_;
    local_668._6_2_ = (short)((ulong)uVar47 >> 0x30);
    sVar174 = local_668._6_2_;
    sVar186 = sVar181 - sVar255;
    local_668._2_2_ = sVar200 - local_668._2_2_;
    local_668._4_2_ = sVar210 - local_668._4_2_;
    local_668._6_2_ = sVar221 - local_668._6_2_;
    local_a38 = CONCAT26(local_978._6_2_,CONCAT24(local_978._4_2_,CONCAT22(local_978._2_2_,sVar190))
                        );
    uStack_a30 = CONCAT26(uStack_970._6_2_,
                          CONCAT24(uStack_970._4_2_,CONCAT22(uStack_970._2_2_,sVar238)));
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1988._1_1_,CONCAT11((char)local_1718,(undefined1)local_1988)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1988._2_1_,uVar9));
    uVar28 = CONCAT17(local_1718._3_1_,CONCAT16(local_1988._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1988._5_1_,CONCAT11(local_1718._4_1_,local_1988._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_1988._6_1_,uVar15));
    uVar39 = CONCAT17(local_1718._7_1_,CONCAT16(local_1988._7_1_,uVar16));
    local_a48._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_a48._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_a48._6_2_ = (short)((ulong)uVar28 >> 0x30);
    uStack_a40._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_a40._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_a40._6_2_ = (short)((ulong)uVar39 >> 0x30);
    sVar187 = sVar190 + CONCAT11((char)local_1718,(undefined1)local_1988);
    sVar235 = sVar238 + CONCAT11(local_1718._4_1_,local_1988._4_1_);
    uStack_a40._2_2_ = uStack_970._2_2_ + uStack_a40._2_2_;
    uStack_a40._4_2_ = uStack_970._4_2_ + uStack_a40._4_2_;
    uStack_a40._6_2_ = uStack_970._6_2_ + uStack_a40._6_2_;
    local_a58 = CONCAT26(local_668._6_2_,CONCAT24(local_668._4_2_,CONCAT22(local_668._2_2_,sVar186))
                        );
    uStack_a50 = CONCAT26(sVar269,CONCAT24(sVar259,CONCAT22(sVar247,sVar231)));
    local_a68 = CONCAT26(local_978._6_2_ + local_a48._6_2_,
                         CONCAT24(local_978._4_2_ + local_a48._4_2_,
                                  CONCAT22(local_978._2_2_ + local_a48._2_2_,sVar187)));
    uStack_a60 = CONCAT26(uStack_a40._6_2_,
                          CONCAT24(uStack_a40._4_2_,CONCAT22(uStack_a40._2_2_,sVar235)));
    uVar188 = sVar186 + sVar187;
    uVar204 = local_668._2_2_ + local_978._2_2_ + local_a48._2_2_;
    uVar214 = local_668._4_2_ + local_978._4_2_ + local_a48._4_2_;
    uVar225 = local_668._6_2_ + local_978._6_2_ + local_a48._6_2_;
    local_a88 = CONCAT26(uStack_a40._6_2_,
                         CONCAT24(uStack_a40._4_2_,CONCAT22(uStack_a40._2_2_,sVar235)));
    uStack_a80 = 0;
    local_1848 = CONCAT26(sVar221 + sStack_902,
                          CONCAT24(sVar210 + sStack_904,
                                   CONCAT22(sVar200 + sStack_906,sVar181 + local_908)));
    uStack_1840 = CONCAT26(sVar269 + sStack_8fa,
                           CONCAT24(sVar259 + sStack_8fc,
                                    CONCAT22(sVar247 + sStack_8fe,sVar231 + sStack_900)));
    local_1858 = CONCAT26(sVar221 + sStack_942,
                          CONCAT24(sVar210 + sStack_944,
                                   CONCAT22(sVar200 + sStack_946,sVar181 + local_948)));
    uStack_1850 = CONCAT26(sVar269,CONCAT24(sVar259,CONCAT22(sVar247,sVar231)));
    local_13cc = 3;
    uVar189 = (ushort)(sVar181 + local_908) >> 3;
    uVar205 = (ushort)(sVar200 + sStack_906) >> 3;
    uVar215 = (ushort)(sVar210 + sStack_904) >> 3;
    uVar226 = (ushort)(sVar221 + sStack_902) >> 3;
    uVar236 = (ushort)(sVar181 + local_948) >> 3;
    uVar250 = (ushort)(sVar200 + sStack_946) >> 3;
    uVar262 = (ushort)(sVar210 + sStack_944) >> 3;
    uVar272 = (ushort)(sVar221 + sStack_942) >> 3;
    local_1c48._0_4_ = CONCAT22(uVar205,uVar189);
    local_1c48._0_6_ = CONCAT24(uVar215,(undefined4)local_1c48);
    local_1c48 = CONCAT26(uVar226,(undefined6)local_1c48);
    uStack_1c40._0_4_ = CONCAT22(uVar250,uVar236);
    uStack_1c40._0_6_ = CONCAT24(uVar262,(undefined4)uStack_1c40);
    uStack_1c40 = CONCAT26(uVar272,(undefined6)uStack_1c40);
    local_1868 = CONCAT26(uVar225,CONCAT24(uVar214,CONCAT22(uVar204,uVar188)));
    uStack_1860 = CONCAT26(sVar269 + uStack_a40._6_2_,
                           CONCAT24(sVar259 + uStack_a40._4_2_,
                                    CONCAT22(sVar247 + uStack_a40._2_2_,sVar231 + sVar235)));
    local_1878 = CONCAT26(local_648._6_2_ + uStack_a40._6_2_,
                          CONCAT24(local_648._4_2_ + uStack_a40._4_2_,
                                   CONCAT22(local_648._2_2_ + uStack_a40._2_2_,sVar185 + sVar235)));
    uStack_1870 = CONCAT26(uStack_640._6_2_,
                           CONCAT24(uStack_640._4_2_,CONCAT22(uStack_640._2_2_,sVar234)));
    local_13ec = 3;
    uVar188 = uVar188 >> 3;
    uVar204 = uVar204 >> 3;
    uVar214 = uVar214 >> 3;
    uVar225 = uVar225 >> 3;
    uVar237 = (ushort)(sVar185 + sVar235) >> 3;
    uVar251 = (ushort)(local_648._2_2_ + uStack_a40._2_2_) >> 3;
    uVar263 = (ushort)(local_648._4_2_ + uStack_a40._4_2_) >> 3;
    uVar273 = (ushort)(local_648._6_2_ + uStack_a40._6_2_) >> 3;
    local_1c38._0_4_ = CONCAT22(uVar204,uVar188);
    local_1c38._0_6_ = CONCAT24(uVar214,(undefined4)local_1c38);
    local_1c38 = CONCAT26(uVar225,(undefined6)local_1c38);
    uStack_1c30._0_4_ = CONCAT22(uVar251,uVar237);
    uStack_1c30._0_6_ = CONCAT24(uVar263,(undefined4)uStack_1c30);
    uStack_1c30 = CONCAT26(uVar273,(undefined6)uStack_1c30);
    local_68 = local_1c48;
    uStack_60 = uStack_1c40;
    local_78 = local_1c48;
    uStack_70 = uStack_1c40;
    local_1c48._0_4_ =
         CONCAT13((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                  CONCAT12((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                           CONCAT11((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 -
                                    (0xff < uVar205),
                                    (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                    (0xff < uVar189))));
    local_1c48._0_6_ =
         CONCAT15((uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250),
                  CONCAT14((uVar236 != 0) * (uVar236 < 0x100) * (char)uVar236 - (0xff < uVar236),
                           (undefined4)local_1c48));
    local_1c48 = CONCAT17((uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272),
                          CONCAT16((uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 -
                                   (0xff < uVar262),(undefined6)local_1c48));
    uStack_1c40._0_4_ =
         CONCAT13((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                  CONCAT12((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                           CONCAT11((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 -
                                    (0xff < uVar205),
                                    (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                    (0xff < uVar189))));
    uStack_1c40._0_6_ =
         CONCAT15((uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250),
                  CONCAT14((uVar236 != 0) * (uVar236 < 0x100) * (char)uVar236 - (0xff < uVar236),
                           (undefined4)uStack_1c40));
    uStack_1c40 = CONCAT17((uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272),
                           CONCAT16((uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 -
                                    (0xff < uVar262),(undefined6)uStack_1c40));
    local_88 = local_1c38;
    uStack_80 = uStack_1c30;
    local_98 = local_1c38;
    uStack_90 = uStack_1c30;
    local_1c38._0_4_ =
         CONCAT13((uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225),
                  CONCAT12((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                           CONCAT11((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 -
                                    (0xff < uVar204),
                                    (uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 -
                                    (0xff < uVar188))));
    local_1c38._0_6_ =
         CONCAT15((uVar251 != 0) * (uVar251 < 0x100) * (char)uVar251 - (0xff < uVar251),
                  CONCAT14((uVar237 != 0) * (uVar237 < 0x100) * (char)uVar237 - (0xff < uVar237),
                           (undefined4)local_1c38));
    local_1c38 = CONCAT17((uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273),
                          CONCAT16((uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 -
                                   (0xff < uVar263),(undefined6)local_1c38));
    uStack_1c30._0_4_ =
         CONCAT13((uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225),
                  CONCAT12((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                           CONCAT11((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 -
                                    (0xff < uVar204),
                                    (uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 -
                                    (0xff < uVar188))));
    uStack_1c30._0_6_ =
         CONCAT15((uVar251 != 0) * (uVar251 < 0x100) * (char)uVar251 - (0xff < uVar251),
                  CONCAT14((uVar237 != 0) * (uVar237 < 0x100) * (char)uVar237 - (0xff < uVar237),
                           (undefined4)uStack_1c30));
    uStack_1c30 = CONCAT17((uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273),
                           CONCAT16((uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 -
                                    (0xff < uVar263),(undefined6)uStack_1c30));
    local_678 = CONCAT26(local_668._6_2_,CONCAT24(local_668._4_2_,CONCAT22(local_668._2_2_,sVar186))
                        );
    uStack_670 = CONCAT26(sVar269,CONCAT24(sVar259,CONCAT22(sVar247,sVar231)));
    uStack_680 = 0;
    local_688._2_2_ = (short)((uint)uVar32 >> 0x10);
    sVar181 = local_688._2_2_;
    local_688._4_2_ = (short)((uint6)uVar33 >> 0x20);
    sVar187 = local_688._4_2_;
    local_688._6_2_ = (short)((ulong)uVar30 >> 0x30);
    sVar200 = local_688._6_2_;
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_1988._1_1_,CONCAT11((char)local_1718,(undefined1)local_1988)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_1988._2_1_,uVar9));
    uVar29 = CONCAT17(local_1718._3_1_,CONCAT16(local_1988._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_1988._5_1_,CONCAT11(local_1718._4_1_,local_1988._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_1988._6_1_,uVar15));
    uVar40 = CONCAT17(local_1718._7_1_,CONCAT16(local_1988._7_1_,uVar16));
    local_6a8._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_6a8._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_6a8._6_2_ = (short)((ulong)uVar29 >> 0x30);
    uStack_6a0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_6a0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_6a0._6_2_ = (short)((ulong)uVar40 >> 0x30);
    sVar185 = sVar185 - CONCAT11((char)local_1718,(undefined1)local_1988);
    sVar234 = sVar234 - CONCAT11(local_1718._4_1_,local_1988._4_1_);
    local_af8 = CONCAT26(local_648._6_2_ - local_6a8._6_2_,
                         CONCAT24(local_648._4_2_ - local_6a8._4_2_,
                                  CONCAT22(local_648._2_2_ - local_6a8._2_2_,sVar185)));
    uStack_af0 = CONCAT26(uStack_640._6_2_ - uStack_6a0._6_2_,
                          CONCAT24(uStack_640._4_2_ - uStack_6a0._4_2_,
                                   CONCAT22(uStack_640._2_2_ - uStack_6a0._2_2_,sVar234)));
    local_a98 = CONCAT26(local_978._6_2_,CONCAT24(local_978._4_2_,CONCAT22(local_978._2_2_,sVar190))
                        );
    uStack_a90 = CONCAT26(uStack_970._6_2_,
                          CONCAT24(uStack_970._4_2_,CONCAT22(uStack_970._2_2_,sVar238)));
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_19c8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19c8)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_19c8._2_1_,uVar9));
    uVar58 = CONCAT17(local_1718._3_1_,CONCAT16(local_19c8._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19c8._5_1_,CONCAT11(local_1718._4_1_,local_19c8._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_19c8._6_1_,uVar15));
    uVar64 = CONCAT17(local_1718._7_1_,CONCAT16(local_19c8._7_1_,uVar16));
    local_aa8._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_aa8._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_aa8._6_2_ = (short)((ulong)uVar58 >> 0x30);
    uStack_aa0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_aa0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_aa0._6_2_ = (short)((ulong)uVar64 >> 0x30);
    sVar190 = sVar190 + CONCAT11((char)local_1718,(undefined1)local_19c8);
    sVar238 = sVar238 + CONCAT11(local_1718._4_1_,local_19c8._4_1_);
    local_ab8 = CONCAT26(local_978._6_2_ + local_aa8._6_2_,
                         CONCAT24(local_978._4_2_ + local_aa8._4_2_,
                                  CONCAT22(local_978._2_2_ + local_aa8._2_2_,sVar190)));
    uStack_ab0 = CONCAT26(uStack_970._6_2_ + uStack_aa0._6_2_,
                          CONCAT24(uStack_970._4_2_ + uStack_aa0._4_2_,
                                   CONCAT22(uStack_970._2_2_ + uStack_aa0._2_2_,sVar238)));
    uVar9 = CONCAT13(local_1718._1_1_,
                     CONCAT12(local_19a8._1_1_,CONCAT11((char)local_1718,(undefined1)local_19a8)));
    uVar10 = CONCAT15(local_1718._2_1_,CONCAT14(local_19a8._2_1_,uVar9));
    uVar46 = CONCAT17(local_1718._3_1_,CONCAT16(local_19a8._3_1_,uVar10));
    uVar15 = CONCAT13(local_1718._5_1_,
                      CONCAT12(local_19a8._5_1_,CONCAT11(local_1718._4_1_,local_19a8._4_1_)));
    uVar16 = CONCAT15(local_1718._6_1_,CONCAT14(local_19a8._6_1_,uVar15));
    uVar55 = CONCAT17(local_1718._7_1_,CONCAT16(local_19a8._7_1_,uVar16));
    local_ac8._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_ac8._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_ac8._6_2_ = (short)((ulong)uVar46 >> 0x30);
    uStack_ac0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_ac0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_ac0._6_2_ = (short)((ulong)uVar55 >> 0x30);
    sVar190 = sVar190 + CONCAT11((char)local_1718,(undefined1)local_19a8);
    local_ac8._2_2_ = local_978._2_2_ + local_aa8._2_2_ + local_ac8._2_2_;
    local_ac8._4_2_ = local_978._4_2_ + local_aa8._4_2_ + local_ac8._4_2_;
    local_ac8._6_2_ = local_978._6_2_ + local_aa8._6_2_ + local_ac8._6_2_;
    sVar238 = sVar238 + CONCAT11(local_1718._4_1_,local_19a8._4_1_);
    uStack_ac0._2_2_ = uStack_970._2_2_ + uStack_aa0._2_2_ + uStack_ac0._2_2_;
    uStack_ac0._4_2_ = uStack_970._4_2_ + uStack_aa0._4_2_ + uStack_ac0._4_2_;
    uStack_ac0._6_2_ = uStack_970._6_2_ + uStack_aa0._6_2_ + uStack_ac0._6_2_;
    local_ad8 = CONCAT26(local_668._6_2_ - local_688._6_2_,
                         CONCAT24(local_668._4_2_ - local_688._4_2_,
                                  CONCAT22(local_668._2_2_ - local_688._2_2_,sVar186 - sVar31)));
    uStack_ad0 = CONCAT26(sVar269,CONCAT24(sVar259,CONCAT22(sVar247,sVar231)));
    local_ae8 = CONCAT26(local_ac8._6_2_,CONCAT24(local_ac8._4_2_,CONCAT22(local_ac8._2_2_,sVar190))
                        );
    uStack_ae0 = CONCAT26(uStack_ac0._6_2_,
                          CONCAT24(uStack_ac0._4_2_,CONCAT22(uStack_ac0._2_2_,sVar238)));
    uVar188 = (sVar186 - sVar31) + sVar190;
    uVar204 = (local_668._2_2_ - local_688._2_2_) + local_ac8._2_2_;
    uVar214 = (local_668._4_2_ - local_688._4_2_) + local_ac8._4_2_;
    uVar225 = (local_668._6_2_ - local_688._6_2_) + local_ac8._6_2_;
    local_b08 = CONCAT26(uStack_ac0._6_2_,
                         CONCAT24(uStack_ac0._4_2_,CONCAT22(uStack_ac0._2_2_,sVar238)));
    uStack_b00 = 0;
    uVar189 = sVar185 + sVar238;
    uVar205 = (local_648._2_2_ - local_6a8._2_2_) + uStack_ac0._2_2_;
    uVar215 = (local_648._4_2_ - local_6a8._4_2_) + uStack_ac0._4_2_;
    uVar226 = (local_648._6_2_ - local_6a8._6_2_) + uStack_ac0._6_2_;
    local_1888 = CONCAT26(uVar225,CONCAT24(uVar214,CONCAT22(uVar204,uVar188)));
    uStack_1880 = CONCAT26(sVar269 + uStack_ac0._6_2_,
                           CONCAT24(sVar259 + uStack_ac0._4_2_,
                                    CONCAT22(sVar247 + uStack_ac0._2_2_,sVar231 + sVar238)));
    local_1898 = CONCAT26(uVar226,CONCAT24(uVar215,CONCAT22(uVar205,uVar189)));
    uStack_1890 = CONCAT26(uStack_640._6_2_ - uStack_6a0._6_2_,
                           CONCAT24(uStack_640._4_2_ - uStack_6a0._4_2_,
                                    CONCAT22(uStack_640._2_2_ - uStack_6a0._2_2_,sVar234)));
    local_140c = 3;
    uVar188 = uVar188 >> 3;
    uVar204 = uVar204 >> 3;
    uVar214 = uVar214 >> 3;
    uVar225 = uVar225 >> 3;
    uVar189 = uVar189 >> 3;
    uVar205 = uVar205 >> 3;
    uVar215 = uVar215 >> 3;
    uVar226 = uVar226 >> 3;
    local_1c28._0_4_ = CONCAT22(uVar204,uVar188);
    local_1c28._0_6_ = CONCAT24(uVar214,(undefined4)local_1c28);
    local_1c28 = CONCAT26(uVar225,(undefined6)local_1c28);
    uStack_1c20._0_4_ = CONCAT22(uVar205,uVar189);
    uStack_1c20._0_6_ = CONCAT24(uVar215,(undefined4)uStack_1c20);
    uStack_1c20 = CONCAT26(uVar226,(undefined6)uStack_1c20);
    local_a8 = local_1c28;
    uStack_a0 = uStack_1c20;
    local_b8 = local_1c28;
    uStack_b0 = uStack_1c20;
    local_1c28._0_4_ =
         CONCAT13((uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225),
                  CONCAT12((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                           CONCAT11((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 -
                                    (0xff < uVar204),
                                    (uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 -
                                    (0xff < uVar188))));
    local_1c28._0_6_ =
         CONCAT15((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205),
                  CONCAT14((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189),
                           (undefined4)local_1c28));
    local_1c28 = CONCAT17((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                          CONCAT16((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 -
                                   (0xff < uVar215),(undefined6)local_1c28));
    uStack_1c20._0_4_ =
         CONCAT13((uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225),
                  CONCAT12((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                           CONCAT11((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 -
                                    (0xff < uVar204),
                                    (uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 -
                                    (0xff < uVar188))));
    uStack_1c20._0_6_ =
         CONCAT15((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205),
                  CONCAT14((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189),
                           (undefined4)uStack_1c20));
    uStack_1c20 = CONCAT17((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                           CONCAT16((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 -
                                    (0xff < uVar215),(undefined6)uStack_1c20));
    b_05[1]._0_2_ = uVar191;
    b_05[1]._2_6_ = 0;
    uVar177 = (ulong)uVar191;
    a_04[1] = (longlong)x3_00;
    a_04[0] = (longlong)palVar178;
    local_1a28 = lVar7;
    local_1a08 = lVar6;
    local_19e8 = lVar5;
    local_19c8 = lVar4;
    local_19a8 = lVar3;
    local_1988 = lVar2;
    local_1968 = lVar1;
    local_1408 = local_1888;
    uStack_1400 = local_1898;
    local_13e8 = local_1868;
    uStack_13e0 = local_1878;
    local_13c8 = local_1848;
    uStack_13c0 = local_1858;
    local_ac8 = uVar46;
    uStack_ac0 = uVar55;
    local_aa8 = uVar58;
    uStack_aa0 = uVar64;
    local_a48 = uVar28;
    uStack_a40 = uVar39;
    local_9f8 = uVar27;
    uStack_9f0 = uVar38;
    local_9e8 = uVar13;
    uStack_9e0 = uVar22;
    local_9d8 = uVar44;
    uStack_9d0 = uVar53;
    local_9c8 = uVar26;
    uStack_9c0 = uVar37;
    local_9a8 = uVar12;
    uStack_9a0 = uVar21;
    local_998 = uVar77;
    uStack_990 = uVar78;
    local_978 = local_988;
    uStack_970 = uStack_980;
    local_958 = local_968;
    uStack_950 = uStack_960;
    local_928 = uVar14;
    local_918 = uVar59;
    local_8e8 = uVar11;
    uStack_8e0 = uVar20;
    local_8d8 = uVar57;
    uStack_8d0 = uVar63;
    local_818 = uVar8;
    uStack_810 = uVar17;
    local_808 = uVar23;
    uStack_800 = uVar34;
    local_7f8 = uVar41;
    uStack_7f0 = uVar50;
    local_7d8 = uVar70;
    uStack_7d0 = uVar75;
    local_7c8 = uVar56;
    uStack_7c0 = uVar62;
    local_7b8 = uVar65;
    uStack_7b0 = uVar69;
    local_6a8 = uVar29;
    uStack_6a0 = uVar40;
    local_698 = local_a78;
    uStack_690 = uStack_a70;
    local_688 = uVar30;
    local_668 = uVar47;
    local_648 = uVar45;
    uStack_640 = uVar54;
    local_628 = uVar72;
    local_608 = uVar71;
    uStack_600 = uVar76;
    local_58 = local_878;
    uStack_50 = uStack_870;
    local_38 = local_8b8;
    uStack_30 = uStack_8b0;
    alVar276 = abs_diff(a_04,b_05);
    b_06[0] = alVar276[1];
    b_06[1] = uVar177;
    a_05[1] = (longlong)x3_00;
    a_05[0] = (longlong)palVar178;
    alVar276 = abs_diff(a_05,b_06);
    b_07[0] = alVar276[1];
    local_1628 = (byte)extraout_XMM0_Qa_05;
    bStack_1627 = (byte)((ulong)extraout_XMM0_Qa_05 >> 8);
    bStack_1626 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x10);
    bStack_1625 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x18);
    bStack_1624 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x20);
    bStack_1623 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x28);
    bStack_1622 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x30);
    bStack_1621 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x38);
    bStack_1620 = (byte)extraout_XMM0_Qb_05;
    bStack_161f = (byte)((ulong)extraout_XMM0_Qb_05 >> 8);
    bStack_161e = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x10);
    bStack_161d = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x18);
    bStack_161c = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x20);
    bStack_161b = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x28);
    bStack_161a = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x30);
    bStack_1619 = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x38);
    local_1638 = (byte)extraout_XMM0_Qa_06;
    bStack_1637 = (byte)((ulong)extraout_XMM0_Qa_06 >> 8);
    bStack_1636 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x10);
    bStack_1635 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x18);
    bStack_1634 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x20);
    bStack_1633 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x28);
    bStack_1632 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x30);
    bStack_1631 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x38);
    bStack_1630 = (byte)extraout_XMM0_Qb_06;
    bStack_162f = (byte)((ulong)extraout_XMM0_Qb_06 >> 8);
    bStack_162e = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x10);
    bStack_162d = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x18);
    bStack_162c = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x20);
    bStack_162b = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x28);
    bStack_162a = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x30);
    bStack_1629 = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x38);
    local_1bb8[1] =
         (bStack_1627 < bStack_1637) * bStack_1637 | (bStack_1627 >= bStack_1637) * bStack_1627;
    local_1bb8[0] = (local_1628 < local_1638) * local_1638 | (local_1628 >= local_1638) * local_1628
    ;
    local_1bb8[2] =
         (bStack_1626 < bStack_1636) * bStack_1636 | (bStack_1626 >= bStack_1636) * bStack_1626;
    local_1bb8[3] =
         (bStack_1625 < bStack_1635) * bStack_1635 | (bStack_1625 >= bStack_1635) * bStack_1625;
    local_1bb8[4] =
         (bStack_1624 < bStack_1634) * bStack_1634 | (bStack_1624 >= bStack_1634) * bStack_1624;
    local_1bb8[5] =
         (bStack_1623 < bStack_1633) * bStack_1633 | (bStack_1623 >= bStack_1633) * bStack_1623;
    local_1bb8[6] =
         (bStack_1622 < bStack_1632) * bStack_1632 | (bStack_1622 >= bStack_1632) * bStack_1622;
    local_1bb8[7] =
         (bStack_1621 < bStack_1631) * bStack_1631 | (bStack_1621 >= bStack_1631) * bStack_1621;
    local_1bb8[8] =
         (bStack_1620 < bStack_1630) * bStack_1630 | (bStack_1620 >= bStack_1630) * bStack_1620;
    local_1bb8[9] =
         (bStack_161f < bStack_162f) * bStack_162f | (bStack_161f >= bStack_162f) * bStack_161f;
    local_1bb8[10] =
         (bStack_161e < bStack_162e) * bStack_162e | (bStack_161e >= bStack_162e) * bStack_161e;
    local_1bb8[0xb] =
         (bStack_161d < bStack_162d) * bStack_162d | (bStack_161d >= bStack_162d) * bStack_161d;
    local_1bb8[0xc] =
         (bStack_161c < bStack_162c) * bStack_162c | (bStack_161c >= bStack_162c) * bStack_161c;
    local_1bb8[0xd] =
         (bStack_161b < bStack_162b) * bStack_162b | (bStack_161b >= bStack_162b) * bStack_161b;
    local_1bb8[0xe] =
         (bStack_161a < bStack_162a) * bStack_162a | (bStack_161a >= bStack_162a) * bStack_161a;
    local_1bb8[0xf] =
         (bStack_1619 < bStack_1629) * bStack_1629 | (bStack_1619 >= bStack_1629) * bStack_1619;
    b_07[1] = uVar177;
    a_06[1] = (longlong)x3_00;
    a_06[0] = (longlong)palVar178;
    abs_diff(a_06,b_07);
    palVar178 = local_1b40;
    local_1658 = local_1bb8._0_8_;
    uVar17 = local_1658;
    uStack_1650 = local_1bb8._8_8_;
    uVar20 = uStack_1650;
    local_1648 = (byte)extraout_XMM0_Qa_07;
    bStack_1647 = (byte)((ulong)extraout_XMM0_Qa_07 >> 8);
    bStack_1646 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x10);
    bStack_1645 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x18);
    bStack_1644 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x20);
    bStack_1643 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x28);
    bStack_1642 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x30);
    bStack_1641 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x38);
    bStack_1640 = (byte)extraout_XMM0_Qb_07;
    bStack_163f = (byte)((ulong)extraout_XMM0_Qb_07 >> 8);
    bStack_163e = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x10);
    bStack_163d = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x18);
    bStack_163c = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x20);
    bStack_163b = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x28);
    bStack_163a = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x30);
    bStack_1639 = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x38);
    local_1658._0_1_ = local_1bb8[0];
    local_1658._1_1_ = local_1bb8[1];
    local_1658._2_1_ = local_1bb8[2];
    local_1658._3_1_ = local_1bb8[3];
    local_1658._4_1_ = local_1bb8[4];
    local_1658._5_1_ = local_1bb8[5];
    local_1658._6_1_ = local_1bb8[6];
    local_1658._7_1_ = local_1bb8[7];
    uStack_1650._0_1_ = local_1bb8[8];
    uStack_1650._1_1_ = local_1bb8[9];
    uStack_1650._2_1_ = local_1bb8[10];
    uStack_1650._3_1_ = local_1bb8[0xb];
    uStack_1650._4_1_ = local_1bb8[0xc];
    uStack_1650._5_1_ = local_1bb8[0xd];
    uStack_1650._6_1_ = local_1bb8[0xe];
    uStack_1650._7_1_ = local_1bb8[0xf];
    local_1bb8[0] =
         (local_1648 < (byte)local_1658) * (byte)local_1658 |
         (local_1648 >= (byte)local_1658) * local_1648;
    local_1bb8[1] =
         (bStack_1647 < local_1658._1_1_) * local_1658._1_1_ |
         (bStack_1647 >= local_1658._1_1_) * bStack_1647;
    local_1bb8[2] =
         (bStack_1646 < local_1658._2_1_) * local_1658._2_1_ |
         (bStack_1646 >= local_1658._2_1_) * bStack_1646;
    local_1bb8[3] =
         (bStack_1645 < local_1658._3_1_) * local_1658._3_1_ |
         (bStack_1645 >= local_1658._3_1_) * bStack_1645;
    local_1bb8[4] =
         (bStack_1644 < local_1658._4_1_) * local_1658._4_1_ |
         (bStack_1644 >= local_1658._4_1_) * bStack_1644;
    local_1bb8[5] =
         (bStack_1643 < local_1658._5_1_) * local_1658._5_1_ |
         (bStack_1643 >= local_1658._5_1_) * bStack_1643;
    local_1bb8[6] =
         (bStack_1642 < local_1658._6_1_) * local_1658._6_1_ |
         (bStack_1642 >= local_1658._6_1_) * bStack_1642;
    local_1bb8[7] =
         (bStack_1641 < local_1658._7_1_) * local_1658._7_1_ |
         (bStack_1641 >= local_1658._7_1_) * bStack_1641;
    local_1bb8[8] =
         (bStack_1640 < (byte)uStack_1650) * (byte)uStack_1650 |
         (bStack_1640 >= (byte)uStack_1650) * bStack_1640;
    local_1bb8[9] =
         (bStack_163f < uStack_1650._1_1_) * uStack_1650._1_1_ |
         (bStack_163f >= uStack_1650._1_1_) * bStack_163f;
    local_1bb8[10] =
         (bStack_163e < uStack_1650._2_1_) * uStack_1650._2_1_ |
         (bStack_163e >= uStack_1650._2_1_) * bStack_163e;
    local_1bb8[0xb] =
         (bStack_163d < uStack_1650._3_1_) * uStack_1650._3_1_ |
         (bStack_163d >= uStack_1650._3_1_) * bStack_163d;
    local_1bb8[0xc] =
         (bStack_163c < uStack_1650._4_1_) * uStack_1650._4_1_ |
         (bStack_163c >= uStack_1650._4_1_) * bStack_163c;
    local_1bb8[0xd] =
         (bStack_163b < uStack_1650._5_1_) * uStack_1650._5_1_ |
         (bStack_163b >= uStack_1650._5_1_) * bStack_163b;
    local_1bb8[0xe] =
         (bStack_163a < uStack_1650._6_1_) * uStack_1650._6_1_ |
         (bStack_163a >= uStack_1650._6_1_) * bStack_163a;
    local_1bb8[0xf] =
         (bStack_1639 < uStack_1650._7_1_) * uStack_1650._7_1_ |
         (bStack_1639 >= uStack_1650._7_1_) * bStack_1639;
    local_1678 = local_1bb8 >> 0x20;
    local_1668 = local_1bb8;
    local_1bb8[1] =
         (local_1bb8[1] < local_1bb8[5]) * local_1bb8[5] |
         (local_1bb8[1] >= local_1bb8[5]) * local_1bb8[1];
    local_1bb8[0] =
         (local_1bb8[0] < local_1bb8[4]) * local_1bb8[4] |
         (local_1bb8[0] >= local_1bb8[4]) * local_1bb8[0];
    local_1bb8[2] =
         (local_1bb8[2] < local_1bb8[6]) * local_1bb8[6] |
         (local_1bb8[2] >= local_1bb8[6]) * local_1bb8[2];
    local_1bb8[3] =
         (local_1bb8[3] < local_1bb8[7]) * local_1bb8[7] |
         (local_1bb8[3] >= local_1bb8[7]) * local_1bb8[3];
    local_1bb8[4] =
         (local_1bb8[4] < local_1bb8[8]) * local_1bb8[8] |
         (local_1bb8[4] >= local_1bb8[8]) * local_1bb8[4];
    local_1bb8[5] =
         (local_1bb8[5] < local_1bb8[9]) * local_1bb8[9] |
         (local_1bb8[5] >= local_1bb8[9]) * local_1bb8[5];
    local_1bb8[6] =
         (local_1bb8[6] < local_1bb8[10]) * local_1bb8[10] |
         (local_1bb8[6] >= local_1bb8[10]) * local_1bb8[6];
    local_1bb8[7] =
         (local_1bb8[7] < local_1bb8[0xb]) * local_1bb8[0xb] |
         (local_1bb8[7] >= local_1bb8[0xb]) * local_1bb8[7];
    local_1bb8[8] =
         (local_1bb8[8] < local_1bb8[0xc]) * local_1bb8[0xc] |
         (local_1bb8[8] >= local_1bb8[0xc]) * local_1bb8[8];
    local_1bb8[9] =
         (local_1bb8[9] < local_1bb8[0xd]) * local_1bb8[0xd] |
         (local_1bb8[9] >= local_1bb8[0xd]) * local_1bb8[9];
    local_1bb8[10] =
         (local_1bb8[10] < local_1bb8[0xe]) * local_1bb8[0xe] |
         (local_1bb8[10] >= local_1bb8[0xe]) * local_1bb8[10];
    local_1bb8[0xb] =
         (local_1bb8[0xb] < local_1bb8[0xf]) * local_1bb8[0xf] |
         (local_1bb8[0xb] >= local_1bb8[0xf]) * local_1bb8[0xb];
    local_1208 = local_1bb8._0_8_;
    uStack_1200 = local_1bb8._8_8_;
    local_1218 = local_1b78;
    uStack_1210 = uStack_1b70;
    auVar83._8_8_ = local_1bb8._8_8_;
    auVar83._0_8_ = local_1bb8._0_8_;
    auVar82._8_8_ = uStack_1b70;
    auVar82._0_8_ = local_1b78;
    auVar195 = psubusb(auVar83,auVar82);
    local_1bb8._0_8_ = auVar195._0_8_;
    local_1bb8._8_8_ = auVar195._8_8_;
    local_1748 = local_1bb8._0_8_;
    uVar12 = local_1748;
    uStack_1740 = local_1bb8._8_8_;
    uVar13 = uStack_1740;
    local_1758 = local_1b68;
    uVar8 = local_1758;
    uStack_1750 = uStack_1b60;
    uVar11 = uStack_1750;
    local_1748._0_1_ = auVar195[0];
    local_1748._1_1_ = auVar195[1];
    local_1748._2_1_ = auVar195[2];
    local_1748._3_1_ = auVar195[3];
    local_1748._4_1_ = auVar195[4];
    local_1748._5_1_ = auVar195[5];
    local_1748._6_1_ = auVar195[6];
    local_1748._7_1_ = auVar195[7];
    uStack_1740._0_1_ = auVar195[8];
    uStack_1740._1_1_ = auVar195[9];
    uStack_1740._2_1_ = auVar195[10];
    uStack_1740._3_1_ = auVar195[0xb];
    uStack_1740._4_1_ = auVar195[0xc];
    uStack_1740._5_1_ = auVar195[0xd];
    uStack_1740._6_1_ = auVar195[0xe];
    uStack_1740._7_1_ = auVar195[0xf];
    local_1758._0_1_ = (char)local_1b68;
    local_1758._1_1_ = (char)((ulong)local_1b68 >> 8);
    local_1758._2_1_ = (char)((ulong)local_1b68 >> 0x10);
    local_1758._3_1_ = (char)((ulong)local_1b68 >> 0x18);
    local_1758._4_1_ = (char)((ulong)local_1b68 >> 0x20);
    local_1758._5_1_ = (char)((ulong)local_1b68 >> 0x28);
    local_1758._6_1_ = (char)((ulong)local_1b68 >> 0x30);
    local_1758._7_1_ = (char)((ulong)local_1b68 >> 0x38);
    uStack_1750._0_1_ = (char)uStack_1b60;
    uStack_1750._1_1_ = (char)((ulong)uStack_1b60 >> 8);
    uStack_1750._2_1_ = (char)((ulong)uStack_1b60 >> 0x10);
    uStack_1750._3_1_ = (char)((ulong)uStack_1b60 >> 0x18);
    uStack_1750._4_1_ = (char)((ulong)uStack_1b60 >> 0x20);
    uStack_1750._5_1_ = (char)((ulong)uStack_1b60 >> 0x28);
    uStack_1750._6_1_ = (char)((ulong)uStack_1b60 >> 0x30);
    uStack_1750._7_1_ = (char)((ulong)uStack_1b60 >> 0x38);
    local_1bb8[1] = -(local_1748._1_1_ == local_1758._1_1_);
    local_1bb8[0] = -((char)local_1748 == (char)local_1758);
    local_1bb8[2] = -(local_1748._2_1_ == local_1758._2_1_);
    local_1bb8[3] = -(local_1748._3_1_ == local_1758._3_1_);
    local_1bb8[4] = -(local_1748._4_1_ == local_1758._4_1_);
    local_1bb8[5] = -(local_1748._5_1_ == local_1758._5_1_);
    local_1bb8[6] = -(local_1748._6_1_ == local_1758._6_1_);
    local_1bb8[7] = -(local_1748._7_1_ == local_1758._7_1_);
    local_1bb8[8] = -((char)uStack_1740 == (char)uStack_1750);
    local_1bb8[9] = -(uStack_1740._1_1_ == uStack_1750._1_1_);
    local_1bb8[10] = -(uStack_1740._2_1_ == uStack_1750._2_1_);
    local_1bb8[0xb] = -(uStack_1740._3_1_ == uStack_1750._3_1_);
    local_1bb8[0xc] = -(uStack_1740._4_1_ == uStack_1750._4_1_);
    local_1bb8[0xd] = -(uStack_1740._5_1_ == uStack_1750._5_1_);
    local_1bb8[0xe] = -(uStack_1740._6_1_ == uStack_1750._6_1_);
    local_1bb8[0xf] = -(uStack_1740._7_1_ == uStack_1750._7_1_);
    local_1268 = local_1bb8._0_8_;
    uStack_1260 = local_1bb8._8_8_;
    local_1278 = local_1ba8._0_8_;
    uStack_1270 = local_1ba8._8_8_;
    local_1af8 = local_1bb8._0_8_ & local_1ba8._0_8_;
    uStack_1af0 = local_1bb8._8_8_ & local_1ba8._8_8_;
    local_1ae8._0_4_ = (undefined4)local_1af8;
    local_1ae8._4_4_ = (undefined4)(local_1af8 >> 0x20);
    local_1bb8._4_4_ = (undefined4)local_1ae8;
    local_1bb8._0_4_ = (undefined4)local_1ae8;
    local_1bb8._8_4_ = local_1ae8._4_4_;
    local_1bb8._12_4_ = local_1ae8._4_4_;
    local_ee8 = local_1ba8._0_8_;
    uStack_ee0 = local_1ba8._8_8_;
    local_ef8 = local_1c58;
    uStack_ef0 = uStack_1c50;
    local_1c58 = ~local_1ba8._0_8_ & local_1c58;
    uStack_1c50 = ~local_1ba8._8_8_ & uStack_1c50;
    local_1288 = local_1ba8._0_8_;
    uStack_1280 = local_1ba8._8_8_;
    local_1298 = local_1c48;
    uStack_1290 = uStack_1c40;
    local_1c48 = local_1ba8._0_8_ & local_1c48;
    uStack_1c40 = local_1ba8._8_8_ & uStack_1c40;
    uVar177 = uStack_1c50 | uStack_1c40;
    local_1ae8 = local_1af8;
    uStack_1ae0 = uStack_1af0;
    local_1758 = uVar8;
    uStack_1750 = uVar11;
    local_1748 = uVar12;
    uStack_1740 = uVar13;
    local_1658 = uVar17;
    uStack_1650 = uVar20;
    local_1018 = local_1c48;
    uStack_1010 = uStack_1c40;
    local_1008 = local_1c58;
    uStack_1000 = uStack_1c50;
    (*local_1b40)[0] = local_1c58 | local_1c48;
    (*palVar178)[1] = uVar177;
    palVar178 = local_1b38;
    local_f08 = local_1ba8._0_8_;
    uStack_f00 = local_1ba8._8_8_;
    local_f18 = local_1c68;
    uStack_f10 = uStack_1c60;
    local_1c68 = ~local_1ba8._0_8_ & local_1c68;
    uStack_1c60 = ~local_1ba8._8_8_ & uStack_1c60;
    local_12a8 = local_1ba8._0_8_;
    uStack_12a0 = local_1ba8._8_8_;
    local_12b8 = local_1c38;
    uStack_12b0 = uStack_1c30;
    local_1c38 = local_1ba8._0_8_ & local_1c38;
    uStack_1c30 = local_1ba8._8_8_ & uStack_1c30;
    uVar177 = uStack_1c60 | uStack_1c30;
    local_1038 = local_1c38;
    uStack_1030 = uStack_1c30;
    local_1028 = local_1c68;
    uStack_1020 = uStack_1c60;
    (*local_1b38)[0] = local_1c68 | local_1c38;
    (*palVar178)[1] = uVar177;
    palVar178 = local_1b30;
    local_f38 = (*local_1b30)[0];
    uStack_f30 = (*local_1b30)[1];
    local_f28 = local_1ba8._0_8_;
    uStack_f20 = local_1ba8._8_8_;
    uVar177 = ~local_1ba8._8_8_ & uStack_f30;
    (*local_1b30)[0] = ~local_1ba8._0_8_ & local_f38;
    (*palVar178)[1] = uVar177;
    palVar178 = local_1b30;
    local_12c8 = local_1ba8._0_8_;
    uStack_12c0 = local_1ba8._8_8_;
    local_12d8 = local_1c28;
    uStack_12d0 = uStack_1c20;
    local_1c28 = local_1ba8._0_8_ & local_1c28;
    uStack_1c20 = local_1ba8._8_8_ & uStack_1c20;
    local_1048 = (*local_1b30)[0];
    uStack_1040 = (*local_1b30)[1];
    uVar177 = uStack_1040 | uStack_1c20;
    local_1058 = local_1c28;
    uStack_1050 = uStack_1c20;
    (*local_1b30)[0] = local_1048 | local_1c28;
    (*palVar178)[1] = uVar177;
    palVar178 = local_1b40;
    local_1768 = local_1bb8._0_8_;
    uVar177 = local_1768;
    uStack_1760 = local_1bb8._8_8_;
    uVar194 = uStack_1760;
    local_1778 = local_1b68;
    uVar8 = local_1778;
    uStack_1770 = uStack_1b60;
    uVar11 = uStack_1770;
    local_1768._0_1_ = local_1bb8[0];
    local_1768._1_1_ = local_1bb8[1];
    local_1768._2_1_ = local_1bb8[2];
    local_1768._3_1_ = local_1bb8[3];
    local_1768._4_1_ = local_1bb8[4];
    local_1768._5_1_ = local_1bb8[5];
    local_1768._6_1_ = local_1bb8[6];
    local_1768._7_1_ = local_1bb8[7];
    uStack_1760._0_1_ = local_1bb8[8];
    uStack_1760._1_1_ = local_1bb8[9];
    uStack_1760._2_1_ = local_1bb8[10];
    uStack_1760._3_1_ = local_1bb8[0xb];
    uStack_1760._4_1_ = local_1bb8[0xc];
    uStack_1760._5_1_ = local_1bb8[0xd];
    uStack_1760._6_1_ = local_1bb8[0xe];
    uStack_1760._7_1_ = local_1bb8[0xf];
    local_1778._0_1_ = (char)local_1b68;
    local_1778._1_1_ = (char)((ulong)local_1b68 >> 8);
    local_1778._2_1_ = (char)((ulong)local_1b68 >> 0x10);
    local_1778._3_1_ = (char)((ulong)local_1b68 >> 0x18);
    local_1778._4_1_ = (char)((ulong)local_1b68 >> 0x20);
    local_1778._5_1_ = (char)((ulong)local_1b68 >> 0x28);
    local_1778._6_1_ = (char)((ulong)local_1b68 >> 0x30);
    local_1778._7_1_ = (char)((ulong)local_1b68 >> 0x38);
    uStack_1770._0_1_ = (char)uStack_1b60;
    uStack_1770._1_1_ = (char)((ulong)uStack_1b60 >> 8);
    uStack_1770._2_1_ = (char)((ulong)uStack_1b60 >> 0x10);
    uStack_1770._3_1_ = (char)((ulong)uStack_1b60 >> 0x18);
    uStack_1770._4_1_ = (char)((ulong)uStack_1b60 >> 0x20);
    uStack_1770._5_1_ = (char)((ulong)uStack_1b60 >> 0x28);
    uStack_1770._6_1_ = (char)((ulong)uStack_1b60 >> 0x30);
    uStack_1770._7_1_ = (char)((ulong)uStack_1b60 >> 0x38);
    local_1138 = -((char)local_1768 == (char)local_1778);
    cStack_1137 = -(local_1768._1_1_ == local_1778._1_1_);
    cStack_1136 = -(local_1768._2_1_ == local_1778._2_1_);
    cStack_1135 = -(local_1768._3_1_ == local_1778._3_1_);
    cStack_1134 = -(local_1768._4_1_ == local_1778._4_1_);
    cStack_1133 = -(local_1768._5_1_ == local_1778._5_1_);
    cStack_1132 = -(local_1768._6_1_ == local_1778._6_1_);
    cStack_1131 = -(local_1768._7_1_ == local_1778._7_1_);
    cStack_1130 = -((char)uStack_1760 == (char)uStack_1770);
    cStack_112f = -(uStack_1760._1_1_ == uStack_1770._1_1_);
    cStack_112e = -(uStack_1760._2_1_ == uStack_1770._2_1_);
    cStack_112d = -(uStack_1760._3_1_ == uStack_1770._3_1_);
    cStack_112c = -(uStack_1760._4_1_ == uStack_1770._4_1_);
    cStack_112b = -(uStack_1760._5_1_ == uStack_1770._5_1_);
    cStack_112a = -(uStack_1760._6_1_ == uStack_1770._6_1_);
    bStack_1129 = -(uStack_1760._7_1_ == uStack_1770._7_1_);
    auVar88[1] = cStack_1137;
    auVar88[0] = local_1138;
    auVar88[2] = cStack_1136;
    auVar88[3] = cStack_1135;
    auVar88[4] = cStack_1134;
    auVar88[5] = cStack_1133;
    auVar88[6] = cStack_1132;
    auVar88[7] = cStack_1131;
    auVar88[8] = cStack_1130;
    auVar88[9] = cStack_112f;
    auVar88[10] = cStack_112e;
    auVar88[0xb] = cStack_112d;
    auVar88[0xc] = cStack_112c;
    auVar88[0xd] = cStack_112b;
    auVar88[0xe] = cStack_112a;
    auVar88[0xf] = bStack_1129;
    local_1778 = uVar8;
    uStack_1770 = uVar11;
    local_1768 = uVar177;
    uStack_1760 = uVar194;
    if ((ushort)((ushort)(SUB161(auVar88 >> 7,0) & 1) | (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_1129 >> 7) << 0xf)
        != 0xffff) {
      local_b38 = CONCAT26(sVar220,CONCAT24(sVar209,CONCAT22(sVar199,sVar180)));
      uStack_b30 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      local_b18 = CONCAT26(sVar223,CONCAT24(sVar212,CONCAT22(sVar202,sVar183)));
      uStack_b10 = CONCAT26(sVar270,CONCAT24(sVar260,CONCAT22(sVar248,sVar232)));
      uStack_b20 = 0;
      local_b48 = sVar183 + sVar240;
      sStack_b46 = sVar202 + sVar166;
      sStack_b44 = sVar212 + sVar167;
      sStack_b42 = sVar223 + sVar168;
      in_stack_ffffffffffffe120 = sVar230 + sVar232;
      in_stack_ffffffffffffe122 = sVar246 + sVar248;
      in_stack_ffffffffffffe124 = sVar258 + sVar260;
      in_stack_ffffffffffffe126 = sVar268 + sVar270;
      local_b78 = CONCAT26(sVar220,CONCAT24(sVar209,CONCAT22(sVar199,sVar180)));
      uStack_b70 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      local_b58 = CONCAT26(sVar270,CONCAT24(sVar260,CONCAT22(sVar248,sVar232)));
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar150,CONCAT11(cVar157,uVar149)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar151,uVar9));
      uVar8 = CONCAT17(cVar160,CONCAT16(uVar152,uVar10));
      sStack_b80 = CONCAT11(cVar161,uVar153);
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar154,sStack_b80));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar155,uVar15));
      uVar11 = CONCAT17(cVar164,CONCAT16(uVar156,uVar16));
      uStack_b50 = 0;
      local_b68._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_b68._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_b68._6_2_ = (short)((ulong)uVar8 >> 0x30);
      uStack_b60._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_b60._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_b60._6_2_ = (short)((ulong)uVar11 >> 0x30);
      local_b88 = sVar232 + CONCAT11(cVar157,uVar149);
      sStack_b86 = sVar248 + local_b68._2_2_;
      sStack_b84 = sVar260 + local_b68._4_2_;
      sStack_b82 = sVar270 + local_b68._6_2_;
      sStack_b7e = uStack_b60._2_2_;
      sStack_b7c = uStack_b60._4_2_;
      sStack_b7a = uStack_b60._6_2_;
      local_b98 = CONCAT26(sVar222,CONCAT24(sVar211,CONCAT22(sVar201,sVar182)));
      uStack_b90 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      local_ba8 = CONCAT26(sVar224,CONCAT24(sVar213,CONCAT22(sVar203,sVar184)));
      uStack_ba0 = CONCAT26(sVar271,CONCAT24(sVar261,CONCAT22(sVar249,sVar233)));
      in_stack_ffffffffffffe128 = sVar182 + sVar184;
      in_stack_ffffffffffffe12a = sVar201 + sVar203;
      in_stack_ffffffffffffe12c = sVar211 + sVar213;
      in_stack_ffffffffffffe12e = sVar222 + sVar224;
      in_stack_ffffffffffffe130 = sVar230 + sVar233;
      in_stack_ffffffffffffe132 = sVar246 + sVar249;
      in_stack_ffffffffffffe134 = sVar258 + sVar261;
      in_stack_ffffffffffffe136 = sVar268 + sVar271;
      local_bc8 = CONCAT26(sVar271,CONCAT24(sVar261,CONCAT22(sVar249,sVar233)));
      local_bb8 = local_1fc8;
      uVar165 = local_bb8;
      uStack_bc0 = 0;
      local_bb8._0_2_ = (short)local_1fc8;
      local_bb8._2_2_ = (short)((ulong)local_1fc8 >> 0x10);
      local_bb8._4_2_ = (short)((ulong)local_1fc8 >> 0x20);
      local_bb8._6_2_ = (short)((ulong)local_1fc8 >> 0x30);
      uStack_bb0._0_2_ = (short)uVar277;
      uStack_bb0._2_2_ = (short)((ulong)uVar277 >> 0x10);
      uStack_bb0._4_2_ = (short)((ulong)uVar277 >> 0x20);
      uStack_bb0._6_2_ = (short)((ulong)uVar277 >> 0x30);
      local_18a8 = CONCAT26(sVar220 + sStack_b42,
                            CONCAT24(sVar209 + sStack_b44,
                                     CONCAT22(sVar199 + sStack_b46,sVar180 + local_b48)));
      uStack_18a0 = CONCAT26(in_stack_ffffffffffffe126,
                             CONCAT24(in_stack_ffffffffffffe124,
                                      CONCAT22(in_stack_ffffffffffffe122,in_stack_ffffffffffffe120))
                            );
      local_18b8 = CONCAT26(sVar220 + sStack_b82,
                            CONCAT24(sVar209 + sStack_b84,
                                     CONCAT22(sVar199 + sStack_b86,sVar180 + local_b88)));
      uStack_18b0 = CONCAT26(sVar268 + uStack_b60._6_2_,
                             CONCAT24(sVar258 + uStack_b60._4_2_,
                                      CONCAT22(sVar246 + uStack_b60._2_2_,sVar230 + sStack_b80)));
      local_142c = 4;
      uVar191 = (ushort)(sVar180 + local_b48) >> 4;
      uVar188 = (ushort)(sVar199 + sStack_b46) >> 4;
      uVar204 = (ushort)(sVar209 + sStack_b44) >> 4;
      uVar214 = (ushort)(sVar220 + sStack_b42) >> 4;
      uVar225 = (ushort)(sVar180 + local_b88) >> 4;
      uVar237 = (ushort)(sVar199 + sStack_b86) >> 4;
      uVar251 = (ushort)(sVar209 + sStack_b84) >> 4;
      uVar263 = (ushort)(sVar220 + sStack_b82) >> 4;
      local_1c18._0_4_ = CONCAT22(uVar188,uVar191);
      local_1c18._0_6_ = CONCAT24(uVar204,(undefined4)local_1c18);
      local_1c18 = CONCAT26(uVar214,(undefined6)local_1c18);
      uStack_1c10._0_4_ = CONCAT22(uVar237,uVar225);
      uStack_1c10._0_6_ = CONCAT24(uVar251,(undefined4)uStack_1c10);
      uStack_1c10 = CONCAT26(uVar263,(undefined6)uStack_1c10);
      local_18c8 = CONCAT26(in_stack_ffffffffffffe12e,
                            CONCAT24(in_stack_ffffffffffffe12c,
                                     CONCAT22(in_stack_ffffffffffffe12a,in_stack_ffffffffffffe128)))
      ;
      uStack_18c0 = CONCAT26(in_stack_ffffffffffffe136,
                             CONCAT24(in_stack_ffffffffffffe134,
                                      CONCAT22(in_stack_ffffffffffffe132,in_stack_ffffffffffffe130))
                            );
      local_18d8 = CONCAT26(local_bb8._6_2_ + sVar271,
                            CONCAT24(local_bb8._4_2_ + sVar261,
                                     CONCAT22(local_bb8._2_2_ + sVar249,(short)local_bb8 + sVar233))
                           );
      local_144c = 4;
      uVar189 = in_stack_ffffffffffffe128 >> 4;
      uVar205 = in_stack_ffffffffffffe12a >> 4;
      uVar215 = in_stack_ffffffffffffe12c >> 4;
      uVar226 = in_stack_ffffffffffffe12e >> 4;
      uVar236 = (ushort)((short)local_bb8 + sVar233) >> 4;
      uVar250 = (ushort)(local_bb8._2_2_ + sVar249) >> 4;
      uVar262 = (ushort)(local_bb8._4_2_ + sVar261) >> 4;
      uVar272 = (ushort)(local_bb8._6_2_ + sVar271) >> 4;
      local_1c08._0_4_ = CONCAT22(uVar205,uVar189);
      local_1c08._0_6_ = CONCAT24(uVar215,(undefined4)local_1c08);
      local_1c08 = CONCAT26(uVar226,(undefined6)local_1c08);
      uStack_1c00._0_4_ = CONCAT22(uVar250,uVar236);
      uStack_1c00._0_6_ = CONCAT24(uVar262,(undefined4)uStack_1c00);
      uStack_1c00 = CONCAT26(uVar272,(undefined6)uStack_1c00);
      local_c8 = local_1c18;
      uStack_c0 = uStack_1c10;
      local_d8 = local_1c18;
      uStack_d0 = uStack_1c10;
      local_1c18._0_4_ =
           CONCAT13((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                    CONCAT12((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204),
                             CONCAT11((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 -
                                      (0xff < uVar188),
                                      (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 -
                                      (0xff < uVar191))));
      local_1c18._0_6_ =
           CONCAT15((uVar237 != 0) * (uVar237 < 0x100) * (char)uVar237 - (0xff < uVar237),
                    CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225),
                             (undefined4)local_1c18));
      local_1c18 = CONCAT17((uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 - (0xff < uVar263),
                            CONCAT16((uVar251 != 0) * (uVar251 < 0x100) * (char)uVar251 -
                                     (0xff < uVar251),(undefined6)local_1c18));
      uStack_1c10._0_4_ =
           CONCAT13((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                    CONCAT12((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204),
                             CONCAT11((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 -
                                      (0xff < uVar188),
                                      (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 -
                                      (0xff < uVar191))));
      uStack_1c10._0_6_ =
           CONCAT15((uVar237 != 0) * (uVar237 < 0x100) * (char)uVar237 - (0xff < uVar237),
                    CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 - (0xff < uVar225),
                             (undefined4)uStack_1c10));
      uStack_1c10 = CONCAT17((uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 - (0xff < uVar263),
                             CONCAT16((uVar251 != 0) * (uVar251 < 0x100) * (char)uVar251 -
                                      (0xff < uVar251),(undefined6)uStack_1c10));
      local_e8 = local_1c08;
      uStack_e0 = uStack_1c00;
      local_f8 = local_1c08;
      uStack_f0 = uStack_1c00;
      local_1c08._0_4_ =
           CONCAT13((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                    CONCAT12((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                             CONCAT11((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 -
                                      (0xff < uVar205),
                                      (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189))));
      local_1c08._0_6_ =
           CONCAT15((uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250),
                    CONCAT14((uVar236 != 0) * (uVar236 < 0x100) * (char)uVar236 - (0xff < uVar236),
                             (undefined4)local_1c08));
      local_1c08 = CONCAT17((uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272),
                            CONCAT16((uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 -
                                     (0xff < uVar262),(undefined6)local_1c08));
      uStack_1c00._0_4_ =
           CONCAT13((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                    CONCAT12((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                             CONCAT11((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 -
                                      (0xff < uVar205),
                                      (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189))));
      uStack_1c00._0_6_ =
           CONCAT15((uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250),
                    CONCAT14((uVar236 != 0) * (uVar236 < 0x100) * (char)uVar236 - (0xff < uVar236),
                             (undefined4)uStack_1c00));
      uStack_1c00 = CONCAT17((uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272),
                             CONCAT16((uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 -
                                      (0xff < uVar262),(undefined6)uStack_1c00));
      local_6b8 = CONCAT26(sVar222,CONCAT24(sVar211,CONCAT22(sVar201,sVar182)));
      uStack_6b0 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      uStack_6c0 = 0;
      local_6c8._2_2_ = (short)((uint)uVar67 >> 0x10);
      local_6c8._4_2_ = (short)((uint6)uVar68 >> 0x20);
      local_6c8._6_2_ = (short)((ulong)uVar66 >> 0x30);
      sVar182 = sVar182 - sVar253;
      sVar201 = sVar201 - local_6c8._2_2_;
      sVar211 = sVar211 - local_6c8._4_2_;
      sVar222 = sVar222 - local_6c8._6_2_;
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar118,CONCAT11(cVar157,uVar117)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar119,uVar9));
      uVar45 = CONCAT17(cVar160,CONCAT16(uVar120,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar122,CONCAT11(cVar161,uVar121)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar123,uVar15));
      uVar54 = CONCAT17(cVar164,CONCAT16(uVar124,uVar16));
      local_6d8 = local_1fc8;
      local_6e8._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_6e8._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_6e8._6_2_ = (short)((ulong)uVar45 >> 0x30);
      uStack_6e0._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_6e0._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_6e0._6_2_ = (short)((ulong)uVar54 >> 0x30);
      local_bb8._0_2_ = (short)local_bb8 - CONCAT11(cVar157,uVar117);
      local_bb8._2_2_ = local_bb8._2_2_ - local_6e8._2_2_;
      local_bb8._4_2_ = local_bb8._4_2_ - local_6e8._4_2_;
      local_bb8._6_2_ = local_bb8._6_2_ - local_6e8._6_2_;
      uStack_bb0._0_2_ = (short)uStack_bb0 - CONCAT11(cVar161,uVar121);
      uStack_bb0._2_2_ = uStack_bb0._2_2_ - uStack_6e0._2_2_;
      uStack_bb0._4_2_ = uStack_bb0._4_2_ - uStack_6e0._4_2_;
      uStack_bb0._6_2_ = uStack_bb0._6_2_ - uStack_6e0._6_2_;
      local_1fc8._0_4_ = CONCAT22(local_bb8._2_2_,(short)local_bb8);
      local_1fc8._0_6_ = CONCAT24(local_bb8._4_2_,(undefined4)local_1fc8);
      local_1fc8 = CONCAT26(local_bb8._6_2_,(undefined6)local_1fc8);
      uStack_c70 = CONCAT26(uStack_bb0._6_2_,
                            CONCAT24(uStack_bb0._4_2_,CONCAT22(uStack_bb0._2_2_,(short)uStack_bb0)))
      ;
      local_bd8 = CONCAT26(sVar227,CONCAT24(sVar216,CONCAT22(sVar206,sVar192)));
      uStack_bd0 = CONCAT26(sVar274,CONCAT24(sVar264,CONCAT22(sVar252,sVar239)));
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar102,CONCAT11(cVar157,uVar101)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar103,uVar9));
      uVar65 = CONCAT17(cVar160,CONCAT16(uVar104,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar106,CONCAT11(cVar161,uVar105)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar107,uVar15));
      uVar75 = CONCAT17(cVar164,CONCAT16(uVar108,uVar16));
      local_be8._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_be8._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_be8._6_2_ = (short)((ulong)uVar65 >> 0x30);
      uStack_be0._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_be0._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_be0._6_2_ = (short)((ulong)uVar75 >> 0x30);
      sVar192 = sVar192 + CONCAT11(cVar157,uVar101);
      sVar206 = sVar206 + local_be8._2_2_;
      sVar216 = sVar216 + local_be8._4_2_;
      sVar227 = sVar227 + local_be8._6_2_;
      sVar239 = sVar239 + CONCAT11(cVar161,uVar105);
      sVar252 = sVar252 + uStack_be0._2_2_;
      sVar264 = sVar264 + uStack_be0._4_2_;
      sVar274 = sVar274 + uStack_be0._6_2_;
      local_c38 = CONCAT26(sVar227,CONCAT24(sVar216,CONCAT22(sVar206,sVar192)));
      uStack_c30 = CONCAT26(sVar274,CONCAT24(sVar264,CONCAT22(sVar252,sVar239)));
      local_c28 = CONCAT11(cVar157,uVar141);
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar142,local_c28));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar143,uVar9));
      uVar12 = CONCAT17(cVar160,CONCAT16(uVar144,uVar10));
      sStack_c20 = CONCAT11(cVar161,uVar145);
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar146,sStack_c20));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar147,uVar15));
      uVar17 = CONCAT17(cVar164,CONCAT16(uVar148,uVar16));
      uVar18 = CONCAT13(cVar158,CONCAT12(uVar134,CONCAT11(cVar157,uVar133)));
      uVar19 = CONCAT15(cVar159,CONCAT14(uVar135,uVar18));
      uVar21 = CONCAT17(cVar160,CONCAT16(uVar136,uVar19));
      uVar24 = CONCAT13(cVar162,CONCAT12(uVar138,CONCAT11(cVar161,uVar137)));
      uVar25 = CONCAT15(cVar163,CONCAT14(uVar139,uVar24));
      uVar26 = CONCAT17(cVar164,CONCAT16(uVar140,uVar25));
      uVar32 = CONCAT13(cVar158,CONCAT12(uVar126,CONCAT11(cVar157,uVar125)));
      uVar33 = CONCAT15(cVar159,CONCAT14(uVar127,uVar32));
      uVar29 = CONCAT17(cVar160,CONCAT16(uVar128,uVar33));
      uVar35 = CONCAT13(cVar162,CONCAT12(uVar130,CONCAT11(cVar161,uVar129)));
      uVar36 = CONCAT15(cVar163,CONCAT14(uVar131,uVar35));
      uVar39 = CONCAT17(cVar164,CONCAT16(uVar132,uVar36));
      local_bf8._2_2_ = (short)((uint)uVar32 >> 0x10);
      local_bf8._4_2_ = (short)((uint6)uVar33 >> 0x20);
      local_bf8._6_2_ = (short)((ulong)uVar29 >> 0x30);
      uStack_bf0._2_2_ = (short)((uint)uVar35 >> 0x10);
      uStack_bf0._4_2_ = (short)((uint6)uVar36 >> 0x20);
      uStack_bf0._6_2_ = (short)((ulong)uVar39 >> 0x30);
      local_c08._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_c08._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_c08._6_2_ = (short)((ulong)uVar12 >> 0x30);
      uStack_c00._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_c00._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_c00._6_2_ = (short)((ulong)uVar17 >> 0x30);
      local_c28 = CONCAT11(cVar157,uVar125) + local_c28;
      sStack_c26 = local_bf8._2_2_ + local_c08._2_2_;
      sStack_c24 = local_bf8._4_2_ + local_c08._4_2_;
      sStack_c22 = local_bf8._6_2_ + local_c08._6_2_;
      sStack_c20 = CONCAT11(cVar161,uVar129) + sStack_c20;
      sStack_c1e = uStack_bf0._2_2_ + uStack_c00._2_2_;
      sStack_c1c = uStack_bf0._4_2_ + uStack_c00._4_2_;
      sStack_c1a = uStack_bf0._6_2_ + uStack_c00._6_2_;
      local_c18._2_2_ = (short)((uint)uVar18 >> 0x10);
      local_c18._4_2_ = (short)((uint6)uVar19 >> 0x20);
      local_c18._6_2_ = (short)((ulong)uVar21 >> 0x30);
      uStack_c10._2_2_ = (short)((uint)uVar24 >> 0x10);
      uStack_c10._4_2_ = (short)((uint6)uVar25 >> 0x20);
      uStack_c10._6_2_ = (short)((ulong)uVar26 >> 0x30);
      local_c48 = CONCAT11(cVar157,uVar133) + local_c28;
      sStack_c46 = local_c18._2_2_ + sStack_c26;
      sStack_c44 = local_c18._4_2_ + sStack_c24;
      sStack_c42 = local_c18._6_2_ + sStack_c22;
      sStack_c40 = CONCAT11(cVar161,uVar137) + sStack_c20;
      sStack_c3e = uStack_c10._2_2_ + sStack_c1e;
      sStack_c3c = uStack_c10._4_2_ + sStack_c1c;
      sStack_c3a = uStack_c10._6_2_ + sStack_c1a;
      sVar240 = sVar239 + sStack_c40;
      sVar253 = sVar252 + sStack_c3e;
      sVar190 = sVar264 + sStack_c3c;
      sVar238 = sVar274 + sStack_c3a;
      local_c58 = CONCAT26(sVar222,CONCAT24(sVar211,CONCAT22(sVar201,sVar182)));
      uStack_c50 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      local_c68 = CONCAT26(sVar227 + sStack_c42,
                           CONCAT24(sVar216 + sStack_c44,
                                    CONCAT22(sVar206 + sStack_c46,sVar192 + local_c48)));
      uStack_c60 = CONCAT26(sVar238,CONCAT24(sVar190,CONCAT22(sVar253,sVar240)));
      in_stack_ffffffffffffe138 = sVar182 + sVar192 + local_c48;
      in_stack_ffffffffffffe13a = sVar201 + sVar206 + sStack_c46;
      in_stack_ffffffffffffe13c = sVar211 + sVar216 + sStack_c44;
      in_stack_ffffffffffffe13e = sVar222 + sVar227 + sStack_c42;
      in_stack_ffffffffffffe140 = sVar230 + sVar240;
      in_stack_ffffffffffffe142 = sVar246 + sVar253;
      in_stack_ffffffffffffe144 = sVar258 + sVar190;
      in_stack_ffffffffffffe146 = sVar268 + sVar238;
      local_c88 = CONCAT26(sVar238,CONCAT24(sVar190,CONCAT22(sVar253,sVar240)));
      local_c78 = local_1fc8;
      uStack_c80 = 0;
      local_18e8 = CONCAT26(in_stack_ffffffffffffe13e,
                            CONCAT24(in_stack_ffffffffffffe13c,
                                     CONCAT22(in_stack_ffffffffffffe13a,in_stack_ffffffffffffe138)))
      ;
      uStack_18e0 = CONCAT26(in_stack_ffffffffffffe146,
                             CONCAT24(in_stack_ffffffffffffe144,
                                      CONCAT22(in_stack_ffffffffffffe142,in_stack_ffffffffffffe140))
                            );
      local_18f8 = CONCAT26(local_bb8._6_2_ + sVar238,
                            CONCAT24(local_bb8._4_2_ + sVar190,
                                     CONCAT22(local_bb8._2_2_ + sVar253,(short)local_bb8 + sVar240))
                           );
      uStack_18f0 = CONCAT26(uStack_bb0._6_2_,
                             CONCAT24(uStack_bb0._4_2_,CONCAT22(uStack_bb0._2_2_,(short)uStack_bb0))
                            );
      local_146c = 4;
      uVar191 = in_stack_ffffffffffffe138 >> 4;
      uVar189 = in_stack_ffffffffffffe13a >> 4;
      uVar188 = in_stack_ffffffffffffe13c >> 4;
      uVar205 = in_stack_ffffffffffffe13e >> 4;
      uVar204 = (ushort)((short)local_bb8 + sVar240) >> 4;
      uVar215 = (ushort)(local_bb8._2_2_ + sVar253) >> 4;
      uVar214 = (ushort)(local_bb8._4_2_ + sVar190) >> 4;
      uVar226 = (ushort)(local_bb8._6_2_ + sVar238) >> 4;
      local_1bf8._0_4_ = CONCAT22(uVar189,uVar191);
      local_1bf8._0_6_ = CONCAT24(uVar188,(undefined4)local_1bf8);
      local_1bf8 = CONCAT26(uVar205,(undefined6)local_1bf8);
      uStack_1bf0._0_4_ = CONCAT22(uVar215,uVar204);
      uStack_1bf0._0_6_ = CONCAT24(uVar214,(undefined4)uStack_1bf0);
      uStack_1bf0 = CONCAT26(uVar226,(undefined6)uStack_1bf0);
      local_108 = local_1bf8;
      uStack_100 = uStack_1bf0;
      local_118 = local_1bf8;
      uStack_110 = uStack_1bf0;
      local_1bf8._0_4_ =
           CONCAT13((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205),
                    CONCAT12((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188),
                             CONCAT11((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189),
                                      (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 -
                                      (0xff < uVar191))));
      local_1bf8._0_6_ =
           CONCAT15((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                    CONCAT14((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204),
                             (undefined4)local_1bf8));
      local_1bf8 = CONCAT17((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                            CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                     (0xff < uVar214),(undefined6)local_1bf8));
      uStack_1bf0._0_4_ =
           CONCAT13((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205),
                    CONCAT12((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188),
                             CONCAT11((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189),
                                      (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 -
                                      (0xff < uVar191))));
      uStack_1bf0._0_6_ =
           CONCAT15((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                    CONCAT14((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204),
                             (undefined4)uStack_1bf0));
      uStack_1bf0 = CONCAT17((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                             CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                      (0xff < uVar214),(undefined6)uStack_1bf0));
      local_c98 = CONCAT26(sVar227,CONCAT24(sVar216,CONCAT22(sVar206,sVar192)));
      uStack_c90 = CONCAT26(sVar274,CONCAT24(sVar264,CONCAT22(sVar252,sVar239)));
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar102,CONCAT11(cVar157,uVar101)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar103,uVar9));
      uVar69 = CONCAT17(cVar160,CONCAT16(uVar104,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar106,CONCAT11(cVar161,uVar105)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar107,uVar15));
      uVar76 = CONCAT17(cVar164,CONCAT16(uVar108,uVar16));
      local_ca8._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_ca8._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_ca8._6_2_ = (short)((ulong)uVar69 >> 0x30);
      uStack_ca0._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_ca0._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_ca0._6_2_ = (short)((ulong)uVar76 >> 0x30);
      sVar192 = sVar192 + CONCAT11(cVar157,uVar101);
      sVar206 = sVar206 + local_ca8._2_2_;
      sVar216 = sVar216 + local_ca8._4_2_;
      sVar227 = sVar227 + local_ca8._6_2_;
      sVar239 = sVar239 + CONCAT11(cVar161,uVar105);
      sVar252 = sVar252 + uStack_ca0._2_2_;
      sVar264 = sVar264 + uStack_ca0._4_2_;
      sVar274 = sVar274 + uStack_ca0._6_2_;
      local_6f8 = CONCAT26(sVar222,CONCAT24(sVar211,CONCAT22(sVar201,sVar182)));
      uStack_6f0 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      uStack_700 = 0;
      sVar182 = sVar182 - sVar254;
      sVar201 = sVar201 - sVar169;
      sVar211 = sVar211 - sVar170;
      sVar222 = sVar222 - sVar171;
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar126,CONCAT11(cVar157,uVar125)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar127,uVar9));
      uVar34 = CONCAT17(cVar160,CONCAT16(uVar128,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar130,CONCAT11(cVar161,uVar129)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar131,uVar15));
      uVar40 = CONCAT17(cVar164,CONCAT16(uVar132,uVar16));
      local_718 = local_1fc8;
      local_728._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_728._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_728._6_2_ = (short)((ulong)uVar34 >> 0x30);
      uStack_720._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_720._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_720._6_2_ = (short)((ulong)uVar40 >> 0x30);
      local_bb8._0_2_ = (short)local_bb8 - CONCAT11(cVar157,uVar125);
      local_bb8._2_2_ = local_bb8._2_2_ - local_728._2_2_;
      local_bb8._4_2_ = local_bb8._4_2_ - local_728._4_2_;
      local_bb8._6_2_ = local_bb8._6_2_ - local_728._6_2_;
      uStack_bb0._0_2_ = (short)uStack_bb0 - CONCAT11(cVar161,uVar129);
      uStack_bb0._2_2_ = uStack_bb0._2_2_ - uStack_720._2_2_;
      uStack_bb0._4_2_ = uStack_bb0._4_2_ - uStack_720._4_2_;
      uStack_bb0._6_2_ = uStack_bb0._6_2_ - uStack_720._6_2_;
      local_1fc8._0_4_ = CONCAT22(local_bb8._2_2_,(short)local_bb8);
      local_1fc8._0_6_ = CONCAT24(local_bb8._4_2_,(undefined4)local_1fc8);
      local_1fc8 = CONCAT26(local_bb8._6_2_,(undefined6)local_1fc8);
      uStack_d30 = CONCAT26(uStack_bb0._6_2_,
                            CONCAT24(uStack_bb0._4_2_,CONCAT22(uStack_bb0._2_2_,(short)uStack_bb0)))
      ;
      local_cf8 = CONCAT26(sVar227,CONCAT24(sVar216,CONCAT22(sVar206,sVar192)));
      uStack_cf0 = CONCAT26(sVar274,CONCAT24(sVar264,CONCAT22(sVar252,sVar239)));
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar134,CONCAT11(cVar157,uVar133)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar135,uVar9));
      uVar22 = CONCAT17(cVar160,CONCAT16(uVar136,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar138,CONCAT11(cVar161,uVar137)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar139,uVar15));
      uVar27 = CONCAT17(cVar164,CONCAT16(uVar140,uVar16));
      uVar18 = CONCAT13(cVar158,CONCAT12(uVar126,CONCAT11(cVar157,uVar125)));
      uVar19 = CONCAT15(cVar159,CONCAT14(uVar127,uVar18));
      uVar37 = CONCAT17(cVar160,CONCAT16(uVar128,uVar19));
      uVar24 = CONCAT13(cVar162,CONCAT12(uVar130,CONCAT11(cVar161,uVar129)));
      uVar25 = CONCAT15(cVar163,CONCAT14(uVar131,uVar24));
      uVar41 = CONCAT17(cVar164,CONCAT16(uVar132,uVar25));
      uVar32 = CONCAT13(cVar158,CONCAT12(uVar118,CONCAT11(cVar157,uVar117)));
      uVar33 = CONCAT15(cVar159,CONCAT14(uVar119,uVar32));
      uVar46 = CONCAT17(cVar160,CONCAT16(uVar120,uVar33));
      uVar35 = CONCAT13(cVar162,CONCAT12(uVar122,CONCAT11(cVar161,uVar121)));
      uVar36 = CONCAT15(cVar163,CONCAT14(uVar123,uVar35));
      uVar55 = CONCAT17(cVar164,CONCAT16(uVar124,uVar36));
      local_cb8._2_2_ = (short)((uint)uVar32 >> 0x10);
      local_cb8._4_2_ = (short)((uint6)uVar33 >> 0x20);
      local_cb8._6_2_ = (short)((ulong)uVar46 >> 0x30);
      uStack_cb0._2_2_ = (short)((uint)uVar35 >> 0x10);
      uStack_cb0._4_2_ = (short)((uint6)uVar36 >> 0x20);
      uStack_cb0._6_2_ = (short)((ulong)uVar55 >> 0x30);
      local_cc8._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_cc8._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_cc8._6_2_ = (short)((ulong)uVar22 >> 0x30);
      uStack_cc0._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_cc0._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_cc0._6_2_ = (short)((ulong)uVar27 >> 0x30);
      local_ce8 = CONCAT11(cVar157,uVar117) + CONCAT11(cVar157,uVar133);
      sStack_ce6 = local_cb8._2_2_ + local_cc8._2_2_;
      sStack_ce4 = local_cb8._4_2_ + local_cc8._4_2_;
      sStack_ce2 = local_cb8._6_2_ + local_cc8._6_2_;
      sStack_ce0 = CONCAT11(cVar161,uVar121) + CONCAT11(cVar161,uVar137);
      sStack_cde = uStack_cb0._2_2_ + uStack_cc0._2_2_;
      sStack_cdc = uStack_cb0._4_2_ + uStack_cc0._4_2_;
      sStack_cda = uStack_cb0._6_2_ + uStack_cc0._6_2_;
      local_cd8._2_2_ = (short)((uint)uVar18 >> 0x10);
      local_cd8._4_2_ = (short)((uint6)uVar19 >> 0x20);
      local_cd8._6_2_ = (short)((ulong)uVar37 >> 0x30);
      uStack_cd0._2_2_ = (short)((uint)uVar24 >> 0x10);
      uStack_cd0._4_2_ = (short)((uint6)uVar25 >> 0x20);
      uStack_cd0._6_2_ = (short)((ulong)uVar41 >> 0x30);
      local_d08 = CONCAT11(cVar157,uVar125) + local_ce8;
      sStack_d06 = local_cd8._2_2_ + sStack_ce6;
      sStack_d04 = local_cd8._4_2_ + sStack_ce4;
      sStack_d02 = local_cd8._6_2_ + sStack_ce2;
      sStack_d00 = CONCAT11(cVar161,uVar129) + sStack_ce0;
      sStack_cfe = uStack_cd0._2_2_ + sStack_cde;
      sStack_cfc = uStack_cd0._4_2_ + sStack_cdc;
      sStack_cfa = uStack_cd0._6_2_ + sStack_cda;
      sVar240 = sVar239 + sStack_d00;
      sVar254 = sVar252 + sStack_cfe;
      sVar253 = sVar264 + sStack_cfc;
      sVar190 = sVar274 + sStack_cfa;
      local_d18 = CONCAT26(sVar222,CONCAT24(sVar211,CONCAT22(sVar201,sVar182)));
      uStack_d10 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      local_d28 = CONCAT26(sVar227 + sStack_d02,
                           CONCAT24(sVar216 + sStack_d04,
                                    CONCAT22(sVar206 + sStack_d06,sVar192 + local_d08)));
      uStack_d20 = CONCAT26(sVar190,CONCAT24(sVar253,CONCAT22(sVar254,sVar240)));
      in_stack_ffffffffffffe148 = sVar182 + sVar192 + local_d08;
      in_stack_ffffffffffffe14a = sVar201 + sVar206 + sStack_d06;
      in_stack_ffffffffffffe14c = sVar211 + sVar216 + sStack_d04;
      in_stack_ffffffffffffe14e = sVar222 + sVar227 + sStack_d02;
      local_d48 = CONCAT26(sVar190,CONCAT24(sVar253,CONCAT22(sVar254,sVar240)));
      local_d38 = local_1fc8;
      uStack_d40 = 0;
      local_1908 = CONCAT26(in_stack_ffffffffffffe14e,
                            CONCAT24(in_stack_ffffffffffffe14c,
                                     CONCAT22(in_stack_ffffffffffffe14a,in_stack_ffffffffffffe148)))
      ;
      uStack_1900 = CONCAT26(sVar268 + sVar190,
                             CONCAT24(sVar258 + sVar253,
                                      CONCAT22(sVar246 + sVar254,sVar230 + sVar240)));
      local_1918 = CONCAT26(local_bb8._6_2_ + sVar190,
                            CONCAT24(local_bb8._4_2_ + sVar253,
                                     CONCAT22(local_bb8._2_2_ + sVar254,(short)local_bb8 + sVar240))
                           );
      uStack_1910 = CONCAT26(uStack_bb0._6_2_,
                             CONCAT24(uStack_bb0._4_2_,CONCAT22(uStack_bb0._2_2_,(short)uStack_bb0))
                            );
      local_148c = 4;
      uVar191 = in_stack_ffffffffffffe148 >> 4;
      uVar189 = in_stack_ffffffffffffe14a >> 4;
      uVar188 = in_stack_ffffffffffffe14c >> 4;
      uVar205 = in_stack_ffffffffffffe14e >> 4;
      uVar204 = (ushort)((short)local_bb8 + sVar240) >> 4;
      uVar215 = (ushort)(local_bb8._2_2_ + sVar254) >> 4;
      uVar214 = (ushort)(local_bb8._4_2_ + sVar253) >> 4;
      uVar226 = (ushort)(local_bb8._6_2_ + sVar190) >> 4;
      local_1be8._0_4_ = CONCAT22(uVar189,uVar191);
      local_1be8._0_6_ = CONCAT24(uVar188,(undefined4)local_1be8);
      local_1be8 = CONCAT26(uVar205,(undefined6)local_1be8);
      uStack_1be0._0_4_ = CONCAT22(uVar215,uVar204);
      uStack_1be0._0_6_ = CONCAT24(uVar214,(undefined4)uStack_1be0);
      uStack_1be0 = CONCAT26(uVar226,(undefined6)uStack_1be0);
      local_128 = local_1be8;
      uStack_120 = uStack_1be0;
      local_138 = local_1be8;
      uStack_130 = uStack_1be0;
      local_1be8._0_4_ =
           CONCAT13((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205),
                    CONCAT12((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188),
                             CONCAT11((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189),
                                      (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 -
                                      (0xff < uVar191))));
      local_1be8._0_6_ =
           CONCAT15((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                    CONCAT14((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204),
                             (undefined4)local_1be8));
      local_1be8 = CONCAT17((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                            CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                     (0xff < uVar214),(undefined6)local_1be8));
      uStack_1be0._0_4_ =
           CONCAT13((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205),
                    CONCAT12((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188),
                             CONCAT11((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189),
                                      (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 -
                                      (0xff < uVar191))));
      uStack_1be0._0_6_ =
           CONCAT15((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                    CONCAT14((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204),
                             (undefined4)uStack_1be0));
      uStack_1be0 = CONCAT17((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                             CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                      (0xff < uVar214),(undefined6)uStack_1be0));
      local_d58 = CONCAT26(sVar227,CONCAT24(sVar216,CONCAT22(sVar206,sVar192)));
      uStack_d50 = CONCAT26(sVar274,CONCAT24(sVar264,CONCAT22(sVar252,sVar239)));
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar102,CONCAT11(cVar157,uVar101)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar103,uVar9));
      uVar70 = CONCAT17(cVar160,CONCAT16(uVar104,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar106,CONCAT11(cVar161,uVar105)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar107,uVar15));
      uVar77 = CONCAT17(cVar164,CONCAT16(uVar108,uVar16));
      local_d68._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_d68._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_d68._6_2_ = (short)((ulong)uVar70 >> 0x30);
      uStack_d60._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_d60._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_d60._6_2_ = (short)((ulong)uVar77 >> 0x30);
      sVar192 = sVar192 + CONCAT11(cVar157,uVar101);
      sVar206 = sVar206 + local_d68._2_2_;
      sVar216 = sVar216 + local_d68._4_2_;
      sVar227 = sVar227 + local_d68._6_2_;
      sVar239 = sVar239 + CONCAT11(cVar161,uVar105);
      sVar252 = sVar252 + uStack_d60._2_2_;
      sVar264 = sVar264 + uStack_d60._4_2_;
      sVar274 = sVar274 + uStack_d60._6_2_;
      local_738 = CONCAT26(sVar222,CONCAT24(sVar211,CONCAT22(sVar201,sVar182)));
      uStack_730 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      uStack_740 = 0;
      sVar182 = sVar182 - sVar255;
      sVar201 = sVar201 - sVar172;
      sVar211 = sVar211 - sVar173;
      sVar222 = sVar222 - sVar174;
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar134,CONCAT11(cVar157,uVar133)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar135,uVar9));
      uVar23 = CONCAT17(cVar160,CONCAT16(uVar136,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar138,CONCAT11(cVar161,uVar137)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar139,uVar15));
      uVar28 = CONCAT17(cVar164,CONCAT16(uVar140,uVar16));
      local_758 = local_1fc8;
      local_768._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_768._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_768._6_2_ = (short)((ulong)uVar23 >> 0x30);
      uStack_760._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_760._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_760._6_2_ = (short)((ulong)uVar28 >> 0x30);
      local_bb8._0_2_ = (short)local_bb8 - CONCAT11(cVar157,uVar133);
      local_bb8._2_2_ = local_bb8._2_2_ - local_768._2_2_;
      local_bb8._4_2_ = local_bb8._4_2_ - local_768._4_2_;
      local_bb8._6_2_ = local_bb8._6_2_ - local_768._6_2_;
      uStack_bb0._0_2_ = (short)uStack_bb0 - CONCAT11(cVar161,uVar137);
      uStack_bb0._2_2_ = uStack_bb0._2_2_ - uStack_760._2_2_;
      uStack_bb0._4_2_ = uStack_bb0._4_2_ - uStack_760._4_2_;
      uStack_bb0._6_2_ = uStack_bb0._6_2_ - uStack_760._6_2_;
      local_1fc8._0_4_ = CONCAT22(local_bb8._2_2_,(short)local_bb8);
      local_1fc8._0_6_ = CONCAT24(local_bb8._4_2_,(undefined4)local_1fc8);
      local_1fc8 = CONCAT26(local_bb8._6_2_,(undefined6)local_1fc8);
      uStack_df0 = CONCAT26(uStack_bb0._6_2_,
                            CONCAT24(uStack_bb0._4_2_,CONCAT22(uStack_bb0._2_2_,(short)uStack_bb0)))
      ;
      local_db8 = CONCAT26(sVar227,CONCAT24(sVar216,CONCAT22(sVar206,sVar192)));
      uStack_db0 = CONCAT26(sVar274,CONCAT24(sVar264,CONCAT22(sVar252,sVar239)));
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar126,CONCAT11(cVar157,uVar125)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar127,uVar9));
      uVar38 = CONCAT17(cVar160,CONCAT16(uVar128,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar130,CONCAT11(cVar161,uVar129)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar131,uVar15));
      uVar44 = CONCAT17(cVar164,CONCAT16(uVar132,uVar16));
      uVar18 = CONCAT13(cVar158,CONCAT12(uVar118,CONCAT11(cVar157,uVar117)));
      uVar19 = CONCAT15(cVar159,CONCAT14(uVar119,uVar18));
      uVar50 = CONCAT17(cVar160,CONCAT16(uVar120,uVar19));
      uVar24 = CONCAT13(cVar162,CONCAT12(uVar122,CONCAT11(cVar161,uVar121)));
      uVar25 = CONCAT15(cVar163,CONCAT14(uVar123,uVar24));
      uVar56 = CONCAT17(cVar164,CONCAT16(uVar124,uVar25));
      local_da8 = CONCAT11(cVar157,uVar109);
      uVar32 = CONCAT13(cVar158,CONCAT12(uVar110,local_da8));
      uVar33 = CONCAT15(cVar159,CONCAT14(uVar111,uVar32));
      uVar58 = CONCAT17(cVar160,CONCAT16(uVar112,uVar33));
      sStack_da0 = CONCAT11(cVar161,uVar113);
      uVar35 = CONCAT13(cVar162,CONCAT12(uVar114,sStack_da0));
      uVar36 = CONCAT15(cVar163,CONCAT14(uVar115,uVar35));
      uVar63 = CONCAT17(cVar164,CONCAT16(uVar116,uVar36));
      local_d78._2_2_ = (short)((uint)uVar32 >> 0x10);
      local_d78._4_2_ = (short)((uint6)uVar33 >> 0x20);
      local_d78._6_2_ = (short)((ulong)uVar58 >> 0x30);
      uStack_d70._2_2_ = (short)((uint)uVar35 >> 0x10);
      uStack_d70._4_2_ = (short)((uint6)uVar36 >> 0x20);
      uStack_d70._6_2_ = (short)((ulong)uVar63 >> 0x30);
      local_d88._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_d88._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_d88._6_2_ = (short)((ulong)uVar38 >> 0x30);
      uStack_d80._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_d80._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_d80._6_2_ = (short)((ulong)uVar44 >> 0x30);
      local_da8 = local_da8 + CONCAT11(cVar157,uVar125);
      sStack_da6 = local_d78._2_2_ + local_d88._2_2_;
      sStack_da4 = local_d78._4_2_ + local_d88._4_2_;
      sStack_da2 = local_d78._6_2_ + local_d88._6_2_;
      sStack_da0 = sStack_da0 + CONCAT11(cVar161,uVar129);
      sStack_d9e = uStack_d70._2_2_ + uStack_d80._2_2_;
      sStack_d9c = uStack_d70._4_2_ + uStack_d80._4_2_;
      sStack_d9a = uStack_d70._6_2_ + uStack_d80._6_2_;
      local_d98._2_2_ = (short)((uint)uVar18 >> 0x10);
      local_d98._4_2_ = (short)((uint6)uVar19 >> 0x20);
      local_d98._6_2_ = (short)((ulong)uVar50 >> 0x30);
      uStack_d90._2_2_ = (short)((uint)uVar24 >> 0x10);
      uStack_d90._4_2_ = (short)((uint6)uVar25 >> 0x20);
      uStack_d90._6_2_ = (short)((ulong)uVar56 >> 0x30);
      local_dc8 = CONCAT11(cVar157,uVar117) + local_da8;
      sStack_dc6 = local_d98._2_2_ + sStack_da6;
      sStack_dc4 = local_d98._4_2_ + sStack_da4;
      sStack_dc2 = local_d98._6_2_ + sStack_da2;
      sStack_dc0 = CONCAT11(cVar161,uVar121) + sStack_da0;
      sStack_dbe = uStack_d90._2_2_ + sStack_d9e;
      sStack_dbc = uStack_d90._4_2_ + sStack_d9c;
      sStack_dba = uStack_d90._6_2_ + sStack_d9a;
      sVar240 = sVar239 + sStack_dc0;
      sVar255 = sVar252 + sStack_dbe;
      sVar254 = sVar264 + sStack_dbc;
      sVar253 = sVar274 + sStack_dba;
      local_dd8 = CONCAT26(sVar222,CONCAT24(sVar211,CONCAT22(sVar201,sVar182)));
      uStack_dd0 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      local_de8 = CONCAT26(sVar227 + sStack_dc2,
                           CONCAT24(sVar216 + sStack_dc4,
                                    CONCAT22(sVar206 + sStack_dc6,sVar192 + local_dc8)));
      uStack_de0 = CONCAT26(sVar253,CONCAT24(sVar254,CONCAT22(sVar255,sVar240)));
      uVar191 = sVar182 + sVar192 + local_dc8;
      uVar189 = sVar201 + sVar206 + sStack_dc6;
      uVar188 = sVar211 + sVar216 + sStack_dc4;
      uVar205 = sVar222 + sVar227 + sStack_dc2;
      local_e08 = CONCAT26(sVar253,CONCAT24(sVar254,CONCAT22(sVar255,sVar240)));
      local_df8 = local_1fc8;
      uStack_e00 = 0;
      local_1928 = CONCAT26(uVar205,CONCAT24(uVar188,CONCAT22(uVar189,uVar191)));
      uStack_1920 = CONCAT26(sVar268 + sVar253,
                             CONCAT24(sVar258 + sVar254,
                                      CONCAT22(sVar246 + sVar255,sVar230 + sVar240)));
      local_1938 = CONCAT26(local_bb8._6_2_ + sVar253,
                            CONCAT24(local_bb8._4_2_ + sVar254,
                                     CONCAT22(local_bb8._2_2_ + sVar255,(short)local_bb8 + sVar240))
                           );
      uStack_1930 = CONCAT26(uStack_bb0._6_2_,
                             CONCAT24(uStack_bb0._4_2_,CONCAT22(uStack_bb0._2_2_,(short)uStack_bb0))
                            );
      local_14ac = 4;
      uVar191 = uVar191 >> 4;
      uVar189 = uVar189 >> 4;
      uVar188 = uVar188 >> 4;
      uVar205 = uVar205 >> 4;
      uVar204 = (ushort)((short)local_bb8 + sVar240) >> 4;
      uVar215 = (ushort)(local_bb8._2_2_ + sVar255) >> 4;
      uVar214 = (ushort)(local_bb8._4_2_ + sVar254) >> 4;
      uVar226 = (ushort)(local_bb8._6_2_ + sVar253) >> 4;
      local_1bd8._0_4_ = CONCAT22(uVar189,uVar191);
      local_1bd8._0_6_ = CONCAT24(uVar188,(undefined4)local_1bd8);
      local_1bd8 = CONCAT26(uVar205,(undefined6)local_1bd8);
      uStack_1bd0._0_4_ = CONCAT22(uVar215,uVar204);
      uStack_1bd0._0_6_ = CONCAT24(uVar214,(undefined4)uStack_1bd0);
      uStack_1bd0 = CONCAT26(uVar226,(undefined6)uStack_1bd0);
      local_148 = local_1bd8;
      uStack_140 = uStack_1bd0;
      local_158 = local_1bd8;
      uStack_150 = uStack_1bd0;
      local_1bd8._0_4_ =
           CONCAT13((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205),
                    CONCAT12((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188),
                             CONCAT11((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189),
                                      (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 -
                                      (0xff < uVar191))));
      local_1bd8._0_6_ =
           CONCAT15((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                    CONCAT14((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204),
                             (undefined4)local_1bd8));
      local_1bd8 = CONCAT17((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                            CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                     (0xff < uVar214),(undefined6)local_1bd8));
      uStack_1bd0._0_4_ =
           CONCAT13((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205),
                    CONCAT12((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188),
                             CONCAT11((uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189),
                                      (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 -
                                      (0xff < uVar191))));
      uStack_1bd0._0_6_ =
           CONCAT15((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                    CONCAT14((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204),
                             (undefined4)uStack_1bd0));
      uStack_1bd0 = CONCAT17((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                             CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                      (0xff < uVar214),(undefined6)uStack_1bd0));
      local_e18 = CONCAT26(sVar227,CONCAT24(sVar216,CONCAT22(sVar206,sVar192)));
      uStack_e10 = CONCAT26(sVar274,CONCAT24(sVar264,CONCAT22(sVar252,sVar239)));
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar102,CONCAT11(cVar157,uVar101)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar103,uVar9));
      uVar71 = CONCAT17(cVar160,CONCAT16(uVar104,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar106,CONCAT11(cVar161,uVar105)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar107,uVar15));
      uVar78 = CONCAT17(cVar164,CONCAT16(uVar108,uVar16));
      local_e28._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_e28._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_e28._6_2_ = (short)((ulong)uVar71 >> 0x30);
      uStack_e20._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_e20._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_e20._6_2_ = (short)((ulong)uVar78 >> 0x30);
      sVar192 = sVar192 + CONCAT11(cVar157,uVar101);
      sVar239 = sVar239 + CONCAT11(cVar161,uVar105);
      local_778 = CONCAT26(sVar222,CONCAT24(sVar211,CONCAT22(sVar201,sVar182)));
      uStack_770 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      uStack_780 = 0;
      sVar240 = CONCAT11(cVar157,uVar141);
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar142,sVar240));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar143,uVar9));
      uVar13 = CONCAT17(cVar160,CONCAT16(uVar144,uVar10));
      sVar255 = CONCAT11(cVar161,uVar145);
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar146,sVar255));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar147,uVar15));
      uVar20 = CONCAT17(cVar164,CONCAT16(uVar148,uVar16));
      local_798 = local_1fc8;
      local_7a8._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_7a8._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_7a8._6_2_ = (short)((ulong)uVar13 >> 0x30);
      uStack_7a0._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_7a0._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_7a0._6_2_ = (short)((ulong)uVar20 >> 0x30);
      local_bb8._0_2_ = (short)local_bb8 - sVar240;
      uStack_bb0._0_2_ = (short)uStack_bb0 - sVar255;
      local_1fc8._0_4_ = CONCAT22(local_bb8._2_2_ - local_7a8._2_2_,(short)local_bb8);
      local_1fc8._0_6_ = CONCAT24(local_bb8._4_2_ - local_7a8._4_2_,(undefined4)local_1fc8);
      local_1fc8 = CONCAT26(local_bb8._6_2_ - local_7a8._6_2_,(undefined6)local_1fc8);
      uStack_eb0 = CONCAT26(uStack_bb0._6_2_ - uStack_7a0._6_2_,
                            CONCAT24(uStack_bb0._4_2_ - uStack_7a0._4_2_,
                                     CONCAT22(uStack_bb0._2_2_ - uStack_7a0._2_2_,(short)uStack_bb0)
                                    ));
      local_e78 = CONCAT26(sVar227 + local_e28._6_2_,
                           CONCAT24(sVar216 + local_e28._4_2_,
                                    CONCAT22(sVar206 + local_e28._2_2_,sVar192)));
      uStack_e70 = CONCAT26(sVar274 + uStack_e20._6_2_,
                            CONCAT24(sVar264 + uStack_e20._4_2_,
                                     CONCAT22(sVar252 + uStack_e20._2_2_,sVar239)));
      uVar9 = CONCAT13(cVar158,CONCAT12(uVar118,CONCAT11(cVar157,uVar117)));
      uVar10 = CONCAT15(cVar159,CONCAT14(uVar119,uVar9));
      uVar53 = CONCAT17(cVar160,CONCAT16(uVar120,uVar10));
      uVar15 = CONCAT13(cVar162,CONCAT12(uVar122,CONCAT11(cVar161,uVar121)));
      uVar16 = CONCAT15(cVar163,CONCAT14(uVar123,uVar15));
      uVar57 = CONCAT17(cVar164,CONCAT16(uVar124,uVar16));
      local_e88 = CONCAT11(cVar157,uVar109);
      uVar18 = CONCAT13(cVar158,CONCAT12(uVar110,local_e88));
      uVar19 = CONCAT15(cVar159,CONCAT14(uVar111,uVar18));
      uVar62 = CONCAT17(cVar160,CONCAT16(uVar112,uVar19));
      sStack_e80 = CONCAT11(cVar161,uVar113);
      uVar24 = CONCAT13(cVar162,CONCAT12(uVar114,sStack_e80));
      uVar25 = CONCAT15(cVar163,CONCAT14(uVar115,uVar24));
      uVar64 = CONCAT17(cVar164,CONCAT16(uVar116,uVar25));
      uVar32 = CONCAT13(cVar158,CONCAT12(uVar102,CONCAT11(cVar157,uVar101)));
      uVar33 = CONCAT15(cVar159,CONCAT14(uVar103,uVar32));
      uVar72 = CONCAT17(cVar160,CONCAT16(uVar104,uVar33));
      uVar35 = CONCAT13(cVar162,CONCAT12(uVar106,CONCAT11(cVar161,uVar105)));
      uVar36 = CONCAT15(cVar163,CONCAT14(uVar107,uVar35));
      uVar79 = CONCAT17(cVar164,CONCAT16(uVar108,uVar36));
      local_e38._2_2_ = (short)((uint)uVar32 >> 0x10);
      local_e38._4_2_ = (short)((uint6)uVar33 >> 0x20);
      local_e38._6_2_ = (short)((ulong)uVar72 >> 0x30);
      uStack_e30._2_2_ = (short)((uint)uVar35 >> 0x10);
      uStack_e30._4_2_ = (short)((uint6)uVar36 >> 0x20);
      uStack_e30._6_2_ = (short)((ulong)uVar79 >> 0x30);
      local_e48._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_e48._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_e48._6_2_ = (short)((ulong)uVar53 >> 0x30);
      uStack_e40._2_2_ = (short)((uint)uVar15 >> 0x10);
      uStack_e40._4_2_ = (short)((uint6)uVar16 >> 0x20);
      uStack_e40._6_2_ = (short)((ulong)uVar57 >> 0x30);
      local_e68 = CONCAT11(cVar157,uVar101) + CONCAT11(cVar157,uVar117);
      sStack_e66 = local_e38._2_2_ + local_e48._2_2_;
      sStack_e64 = local_e38._4_2_ + local_e48._4_2_;
      sStack_e62 = local_e38._6_2_ + local_e48._6_2_;
      sStack_e60 = CONCAT11(cVar161,uVar105) + CONCAT11(cVar161,uVar121);
      sStack_e5e = uStack_e30._2_2_ + uStack_e40._2_2_;
      sStack_e5c = uStack_e30._4_2_ + uStack_e40._4_2_;
      sStack_e5a = uStack_e30._6_2_ + uStack_e40._6_2_;
      local_e58._2_2_ = (short)((uint)uVar18 >> 0x10);
      local_e58._4_2_ = (short)((uint6)uVar19 >> 0x20);
      local_e58._6_2_ = (short)((ulong)uVar62 >> 0x30);
      uStack_e50._2_2_ = (short)((uint)uVar24 >> 0x10);
      uStack_e50._4_2_ = (short)((uint6)uVar25 >> 0x20);
      uStack_e50._6_2_ = (short)((ulong)uVar64 >> 0x30);
      local_e88 = local_e88 + local_e68;
      sStack_e86 = local_e58._2_2_ + sStack_e66;
      sStack_e84 = local_e58._4_2_ + sStack_e64;
      sStack_e82 = local_e58._6_2_ + sStack_e62;
      sStack_e80 = sStack_e80 + sStack_e60;
      sStack_e7e = uStack_e50._2_2_ + sStack_e5e;
      sStack_e7c = uStack_e50._4_2_ + sStack_e5c;
      sStack_e7a = uStack_e50._6_2_ + sStack_e5a;
      sVar192 = sVar192 + local_e88;
      sVar240 = sVar206 + local_e28._2_2_ + sStack_e86;
      sVar255 = sVar216 + local_e28._4_2_ + sStack_e84;
      sVar254 = sVar227 + local_e28._6_2_ + sStack_e82;
      sVar239 = sVar239 + sStack_e80;
      sVar253 = sVar252 + uStack_e20._2_2_ + sStack_e7e;
      sVar206 = sVar264 + uStack_e20._4_2_ + sStack_e7c;
      sVar216 = sVar274 + uStack_e20._6_2_ + sStack_e7a;
      local_e98 = CONCAT26(sVar222 - sVar200,
                           CONCAT24(sVar211 - sVar187,CONCAT22(sVar201 - sVar181,sVar182 - sVar31)))
      ;
      uStack_e90 = CONCAT26(sVar268,CONCAT24(sVar258,CONCAT22(sVar246,sVar230)));
      local_ea8 = CONCAT26(sVar254,CONCAT24(sVar255,CONCAT22(sVar240,sVar192)));
      uStack_ea0 = CONCAT26(sVar216,CONCAT24(sVar206,CONCAT22(sVar253,sVar239)));
      uVar189 = (sVar182 - sVar31) + sVar192;
      uVar205 = (sVar201 - sVar181) + sVar240;
      uVar215 = (sVar211 - sVar187) + sVar255;
      uVar226 = (sVar222 - sVar200) + sVar254;
      local_ec8 = CONCAT26(sVar216,CONCAT24(sVar206,CONCAT22(sVar253,sVar239)));
      local_eb8 = local_1fc8;
      uStack_ec0 = 0;
      uVar191 = (short)local_bb8 + sVar239;
      uVar188 = (local_bb8._2_2_ - local_7a8._2_2_) + sVar253;
      uVar204 = (local_bb8._4_2_ - local_7a8._4_2_) + sVar206;
      uVar214 = (local_bb8._6_2_ - local_7a8._6_2_) + sVar216;
      local_1948 = CONCAT26(uVar226,CONCAT24(uVar215,CONCAT22(uVar205,uVar189)));
      uStack_1940 = CONCAT26(sVar268 + sVar216,
                             CONCAT24(sVar258 + sVar206,
                                      CONCAT22(sVar246 + sVar253,sVar230 + sVar239)));
      local_1958 = CONCAT26(uVar214,CONCAT24(uVar204,CONCAT22(uVar188,uVar191)));
      uStack_1950 = CONCAT26(uStack_bb0._6_2_ - uStack_7a0._6_2_,
                             CONCAT24(uStack_bb0._4_2_ - uStack_7a0._4_2_,
                                      CONCAT22(uStack_bb0._2_2_ - uStack_7a0._2_2_,(short)uStack_bb0
                                              )));
      local_14cc = 4;
      uVar189 = uVar189 >> 4;
      uVar205 = uVar205 >> 4;
      uVar215 = uVar215 >> 4;
      uVar226 = uVar226 >> 4;
      uVar191 = uVar191 >> 4;
      uVar188 = uVar188 >> 4;
      uVar204 = uVar204 >> 4;
      uVar214 = uVar214 >> 4;
      local_1bc8._0_4_ = CONCAT22(uVar205,uVar189);
      local_1bc8._0_6_ = CONCAT24(uVar215,(undefined4)local_1bc8);
      local_1bc8 = CONCAT26(uVar226,(undefined6)local_1bc8);
      uStack_1bc0._0_4_ = CONCAT22(uVar188,uVar191);
      uStack_1bc0._0_6_ = CONCAT24(uVar204,(undefined4)uStack_1bc0);
      uStack_1bc0 = CONCAT26(uVar214,(undefined6)uStack_1bc0);
      local_168 = local_1bc8;
      uStack_160 = uStack_1bc0;
      local_178 = local_1bc8;
      uStack_170 = uStack_1bc0;
      local_1bc8._0_4_ =
           CONCAT13((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                    CONCAT12((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                             CONCAT11((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 -
                                      (0xff < uVar205),
                                      (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189))));
      local_1bc8._0_6_ =
           CONCAT15((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188),
                    CONCAT14((uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191),
                             (undefined4)local_1bc8));
      local_1bc8 = CONCAT17((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                            CONCAT16((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 -
                                     (0xff < uVar204),(undefined6)local_1bc8));
      uStack_1bc0._0_4_ =
           CONCAT13((uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226),
                    CONCAT12((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                             CONCAT11((uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 -
                                      (0xff < uVar205),
                                      (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 -
                                      (0xff < uVar189))));
      uStack_1bc0._0_6_ =
           CONCAT15((uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188),
                    CONCAT14((uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191),
                             (undefined4)uStack_1bc0));
      uStack_1bc0 = CONCAT17((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                             CONCAT16((uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 -
                                      (0xff < uVar204),(undefined6)uStack_1bc0));
      local_f58 = (*local_1b40)[0];
      uStack_f50 = (*local_1b40)[1];
      local_f48 = local_1bb8._0_8_;
      uStack_f40 = local_1bb8._8_8_;
      uVar177 = ~local_1bb8._8_8_ & uStack_f50;
      uStack_18d0 = uVar277;
      local_14c8 = local_1948;
      uStack_14c0 = local_1958;
      local_14a8 = local_1928;
      uStack_14a0 = local_1938;
      local_1488 = local_1908;
      uStack_1480 = local_1918;
      local_1468 = local_18e8;
      uStack_1460 = local_18f8;
      local_1448 = local_18c8;
      uStack_1440 = local_18d8;
      local_1428 = local_18a8;
      uStack_1420 = local_18b8;
      local_e58 = uVar62;
      uStack_e50 = uVar64;
      local_e48 = uVar53;
      uStack_e40 = uVar57;
      local_e38 = uVar72;
      uStack_e30 = uVar79;
      local_e28 = uVar71;
      uStack_e20 = uVar78;
      local_d98 = uVar50;
      uStack_d90 = uVar56;
      local_d88 = uVar38;
      uStack_d80 = uVar44;
      local_d78 = uVar58;
      uStack_d70 = uVar63;
      local_d68 = uVar70;
      uStack_d60 = uVar77;
      local_cd8 = uVar37;
      uStack_cd0 = uVar41;
      local_cc8 = uVar22;
      uStack_cc0 = uVar27;
      local_cb8 = uVar46;
      uStack_cb0 = uVar55;
      local_ca8 = uVar69;
      uStack_ca0 = uVar76;
      local_c18 = uVar21;
      uStack_c10 = uVar26;
      local_c08 = uVar12;
      uStack_c00 = uVar17;
      local_bf8 = uVar29;
      uStack_bf0 = uVar39;
      local_be8 = uVar65;
      uStack_be0 = uVar75;
      local_bb8 = uVar165;
      uStack_bb0 = uVar277;
      local_b68 = uVar8;
      uStack_b60 = uVar11;
      sStack_b40 = sVar232;
      sStack_b3e = sVar248;
      sStack_b3c = sVar260;
      sStack_b3a = sVar270;
      local_b28 = uVar14;
      local_7a8 = uVar13;
      uStack_7a0 = uVar20;
      uStack_790 = uStack_df0;
      local_788 = uVar30;
      local_768 = uVar23;
      uStack_760 = uVar28;
      uStack_750 = uStack_d30;
      local_748 = uVar47;
      local_728 = uVar34;
      uStack_720 = uVar40;
      uStack_710 = uStack_c70;
      local_708 = uVar59;
      local_6e8 = uVar45;
      uStack_6e0 = uVar54;
      uStack_6d0 = uVar277;
      local_6c8 = uVar66;
      (*local_1b40)[0] = ~local_1bb8._0_8_ & local_f58;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b40;
      local_12e8 = local_1bb8._0_8_;
      uStack_12e0 = local_1bb8._8_8_;
      local_12f8 = local_1c18;
      uStack_12f0 = uStack_1c10;
      local_1c18 = local_1bb8._0_8_ & local_1c18;
      uStack_1c10 = local_1bb8._8_8_ & uStack_1c10;
      local_1068 = (*local_1b40)[0];
      uStack_1060 = (*local_1b40)[1];
      uVar177 = uStack_1060 | uStack_1c10;
      local_1078 = local_1c18;
      uStack_1070 = uStack_1c10;
      (*local_1b40)[0] = local_1068 | local_1c18;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b38;
      local_f78 = (*local_1b38)[0];
      uStack_f70 = (*local_1b38)[1];
      local_f68 = local_1bb8._0_8_;
      uStack_f60 = local_1bb8._8_8_;
      uVar177 = ~local_1bb8._8_8_ & uStack_f70;
      (*local_1b38)[0] = ~local_1bb8._0_8_ & local_f78;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b38;
      local_1308 = local_1bb8._0_8_;
      uStack_1300 = local_1bb8._8_8_;
      local_1318 = local_1c08;
      uStack_1310 = uStack_1c00;
      local_1c08 = local_1bb8._0_8_ & local_1c08;
      uStack_1c00 = local_1bb8._8_8_ & uStack_1c00;
      local_1088 = (*local_1b38)[0];
      uStack_1080 = (*local_1b38)[1];
      uVar177 = uStack_1080 | uStack_1c00;
      local_1098 = local_1c08;
      uStack_1090 = uStack_1c00;
      (*local_1b38)[0] = local_1088 | local_1c08;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b30;
      local_f98 = (*local_1b30)[0];
      uStack_f90 = (*local_1b30)[1];
      local_f88 = local_1bb8._0_8_;
      uStack_f80 = local_1bb8._8_8_;
      uVar177 = ~local_1bb8._8_8_ & uStack_f90;
      (*local_1b30)[0] = ~local_1bb8._0_8_ & local_f98;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b30;
      local_1328 = local_1bb8._0_8_;
      uStack_1320 = local_1bb8._8_8_;
      local_1338 = local_1bf8;
      uStack_1330 = uStack_1bf0;
      local_1bf8 = local_1bb8._0_8_ & local_1bf8;
      uStack_1bf0 = local_1bb8._8_8_ & uStack_1bf0;
      local_10a8 = (*local_1b30)[0];
      uStack_10a0 = (*local_1b30)[1];
      uVar177 = uStack_10a0 | uStack_1bf0;
      local_10b8 = local_1bf8;
      uStack_10b0 = uStack_1bf0;
      (*local_1b30)[0] = local_10a8 | local_1bf8;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b28;
      local_fb8 = (*local_1b28)[0];
      uStack_fb0 = (*local_1b28)[1];
      local_fa8 = local_1bb8._0_8_;
      uStack_fa0 = local_1bb8._8_8_;
      uVar177 = ~local_1bb8._8_8_ & uStack_fb0;
      (*local_1b28)[0] = ~local_1bb8._0_8_ & local_fb8;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b28;
      local_1348 = local_1bb8._0_8_;
      uStack_1340 = local_1bb8._8_8_;
      local_1358 = local_1be8;
      uStack_1350 = uStack_1be0;
      local_1be8 = local_1bb8._0_8_ & local_1be8;
      uStack_1be0 = local_1bb8._8_8_ & uStack_1be0;
      local_10c8 = (*local_1b28)[0];
      uStack_10c0 = (*local_1b28)[1];
      uVar177 = uStack_10c0 | uStack_1be0;
      local_10d8 = local_1be8;
      uStack_10d0 = uStack_1be0;
      (*local_1b28)[0] = local_10c8 | local_1be8;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b20;
      local_fd8 = (*local_1b20)[0];
      uStack_fd0 = (*local_1b20)[1];
      local_fc8 = local_1bb8._0_8_;
      uStack_fc0 = local_1bb8._8_8_;
      uVar177 = ~local_1bb8._8_8_ & uStack_fd0;
      (*local_1b20)[0] = ~local_1bb8._0_8_ & local_fd8;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b20;
      local_1368 = local_1bb8._0_8_;
      uStack_1360 = local_1bb8._8_8_;
      local_1378 = local_1bd8;
      uStack_1370 = uStack_1bd0;
      local_1bd8 = local_1bb8._0_8_ & local_1bd8;
      uStack_1bd0 = local_1bb8._8_8_ & uStack_1bd0;
      local_10e8 = (*local_1b20)[0];
      uStack_10e0 = (*local_1b20)[1];
      uVar177 = uStack_10e0 | uStack_1bd0;
      local_10f8 = local_1bd8;
      uStack_10f0 = uStack_1bd0;
      (*local_1b20)[0] = local_10e8 | local_1bd8;
      (*palVar178)[1] = uVar177;
      palVar178 = local_1b18;
      lVar1 = (*local_1b18)[0];
      lVar2 = (*local_1b18)[1];
      local_fe8 = local_1bb8._0_8_;
      uVar8 = local_fe8;
      uStack_fe0 = local_1bb8._8_8_;
      uVar11 = uStack_fe0;
      local_fe8._0_4_ = local_1bb8._0_4_;
      local_fe8._4_4_ = local_1bb8._4_4_;
      uStack_fe0._0_4_ = local_1bb8._8_4_;
      uStack_fe0._4_4_ = local_1bb8._12_4_;
      local_ff8._0_4_ = (uint)lVar1;
      local_ff8._4_4_ = (uint)((ulong)lVar1 >> 0x20);
      uStack_ff0._0_4_ = (uint)lVar2;
      uStack_ff0._4_4_ = (uint)((ulong)lVar2 >> 0x20);
      uVar193 = ((uint)local_fe8 ^ 0xffffffff) & (uint)local_ff8;
      uVar217 = (local_fe8._4_4_ ^ 0xffffffff) & local_ff8._4_4_;
      uVar241 = ((uint)uStack_fe0 ^ 0xffffffff) & (uint)uStack_ff0;
      uVar265 = (uStack_fe0._4_4_ ^ 0xffffffff) & uStack_ff0._4_4_;
      local_ff8 = lVar1;
      uStack_ff0 = lVar2;
      local_fe8 = uVar8;
      uStack_fe0 = uVar11;
      *(uint *)*local_1b18 = uVar193;
      *(uint *)((long)*palVar178 + 4) = uVar217;
      *(uint *)(*palVar178 + 1) = uVar241;
      *(uint *)((long)*palVar178 + 0xc) = uVar265;
      palVar178 = local_1b18;
      local_1388 = local_1bb8._0_8_;
      uStack_1380 = local_1bb8._8_8_;
      local_1398 = local_1bc8;
      uStack_1390 = uStack_1bc0;
      local_1bc8 = local_1bb8._0_8_ & local_1bc8;
      uStack_1bc0 = local_1bb8._8_8_ & uStack_1bc0;
      local_1108 = (*local_1b18)[0];
      uStack_1100 = (*local_1b18)[1];
      uVar177 = uStack_1100 | uStack_1bc0;
      local_1118 = local_1bc8;
      uStack_1110 = uStack_1bc0;
      (*local_1b18)[0] = local_1108 | local_1bc8;
      (*palVar178)[1] = uVar177;
    }
  }
  transpose_pq_14_inv_sse2
            (x0,x1_00,q0p0_00,x3_01,x4_00,x1,
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe126,
                      CONCAT24(in_stack_ffffffffffffe124,
                               CONCAT22(in_stack_ffffffffffffe122,in_stack_ffffffffffffe120))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe12e,
                      CONCAT24(in_stack_ffffffffffffe12c,
                               CONCAT22(in_stack_ffffffffffffe12a,in_stack_ffffffffffffe128))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe136,
                      CONCAT24(in_stack_ffffffffffffe134,
                               CONCAT22(in_stack_ffffffffffffe132,in_stack_ffffffffffffe130))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe13e,
                      CONCAT24(in_stack_ffffffffffffe13c,
                               CONCAT22(in_stack_ffffffffffffe13a,in_stack_ffffffffffffe138))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe146,
                      CONCAT24(in_stack_ffffffffffffe144,
                               CONCAT22(in_stack_ffffffffffffe142,in_stack_ffffffffffffe140))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe14e,
                      CONCAT24(in_stack_ffffffffffffe14c,
                               CONCAT22(in_stack_ffffffffffffe14a,in_stack_ffffffffffffe148))));
  local_1fe8[-1] = local_20d8;
  *local_1fe8 = uStack_20d0;
  puVar175 = (undefined8 *)((long)local_1fe8 + (long)local_1fec + -8);
  *puVar175 = local_20e8;
  puVar175[1] = uStack_20e0;
  puVar175 = (undefined8 *)((long)local_1fe8 + (long)(local_1fec << 1) + -8);
  *puVar175 = local_20f8;
  puVar175[1] = uStack_20f0;
  local_1fe8 = (undefined8 *)((long)local_1fe8 + (long)(local_1fec * 3) + -8);
  *local_1fe8 = local_2108;
  local_1fe8[1] = uStack_2100;
  return;
}

Assistant:

void aom_lpf_vertical_14_sse2(unsigned char *s, int p,
                              const unsigned char *_blimit,
                              const unsigned char *_limit,
                              const unsigned char *_thresh) {
  __m128i q7p7, q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i x6, x5, x4, x3;
  __m128i pq0, pq1, pq2, pq3;
  __m128i blimit = _mm_load_si128((__m128i *)_blimit);
  __m128i limit = _mm_load_si128((__m128i *)_limit);
  __m128i thresh = _mm_load_si128((__m128i *)_thresh);

  x6 = _mm_loadu_si128((__m128i *)((s - 8) + 0 * p));
  x5 = _mm_loadu_si128((__m128i *)((s - 8) + 1 * p));
  x4 = _mm_loadu_si128((__m128i *)((s - 8) + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)((s - 8) + 3 * p));

  transpose_pq_14_sse2(&x6, &x5, &x4, &x3, &q0p0, &q1p1, &q2p2, &q3p3, &q4p4,
                       &q5p5, &q6p6, &q7p7);

  lpf_internal_14_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0, &blimit,
                       &limit, &thresh);

  transpose_pq_14_inv_sse2(&q7p7, &q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1,
                           &q0p0, &pq0, &pq1, &pq2, &pq3);
  _mm_storeu_si128((__m128i *)(s - 8 + 0 * p), pq0);
  _mm_storeu_si128((__m128i *)(s - 8 + 1 * p), pq1);
  _mm_storeu_si128((__m128i *)(s - 8 + 2 * p), pq2);
  _mm_storeu_si128((__m128i *)(s - 8 + 3 * p), pq3);
}